

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::Deconvolution_x86_fma::forward
          (Deconvolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [32];
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int *piVar19;
  void *pvVar20;
  undefined4 *puVar21;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  void *pvVar25;
  size_t sVar26;
  Layer *pLVar27;
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined4 uVar42;
  undefined4 uVar43;
  Mat *pMVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  uint uVar52;
  ulong uVar53;
  undefined1 (*pauVar54) [32];
  ulong uVar55;
  undefined1 (*pauVar56) [16];
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  long lVar60;
  int iVar61;
  int iVar62;
  int x;
  int iVar63;
  int iVar64;
  int y;
  ulong uVar65;
  ulong uVar66;
  void *pvVar67;
  ulong uVar68;
  uint uVar69;
  long lVar70;
  int y_3;
  int w;
  long lVar71;
  undefined1 (*pauVar72) [32];
  undefined1 (*pauVar73) [16];
  int y_6;
  float *pfVar74;
  int iVar75;
  float *pfVar76;
  void *pvVar77;
  void *pvVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar81 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar82 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar88 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar162 [32];
  float fVar175;
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [28];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar250;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar253 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar257 [16];
  undefined1 auVar287 [32];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [64];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [64];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [16];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar468 [64];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar474 [64];
  undefined1 auVar475 [64];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [64];
  undefined1 auVar482 [64];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  float fVar507;
  float fVar508;
  undefined1 auVar498 [32];
  undefined1 auVar499 [32];
  undefined1 auVar500 [32];
  undefined1 auVar501 [32];
  undefined1 auVar502 [32];
  undefined1 auVar503 [32];
  undefined1 auVar504 [32];
  undefined1 auVar505 [32];
  undefined1 auVar506 [64];
  int outh_1;
  int h_2;
  int outh;
  int outw;
  int size;
  Option opt_b;
  void *local_260;
  void *local_258;
  ulong local_250;
  ulong local_230;
  float *local_210;
  Mat local_198;
  int local_14c;
  void *local_148;
  long local_140;
  void *local_138;
  Option *local_130;
  long local_128;
  Mat *local_120;
  long *local_118;
  undefined4 uStack_110;
  int iStack_10c;
  long local_108;
  undefined4 uStack_100;
  long *local_f8;
  undefined4 uStack_f0;
  int iStack_ec;
  undefined1 auStack_e8 [12];
  undefined8 local_d8;
  void *local_d0;
  void *local_c8;
  int *piStack_c0;
  size_t local_b8;
  int local_b0;
  Allocator *local_a8;
  undefined4 local_a0;
  int iStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  int local_90;
  size_t local_88;
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 auVar159 [32];
  undefined1 auVar165 [32];
  undefined1 auVar170 [32];
  undefined1 auVar236 [32];
  undefined1 auVar245 [32];
  undefined1 auVar260 [32];
  undefined1 auVar279 [32];
  
  auVar253 = in_ZMM5._0_16_;
  iVar15 = bottom_blob->w;
  iVar16 = bottom_blob->h;
  uVar59 = bottom_blob->elemsize;
  uVar58 = bottom_blob->elempack;
  uVar17 = (this->super_Deconvolution).num_output;
  uVar69 = 1;
  if (opt->use_packing_layout == true) {
    uVar69 = 8;
    if ((uVar17 & 7) != 0) {
      uVar69 = (uint)((uVar17 & 3) == 0) * 3 + 1;
    }
  }
  iVar64 = (this->super_Deconvolution).kernel_w;
  iVar45 = (this->super_Deconvolution).dilation_w;
  iVar46 = (this->super_Deconvolution).stride_w;
  iVar61 = ((this->super_Deconvolution).kernel_h + -1) * (this->super_Deconvolution).dilation_h;
  local_140 = CONCAT44(local_140._4_4_,iVar61);
  iVar51 = (this->super_Deconvolution).stride_h;
  iVar63 = (this->super_Deconvolution).output_pad_right;
  iVar62 = (this->super_Deconvolution).output_pad_bottom;
  local_198.cstep = 0;
  local_198.data = (void *)0x0;
  local_198.refcount._0_4_ = 0;
  local_198.refcount._4_4_ = 0;
  local_198.elemsize = 0;
  local_198.elempack = 0;
  local_198.allocator = (Allocator *)0x0;
  local_198.dims = 0;
  local_198.w = 0;
  local_198.h = 0;
  local_198.d = 0;
  local_198.c = 0;
  auVar252._0_4_ = (this->super_Deconvolution).pad_left;
  auVar252._4_4_ = (this->super_Deconvolution).pad_right;
  auVar252._8_4_ = (this->super_Deconvolution).pad_top;
  auVar252._12_4_ = (this->super_Deconvolution).pad_bottom;
  auVar252 = vpcmpgtd_avx(auVar252,(undefined1  [16])0x0);
  lVar71 = 0x10;
  iVar75 = (int)((long)(int)uVar17 / (long)(int)uVar69);
  if (((((auVar252 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        (auVar252 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar252 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar252[0xf])
     && ((((this->super_Deconvolution).output_w < 1 || ((this->super_Deconvolution).output_h < 1))
         && (lVar71 = 8, &local_198 != top_blob)))) {
    piVar19 = top_blob->refcount;
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + 1;
      UNLOCK();
    }
    local_198.data = top_blob->data;
    local_198.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_198.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_198.elemsize = top_blob->elemsize;
    local_198.elempack = top_blob->elempack;
    local_198.allocator = top_blob->allocator;
    uVar4 = top_blob->dims;
    uVar5 = top_blob->w;
    uVar6 = top_blob->h;
    uVar7 = top_blob->d;
    local_198.c = top_blob->c;
    local_198.cstep = top_blob->cstep;
    local_198.dims = uVar4;
    local_198.w = uVar5;
    local_198.h = uVar6;
    local_198.d = uVar7;
  }
  uVar65 = (long)(int)uVar17 / (long)(int)uVar69 & 0xffffffff;
  iVar45 = (iVar64 + -1) * iVar45;
  local_148 = (void *)CONCAT44(local_148._4_4_,iVar45);
  iVar63 = (iVar15 + -1) * iVar46 + iVar45 + iVar63 + 1;
  local_130 = opt;
  local_120 = top_blob;
  Mat::create(&local_198,iVar63,iVar62 + (iVar16 + -1) * iVar51 + iVar61 + 1,iVar75,
              (uVar59 / (ulong)(long)(int)uVar58) * (ulong)uVar69,uVar69,
              *(Allocator **)(&opt->lightmode + lVar71));
  iVar45 = local_198.h;
  iVar64 = local_198.w;
  iVar46 = -100;
  if ((local_198.data == (void *)0x0) || (local_198.cstep * (long)local_198.c == 0))
  goto LAB_0029a32e;
  uVar17 = (this->super_Deconvolution).kernel_w;
  uVar52 = (this->super_Deconvolution).kernel_h;
  local_14c = uVar52 * uVar17;
  if (local_130->use_sgemm_convolution == true) {
    piVar19 = bottom_blob->refcount;
    local_c8 = bottom_blob->data;
    piStack_c0 = bottom_blob->refcount;
    local_b8 = bottom_blob->elemsize;
    local_b0 = bottom_blob->elempack;
    local_a8 = bottom_blob->allocator;
    iVar64 = bottom_blob->h;
    iVar45 = bottom_blob->w;
    uVar42 = bottom_blob->dims;
    uVar43 = bottom_blob->d;
    local_90 = bottom_blob->c;
    local_88 = bottom_blob->cstep;
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + 1;
      UNLOCK();
      iVar45 = bottom_blob->w;
      iVar64 = bottom_blob->h;
    }
    _local_a0 = CONCAT44(iVar64 * iVar45,uVar42);
    _uStack_98 = CONCAT44(uVar43,1);
    local_d8 = 0;
    local_118 = (long *)0x0;
    uStack_110 = 0;
    iStack_10c = 0;
    local_108 = 0;
    uStack_100 = 0;
    auStack_e8 = SUB1612(ZEXT816(0),0);
    auVar8[0] = local_130->lightmode;
    auVar8[1] = local_130->use_shader_pack8;
    auVar8[2] = local_130->use_subgroup_ops;
    auVar8[3] = local_130->use_reserved_0;
    auVar8._4_4_ = local_130->num_threads;
    auVar8._8_8_ = local_130->blob_allocator;
    uVar9 = local_130->workspace_allocator;
    uVar10 = local_130->openmp_blocktime;
    uVar11 = local_130->use_winograd_convolution;
    uVar12 = local_130->use_sgemm_convolution;
    uVar13 = local_130->use_int8_inference;
    uVar14 = local_130->use_vulkan_compute;
    auVar8[0x1f] = uVar14;
    auVar8[0x1e] = uVar13;
    auVar8[0x1d] = uVar12;
    auVar8[0x1c] = uVar11;
    auVar8._24_4_ = uVar10;
    auVar8._16_8_ = uVar9;
    local_58._0_1_ = local_130->use_bf16_storage;
    local_58._1_1_ = local_130->use_fp16_packed;
    local_58._2_1_ = local_130->use_fp16_storage;
    local_58._3_1_ = local_130->use_fp16_arithmetic;
    local_58._4_1_ = local_130->use_int8_packed;
    local_58._5_1_ = local_130->use_int8_storage;
    local_58._6_1_ = local_130->use_int8_arithmetic;
    local_58._7_1_ = local_130->use_packing_layout;
    uStack_50._0_4_ = local_130->vulkan_device_index;
    uStack_50._4_1_ = local_130->use_reserved_1;
    uStack_50._5_1_ = local_130->use_image_storage;
    uStack_50._6_1_ = local_130->use_tensor_storage;
    uStack_50._7_1_ = local_130->use_reserved_2;
    uStack_48._0_4_ = local_130->flush_denormals;
    uStack_48._4_1_ = local_130->use_local_pool_allocator;
    uStack_48._5_1_ = local_130->use_shader_local_memory;
    uStack_48._6_1_ = local_130->use_cooperative_matrix;
    uStack_48._7_1_ = local_130->use_winograd23_convolution;
    uStack_40._0_1_ = local_130->use_winograd43_convolution;
    uStack_40._1_1_ = local_130->use_winograd63_convolution;
    uStack_40._2_1_ = local_130->use_a53_a55_optimized_kernel;
    uStack_40._3_1_ = local_130->use_fp16_uniform;
    uStack_40._4_1_ = local_130->use_int8_uniform;
    uStack_40._5_1_ = local_130->use_reserved_9;
    uStack_40._6_1_ = local_130->use_reserved_10;
    uStack_40._7_1_ = local_130->use_reserved_11;
    local_78 = auVar8._0_8_;
    pAStack_70 = local_198.allocator;
    auStack_68 = auVar8._16_16_;
    local_f8 = local_118;
    uStack_f0 = uStack_110;
    iStack_ec = iStack_10c;
    iVar46 = (*this->gemm->_vptr_Layer[7])();
    auVar478 = _DAT_005a6960;
    auVar168 = _DAT_005a6940;
    if (iVar46 != 0) {
      piVar19 = (int *)CONCAT44(iStack_10c,uStack_110);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_f8 == (long *)0x0) {
            if (local_118 != (long *)0x0) {
              free(local_118);
            }
          }
          else {
            (**(code **)(*local_f8 + 0x18))();
          }
        }
      }
      if (piStack_c0 != (int *)0x0) {
        LOCK();
        *piStack_c0 = *piStack_c0 + -1;
        UNLOCK();
        if (*piStack_c0 == 0) {
          if (local_a8 == (Allocator *)0x0) {
            if (local_c8 != (void *)0x0) {
              free(local_c8);
            }
          }
          else {
            (*local_a8->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_0029a32e;
    }
    iVar64 = (iVar63 * (this->super_Deconvolution).stride_h -
             (this->super_Deconvolution).stride_w * iVar15) * uVar69;
    if (uVar69 == 1) {
      if (0 < iVar75) {
        lVar71 = (long)local_198.h * (long)local_198.w;
        local_250 = 0;
        pvVar25 = (this->super_Deconvolution).bias_data.data;
        iVar45 = (this->super_Deconvolution).bias_data.c;
        sVar26 = (this->super_Deconvolution).bias_data.cstep;
        iVar46 = (int)((local_198.elemsize * lVar71 + 0xf & 0xfffffffffffffff0) / local_198.elemsize
                      );
        if (local_198.dims == 4) {
          iVar46 = (int)lVar71;
        }
        uVar52 = iVar46 * local_198.d;
        uVar58 = (this->super_Deconvolution).kernel_w;
        uVar17 = (this->super_Deconvolution).kernel_h;
        auVar107._8_8_ = 0;
        auVar107._0_8_ = (ulong)uVar52 - 1;
        auVar252 = vpshufd_avx(auVar107,0x44);
        uVar59 = auVar252._0_8_;
        auVar331._0_8_ = uVar59 ^ 0x8000000000000000;
        auVar331._8_4_ = auVar252._8_4_;
        uVar69 = auVar252._12_4_;
        auVar331._12_4_ = uVar69 ^ 0x80000000;
        auVar253 = vpcmpeqd_avx(auVar253,auVar253);
        pvVar67 = local_198.data;
        do {
          auVar252 = ZEXT816(0) << 0x40;
          if ((long)iVar45 * sVar26 != 0 && pvVar25 != (void *)0x0) {
            auVar252 = ZEXT416(*(uint *)((long)pvVar25 + local_250 * 4));
          }
          if (0 < (int)uVar52) {
            auVar252 = vshufps_avx(auVar252,auVar252,0);
            auVar355._16_16_ = auVar252;
            auVar355._0_16_ = auVar252;
            uVar55 = 0;
            do {
              auVar360._8_8_ = 0;
              auVar360._0_8_ = uVar55;
              auVar252 = vpshufd_avx(auVar360,0x44);
              auVar364._16_16_ = auVar252;
              auVar364._0_16_ = auVar252;
              auVar162 = vorps_avx(auVar364,auVar168);
              auVar164 = vorps_avx(auVar364,auVar478);
              auVar413._0_8_ = auVar164._16_8_ ^ 0x8000000000000000;
              auVar413._8_4_ = auVar164._24_4_;
              auVar413._12_4_ = auVar164._28_4_ ^ 0x80000000;
              auVar252 = vpcmpgtq_avx(auVar413,auVar331);
              auVar427._0_8_ = uVar59 ^ 0x8000000000000000;
              auVar427._8_4_ = auVar331._8_4_;
              auVar427._12_4_ = uVar69 ^ 0x80000000;
              auVar361._0_8_ = auVar164._0_8_ ^ 0x8000000000000000;
              auVar361._8_4_ = auVar164._8_4_;
              auVar361._12_4_ = auVar164._12_4_ ^ 0x80000000;
              auVar417 = vpcmpgtq_avx(auVar361,auVar427);
              auVar252 = vpackssdw_avx(auVar417,auVar252);
              auVar414._0_8_ = auVar162._16_8_ ^ 0x8000000000000000;
              auVar414._8_4_ = auVar162._24_4_;
              auVar414._12_4_ = auVar162._28_4_ ^ 0x80000000;
              auVar417 = vpcmpgtq_avx(auVar414,auVar331);
              auVar428._0_8_ = uVar59 ^ 0x8000000000000000;
              auVar428._8_4_ = auVar331._8_4_;
              auVar428._12_4_ = uVar69 ^ 0x80000000;
              auVar385._0_8_ = auVar162._0_8_ ^ 0x8000000000000000;
              auVar385._8_4_ = auVar162._8_4_;
              auVar385._12_4_ = auVar162._12_4_ ^ 0x80000000;
              auVar251 = vpcmpgtq_avx(auVar385,auVar428);
              auVar417 = vpackssdw_avx(auVar251,auVar417);
              auVar252 = vpackssdw_avx(auVar417 ^ auVar253,auVar252 ^ auVar253);
              auVar417 = vpmovsxwd_avx(auVar252);
              auVar252 = vpunpckhwd_avx(auVar252,auVar252);
              auVar365._16_16_ = auVar252;
              auVar365._0_16_ = auVar417;
              auVar162 = vmaskmovps_avx(auVar365,auVar355);
              *(undefined1 (*) [32])((long)pvVar67 + uVar55 * 4) = auVar162;
              uVar55 = uVar55 + 8;
            } while ((uVar52 + 7 & 0xfffffff8) != uVar55);
          }
          if (0 < (int)uVar17) {
            pfVar76 = (float *)(local_250 * (long)local_14c * iStack_ec * local_108 +
                               (long)local_118);
            iVar46 = (this->super_Deconvolution).dilation_h;
            iVar51 = (this->super_Deconvolution).dilation_w;
            uVar55 = 0;
            do {
              if (0 < (int)uVar58) {
                uVar66 = 0;
                do {
                  if (0 < iVar16) {
                    pfVar74 = (float *)((long)local_198.data +
                                       uVar66 * (long)iVar51 * 4 +
                                       uVar55 * (long)iVar46 *
                                                local_198.elemsize * (long)local_198.w +
                                       local_198.cstep * local_198.elemsize * local_250);
                    iVar63 = (this->super_Deconvolution).stride_w;
                    iVar62 = 0;
                    do {
                      iVar61 = iVar15;
                      if (0 < iVar15) {
                        do {
                          *pfVar74 = *pfVar74 + *pfVar76;
                          pfVar76 = pfVar76 + 1;
                          pfVar74 = pfVar74 + iVar63;
                          iVar61 = iVar61 + -1;
                        } while (iVar61 != 0);
                      }
                      pfVar74 = pfVar74 + iVar64;
                      iVar62 = iVar62 + 1;
                    } while (iVar62 != iVar16);
                  }
                  uVar66 = uVar66 + 1;
                } while (uVar66 != uVar58);
              }
              uVar55 = uVar55 + 1;
            } while (uVar55 != uVar17);
          }
          local_250 = local_250 + 1;
          pvVar67 = (void *)((long)pvVar67 + local_198.cstep * local_198.elemsize);
        } while (local_250 != uVar65);
      }
    }
    else if (uVar69 == 4) {
      if (0 < iVar75) {
        lVar71 = (long)local_14c;
        uVar59 = 0;
        do {
          sVar26 = local_198.elemsize;
          pfVar76 = (float *)((long)iStack_ec * uVar59 * lVar71 * local_108 + (long)local_118);
          lVar70 = (long)local_198.w;
          pauVar73 = (undefined1 (*) [16])
                     (local_198.cstep * uVar59 * local_198.elemsize + (long)local_198.data);
          uVar66 = local_198.h * lVar70;
          uVar55 = (local_198.elemsize * uVar66 + 0xf & 0xfffffffffffffff0) / local_198.elemsize;
          if (local_198.dims == 4) {
            uVar55 = uVar66;
          }
          pvVar25 = (this->super_Deconvolution).bias_data.data;
          if ((pvVar25 == (void *)0x0) ||
             ((long)(this->super_Deconvolution).bias_data.c *
              (this->super_Deconvolution).bias_data.cstep == 0)) {
            uVar58 = local_198.d * (int)uVar55;
            if (0 < (int)uVar58) {
              memset(pauVar73,0,(ulong)uVar58 << 4);
            }
          }
          else {
            iVar45 = local_198.d * (int)uVar55;
            if (0 < iVar45) {
              auVar253 = *(undefined1 (*) [16])((long)pvVar25 + uVar59 * 0x10);
              pauVar56 = pauVar73;
              do {
                *pauVar56 = auVar253;
                pauVar56 = pauVar56 + 1;
                iVar45 = iVar45 + -1;
              } while (iVar45 != 0);
            }
          }
          iVar45 = (this->super_Deconvolution).kernel_h;
          if (0 < iVar45) {
            iVar46 = (this->super_Deconvolution).kernel_w;
            iVar51 = 0;
            do {
              if (0 < iVar46) {
                iVar45 = 0;
                do {
                  if (0 < iVar16) {
                    pauVar56 = (undefined1 (*) [16])
                               (*pauVar73 +
                               (long)((this->super_Deconvolution).dilation_w * iVar45 * 4) * 4 +
                               (long)(this->super_Deconvolution).dilation_h * (long)iVar51 *
                               sVar26 * lVar70);
                    iVar46 = 0;
                    do {
                      iVar63 = iVar15;
                      if (0 < iVar15) {
                        do {
                          auVar108._0_4_ = *pfVar76 + *(float *)*pauVar56;
                          auVar108._4_4_ = pfVar76[1] + *(float *)(*pauVar56 + 4);
                          auVar108._8_4_ = pfVar76[2] + *(float *)(*pauVar56 + 8);
                          auVar108._12_4_ = pfVar76[3] + *(float *)(*pauVar56 + 0xc);
                          *pauVar56 = auVar108;
                          pauVar56 = pauVar56 + (this->super_Deconvolution).stride_w;
                          pfVar76 = pfVar76 + 4;
                          iVar63 = iVar63 + -1;
                        } while (iVar63 != 0);
                      }
                      pauVar56 = (undefined1 (*) [16])(*pauVar56 + (long)iVar64 * 4);
                      iVar46 = iVar46 + 1;
                    } while (iVar46 != iVar16);
                    iVar46 = (this->super_Deconvolution).kernel_w;
                  }
                  iVar45 = iVar45 + 1;
                } while (iVar45 < iVar46);
                iVar45 = (this->super_Deconvolution).kernel_h;
              }
              iVar51 = iVar51 + 1;
            } while (iVar51 < iVar45);
          }
          uVar59 = uVar59 + 1;
        } while (uVar59 != uVar65);
      }
    }
    else if ((uVar69 == 8) && (0 < iVar75)) {
      lVar71 = (long)local_14c;
      uVar59 = 0;
      do {
        sVar26 = local_198.elemsize;
        pfVar76 = (float *)((long)iStack_ec * uVar59 * lVar71 * local_108 + (long)local_118);
        lVar70 = (long)local_198.w;
        pauVar72 = (undefined1 (*) [32])
                   (local_198.cstep * uVar59 * local_198.elemsize + (long)local_198.data);
        uVar66 = local_198.h * lVar70;
        uVar55 = (local_198.elemsize * uVar66 + 0xf & 0xfffffffffffffff0) / local_198.elemsize;
        if (local_198.dims == 4) {
          uVar55 = uVar66;
        }
        pvVar25 = (this->super_Deconvolution).bias_data.data;
        if ((pvVar25 == (void *)0x0) ||
           ((long)(this->super_Deconvolution).bias_data.c *
            (this->super_Deconvolution).bias_data.cstep == 0)) {
          uVar58 = local_198.d * (int)uVar55;
          if (0 < (int)uVar58) {
            memset(pauVar72,0,(ulong)uVar58 << 5);
          }
        }
        else {
          iVar45 = local_198.d * (int)uVar55;
          if (0 < iVar45) {
            auVar168 = *(undefined1 (*) [32])((long)pvVar25 + uVar59 * 0x20);
            pauVar54 = pauVar72;
            do {
              *pauVar54 = auVar168;
              pauVar54 = pauVar54 + 1;
              iVar45 = iVar45 + -1;
            } while (iVar45 != 0);
          }
        }
        iVar45 = (this->super_Deconvolution).kernel_h;
        if (0 < iVar45) {
          iVar46 = (this->super_Deconvolution).kernel_w;
          iVar51 = 0;
          do {
            if (0 < iVar46) {
              iVar45 = 0;
              do {
                if (0 < iVar16) {
                  pauVar54 = (undefined1 (*) [32])
                             (*pauVar72 +
                             (long)((this->super_Deconvolution).dilation_w * iVar45 * 8) * 4 +
                             (long)(this->super_Deconvolution).dilation_h * (long)iVar51 *
                             sVar26 * lVar70);
                  iVar46 = 0;
                  do {
                    iVar63 = iVar15;
                    if (0 < iVar15) {
                      do {
                        auVar131._0_4_ = *pfVar76 + *(float *)*pauVar54;
                        auVar131._4_4_ = pfVar76[1] + *(float *)(*pauVar54 + 4);
                        auVar131._8_4_ = pfVar76[2] + *(float *)(*pauVar54 + 8);
                        auVar131._12_4_ = pfVar76[3] + *(float *)(*pauVar54 + 0xc);
                        auVar131._16_4_ = pfVar76[4] + *(float *)(*pauVar54 + 0x10);
                        auVar131._20_4_ = pfVar76[5] + *(float *)(*pauVar54 + 0x14);
                        auVar131._24_4_ = pfVar76[6] + *(float *)(*pauVar54 + 0x18);
                        auVar131._28_4_ = pfVar76[7] + *(float *)(*pauVar54 + 0x1c);
                        *pauVar54 = auVar131;
                        pauVar54 = pauVar54 + (this->super_Deconvolution).stride_w;
                        pfVar76 = pfVar76 + 8;
                        iVar63 = iVar63 + -1;
                      } while (iVar63 != 0);
                    }
                    pauVar54 = (undefined1 (*) [32])(*pauVar54 + (long)iVar64 * 4);
                    iVar46 = iVar46 + 1;
                  } while (iVar46 != iVar16);
                  iVar46 = (this->super_Deconvolution).kernel_w;
                }
                iVar45 = iVar45 + 1;
              } while (iVar45 < iVar46);
              iVar45 = (this->super_Deconvolution).kernel_h;
            }
            iVar51 = iVar51 + 1;
          } while (iVar51 < iVar45);
        }
        uVar59 = uVar59 + 1;
      } while (uVar59 != uVar65);
    }
    pLVar27 = this->activation;
    if (pLVar27 != (Layer *)0x0) {
      (*pLVar27->_vptr_Layer[9])(pLVar27,&local_198,local_130);
    }
    piVar19 = (int *)CONCAT44(iStack_10c,uStack_110);
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (local_f8 == (long *)0x0) {
          if (local_118 != (long *)0x0) {
            free(local_118);
          }
        }
        else {
          (**(code **)(*local_f8 + 0x18))();
        }
      }
    }
    if (piStack_c0 != (int *)0x0) {
      LOCK();
      *piStack_c0 = *piStack_c0 + -1;
      UNLOCK();
      if (*piStack_c0 == 0) {
        if (local_a8 == (Allocator *)0x0) {
          if (local_c8 != (void *)0x0) {
            free(local_c8);
          }
        }
        else {
          (*local_a8->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    if ((uVar58 == 8) && (uVar69 == 8)) {
      if (local_198.c < 1) goto LAB_0029a2e9;
      iVar15 = (this->super_Deconvolution).dilation_w;
      iVar16 = (this->super_Deconvolution).dilation_h;
      iVar46 = (this->super_Deconvolution).stride_w;
      iVar51 = (this->super_Deconvolution).stride_h;
      iVar63 = (this->super_Deconvolution).activation_type;
      pvVar25 = (this->super_Deconvolution).bias_data.data;
      local_260 = (void *)0x0;
      auVar407 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar356 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar478._8_4_ = 0x3e2aaaaa;
      auVar478._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar478._12_4_ = 0x3e2aaaaa;
      auVar478._16_4_ = 0x3e2aaaaa;
      auVar478._20_4_ = 0x3e2aaaaa;
      auVar478._24_4_ = 0x3e2aaaaa;
      auVar478._28_4_ = 0x3e2aaaaa;
      auVar253._8_4_ = 0x3f800000;
      auVar253._0_8_ = 0x3f8000003f800000;
      auVar253._12_4_ = 0x3f800000;
      auVar168._8_4_ = 0xbf800000;
      auVar168._0_8_ = 0xbf800000bf800000;
      auVar168._12_4_ = 0xbf800000;
      auVar168._16_4_ = 0xbf800000;
      auVar168._20_4_ = 0xbf800000;
      auVar168._24_4_ = 0xbf800000;
      auVar168._28_4_ = 0xbf800000;
      do {
        if (0 < local_198.h) {
          iVar62 = bottom_blob->w;
          iVar61 = bottom_blob->h;
          pauVar72 = (undefined1 (*) [32])
                     (local_198.cstep * (long)local_260 * local_198.elemsize + (long)local_198.data)
          ;
          uVar18 = bottom_blob->c;
          iVar75 = 0;
          do {
            if (0 < local_198.w) {
              uVar57 = 0;
              iVar2 = (1 - uVar17) * iVar15;
              do {
                if (pvVar25 == (void *)0x0) {
                  auVar173 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar173 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar25 + (long)local_260 * 0x20)
                                     );
                }
                if (0 < (int)uVar18) {
                  pvVar67 = (void *)((this->weight_data_tm).cstep * (long)local_260 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar20 = bottom_blob->data;
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar52) {
                      uVar55 = 0;
                      uVar65 = 0;
                      do {
                        iVar47 = (((int)uVar65 - uVar52) + 1) * iVar16 + iVar75;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar51, iVar47 % iVar51 == 0)) &&
                            (0 < (int)uVar17)) && (iVar48 < iVar61)) {
                          lVar71 = (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                          uVar66 = uVar55;
                          uVar68 = (ulong)uVar17;
                          iVar47 = iVar2;
                          do {
                            if (((-1 < iVar47) && (iVar48 = iVar47 / iVar46, iVar47 % iVar46 == 0))
                               && (iVar48 < iVar62)) {
                              lVar70 = (long)(iVar48 << 3);
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71);
                              auVar162._4_4_ = uVar1;
                              auVar162._0_4_ = uVar1;
                              auVar162._8_4_ = uVar1;
                              auVar162._12_4_ = uVar1;
                              auVar162._16_4_ = uVar1;
                              auVar162._20_4_ = uVar1;
                              auVar162._24_4_ = uVar1;
                              auVar162._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 4);
                              auVar164._4_4_ = uVar1;
                              auVar164._0_4_ = uVar1;
                              auVar164._8_4_ = uVar1;
                              auVar164._12_4_ = uVar1;
                              auVar164._16_4_ = uVar1;
                              auVar164._20_4_ = uVar1;
                              auVar164._24_4_ = uVar1;
                              auVar164._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 8);
                              auVar347._4_4_ = uVar1;
                              auVar347._0_4_ = uVar1;
                              auVar347._8_4_ = uVar1;
                              auVar347._12_4_ = uVar1;
                              auVar347._16_4_ = uVar1;
                              auVar347._20_4_ = uVar1;
                              auVar347._24_4_ = uVar1;
                              auVar347._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 0xc);
                              auVar158._4_4_ = uVar1;
                              auVar158._0_4_ = uVar1;
                              auVar158._8_4_ = uVar1;
                              auVar158._12_4_ = uVar1;
                              auVar158._16_4_ = uVar1;
                              auVar158._20_4_ = uVar1;
                              auVar158._24_4_ = uVar1;
                              auVar158._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 0x10);
                              auVar231._4_4_ = uVar1;
                              auVar231._0_4_ = uVar1;
                              auVar231._8_4_ = uVar1;
                              auVar231._12_4_ = uVar1;
                              auVar231._16_4_ = uVar1;
                              auVar231._20_4_ = uVar1;
                              auVar231._24_4_ = uVar1;
                              auVar231._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 0x14);
                              auVar498._4_4_ = uVar1;
                              auVar498._0_4_ = uVar1;
                              auVar498._8_4_ = uVar1;
                              auVar498._12_4_ = uVar1;
                              auVar498._16_4_ = uVar1;
                              auVar498._20_4_ = uVar1;
                              auVar498._24_4_ = uVar1;
                              auVar498._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 0x18);
                              auVar464._4_4_ = uVar1;
                              auVar464._0_4_ = uVar1;
                              auVar464._8_4_ = uVar1;
                              auVar464._12_4_ = uVar1;
                              auVar464._16_4_ = uVar1;
                              auVar464._20_4_ = uVar1;
                              auVar464._24_4_ = uVar1;
                              auVar464._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 0x1c);
                              auVar471._4_4_ = uVar1;
                              auVar471._0_4_ = uVar1;
                              auVar471._8_4_ = uVar1;
                              auVar471._12_4_ = uVar1;
                              auVar471._16_4_ = uVar1;
                              auVar471._20_4_ = uVar1;
                              auVar471._24_4_ = uVar1;
                              auVar471._28_4_ = uVar1;
                              uVar53 = uVar66 & 0xffffffff;
                              auVar252 = vfmadd231ps_fma(auVar173._0_32_,auVar162,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar53 * 4));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar164,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x20));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar347,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x40));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar158,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x60));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar231,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x80));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar498,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar53 * 4 + 0xa0));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar464,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar53 * 4 + 0xc0));
                              auVar252 = vfmadd231ps_fma(ZEXT1632(auVar252),auVar471,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar53 * 4 + 0xe0));
                              auVar173 = ZEXT1664(auVar252);
                            }
                            uVar66 = uVar66 + 0x40;
                            iVar47 = iVar47 + iVar15;
                            uVar68 = uVar68 - 1;
                          } while (uVar68 != 0);
                        }
                        uVar65 = uVar65 + 1;
                        uVar55 = uVar55 + (ulong)uVar17 * 0x40;
                      } while (uVar65 != uVar52);
                    }
                    pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar17 * uVar52 * 0x40) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar18);
                }
                auVar162 = auVar173._0_32_;
                auVar164 = auVar356._0_32_;
                auVar347 = auVar407._0_32_;
                fVar80 = auVar356._0_4_;
                fVar79 = auVar356._4_4_;
                fVar3 = auVar356._8_4_;
                fVar250 = auVar356._12_4_;
                fVar507 = auVar356._16_4_;
                fVar508 = auVar356._20_4_;
                fVar175 = auVar356._24_4_;
                fVar28 = auVar356._28_4_;
                auVar474._28_36_ = auVar173._28_36_;
                switch(iVar63) {
                case 1:
                  auVar162 = vmaxps_avx(auVar162,_DAT_005a9220);
                  break;
                case 2:
                  auVar164 = vmaxps_avx(auVar162,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar162 = vminps_avx(auVar162,ZEXT1632(ZEXT816(0) << 0x40));
                  uVar1 = *(this->super_Deconvolution).activation_params.data;
                  auVar161._4_4_ = uVar1;
                  auVar161._0_4_ = uVar1;
                  auVar161._8_4_ = uVar1;
                  auVar161._12_4_ = uVar1;
                  auVar161._16_4_ = uVar1;
                  auVar161._20_4_ = uVar1;
                  auVar161._24_4_ = uVar1;
                  auVar161._28_4_ = uVar1;
                  auVar252 = vfmadd213ps_fma(auVar161,auVar162,auVar164);
                  auVar162 = ZEXT1632(auVar252);
                  break;
                case 3:
                  puVar21 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar1 = *puVar21;
                  auVar224._4_4_ = uVar1;
                  auVar224._0_4_ = uVar1;
                  auVar224._8_4_ = uVar1;
                  auVar224._12_4_ = uVar1;
                  auVar224._16_4_ = uVar1;
                  auVar224._20_4_ = uVar1;
                  auVar224._24_4_ = uVar1;
                  auVar224._28_4_ = uVar1;
                  uVar1 = puVar21[1];
                  auVar500._4_4_ = uVar1;
                  auVar500._0_4_ = uVar1;
                  auVar500._8_4_ = uVar1;
                  auVar500._12_4_ = uVar1;
                  auVar500._16_4_ = uVar1;
                  auVar500._20_4_ = uVar1;
                  auVar500._24_4_ = uVar1;
                  auVar500._28_4_ = uVar1;
                  auVar162 = vmaxps_avx(auVar162,auVar224);
                  auVar162 = vminps_avx(auVar500,auVar162);
                  break;
                case 4:
                  auVar157._0_8_ = auVar173._0_8_ ^ 0x8000000080000000;
                  auVar157._8_4_ = -auVar173._8_4_;
                  auVar157._12_4_ = -auVar173._12_4_;
                  auVar157._16_4_ = -auVar173._16_4_;
                  auVar157._20_4_ = -auVar173._20_4_;
                  auVar157._24_4_ = -auVar173._24_4_;
                  auVar157._28_4_ = auVar173._28_4_ ^ 0x80000000;
                  auVar225._8_4_ = 0x42b0c0a5;
                  auVar225._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar225._12_4_ = 0x42b0c0a5;
                  auVar225._16_4_ = 0x42b0c0a5;
                  auVar225._20_4_ = 0x42b0c0a5;
                  auVar225._24_4_ = 0x42b0c0a5;
                  auVar225._28_4_ = 0x42b0c0a5;
                  auVar162 = vminps_avx(auVar157,auVar225);
                  auVar226._8_4_ = 0xc2b0c0a5;
                  auVar226._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar226._12_4_ = 0xc2b0c0a5;
                  auVar226._16_4_ = 0xc2b0c0a5;
                  auVar226._20_4_ = 0xc2b0c0a5;
                  auVar226._24_4_ = 0xc2b0c0a5;
                  auVar226._28_4_ = 0xc2b0c0a5;
                  auVar158 = vmaxps_avx(auVar162,auVar226);
                  auVar227._8_4_ = 0x3fb8aa3b;
                  auVar227._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar227._12_4_ = 0x3fb8aa3b;
                  auVar227._16_4_ = 0x3fb8aa3b;
                  auVar227._20_4_ = 0x3fb8aa3b;
                  auVar227._24_4_ = 0x3fb8aa3b;
                  auVar227._28_4_ = 0x3fb8aa3b;
                  auVar252 = vfmadd213ps_fma(auVar227,auVar158,auVar347);
                  auVar231 = vroundps_avx(ZEXT1632(auVar252),1);
                  auVar162 = vcmpps_avx(ZEXT1632(auVar252),auVar231,1);
                  auVar162 = vandps_avx(auVar162,auVar164);
                  auVar162 = vsubps_avx(auVar231,auVar162);
                  auVar109._8_4_ = 0x3f318000;
                  auVar109._0_8_ = 0x3f3180003f318000;
                  auVar109._12_4_ = 0x3f318000;
                  auVar109._16_4_ = 0x3f318000;
                  auVar109._20_4_ = 0x3f318000;
                  auVar109._24_4_ = 0x3f318000;
                  auVar109._28_4_ = 0x3f318000;
                  auVar252 = vfmsub231ps_fma(auVar158,auVar162,auVar109);
                  auVar267._8_4_ = 0x395e8083;
                  auVar267._0_8_ = 0x395e8083395e8083;
                  auVar267._12_4_ = 0x395e8083;
                  auVar267._16_4_ = 0x395e8083;
                  auVar267._20_4_ = 0x395e8083;
                  auVar267._24_4_ = 0x395e8083;
                  auVar267._28_4_ = 0x395e8083;
                  auVar417 = vfmsub231ps_fma(ZEXT1632(auVar252),auVar162,auVar267);
                  auVar158 = ZEXT1632(auVar417);
                  auVar32._28_4_ = auVar231._28_4_;
                  auVar32._0_28_ =
                       ZEXT1628(CONCAT412(auVar417._12_4_ * auVar417._12_4_,
                                          CONCAT48(auVar417._8_4_ * auVar417._8_4_,
                                                   CONCAT44(auVar417._4_4_ * auVar417._4_4_,
                                                            auVar417._0_4_ * auVar417._0_4_))));
                  auVar433._8_4_ = 0x39506967;
                  auVar433._0_8_ = 0x3950696739506967;
                  auVar433._12_4_ = 0x39506967;
                  auVar433._16_4_ = 0x39506967;
                  auVar433._20_4_ = 0x39506967;
                  auVar433._24_4_ = 0x39506967;
                  auVar433._28_4_ = 0x39506967;
                  auVar268._8_4_ = 0x3ab743ce;
                  auVar268._0_8_ = 0x3ab743ce3ab743ce;
                  auVar268._12_4_ = 0x3ab743ce;
                  auVar268._16_4_ = 0x3ab743ce;
                  auVar268._20_4_ = 0x3ab743ce;
                  auVar268._24_4_ = 0x3ab743ce;
                  auVar268._28_4_ = 0x3ab743ce;
                  auVar252 = vfmadd213ps_fma(auVar433,auVar158,auVar268);
                  auVar110._8_4_ = 0x3c088908;
                  auVar110._0_8_ = 0x3c0889083c088908;
                  auVar110._12_4_ = 0x3c088908;
                  auVar110._16_4_ = 0x3c088908;
                  auVar110._20_4_ = 0x3c088908;
                  auVar110._24_4_ = 0x3c088908;
                  auVar110._28_4_ = 0x3c088908;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar158,auVar110);
                  auVar111._8_4_ = 0x3d2aa9c1;
                  auVar111._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar111._12_4_ = 0x3d2aa9c1;
                  auVar111._16_4_ = 0x3d2aa9c1;
                  auVar111._20_4_ = 0x3d2aa9c1;
                  auVar111._24_4_ = 0x3d2aa9c1;
                  auVar111._28_4_ = 0x3d2aa9c1;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar158,auVar111);
                  auVar112._8_4_ = 0x3e2aaaaa;
                  auVar112._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar112._12_4_ = 0x3e2aaaaa;
                  auVar112._16_4_ = 0x3e2aaaaa;
                  auVar112._20_4_ = 0x3e2aaaaa;
                  auVar112._24_4_ = 0x3e2aaaaa;
                  auVar112._28_4_ = 0x3e2aaaaa;
                  auVar158 = ZEXT1632(auVar417);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar158,auVar112);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar158,auVar347);
                  auVar251 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar32,auVar158);
                  auVar132._0_4_ = (int)auVar162._0_4_;
                  auVar132._4_4_ = (int)auVar162._4_4_;
                  auVar132._8_4_ = (int)auVar162._8_4_;
                  auVar132._12_4_ = (int)auVar162._12_4_;
                  auVar159._16_4_ = (int)auVar162._16_4_;
                  auVar159._0_16_ = auVar132;
                  auVar159._20_4_ = (int)auVar162._20_4_;
                  auVar159._24_4_ = (int)auVar162._24_4_;
                  auVar159._28_4_ = (int)auVar162._28_4_;
                  auVar417 = vpslld_avx(auVar132,0x17);
                  auVar252 = vpslld_avx(auVar159._16_16_,0x17);
                  auVar81._8_4_ = 0x3f800000;
                  auVar81._0_8_ = 0x3f8000003f800000;
                  auVar81._12_4_ = 0x3f800000;
                  auVar252 = vpaddd_avx(auVar252,auVar81);
                  auVar417 = vpaddd_avx(auVar417,auVar81);
                  auVar160._16_16_ = auVar252;
                  auVar160._0_16_ = auVar417;
                  auVar228._0_4_ = auVar251._0_4_ + fVar80;
                  auVar228._4_4_ = auVar251._4_4_ + fVar79;
                  auVar228._8_4_ = auVar251._8_4_ + fVar3;
                  auVar228._12_4_ = auVar251._12_4_ + fVar250;
                  auVar228._16_4_ = fVar507 + 0.0;
                  auVar228._20_4_ = fVar508 + 0.0;
                  auVar228._24_4_ = fVar175 + 0.0;
                  auVar228._28_4_ = fVar28 + 0.0;
                  auVar252 = vfmadd213ps_fma(auVar160,auVar228,auVar164);
                  auVar162 = vdivps_avx(auVar164,ZEXT1632(auVar252));
                  break;
                case 5:
                  auVar465._8_4_ = 0x42b0c0a5;
                  auVar465._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar465._12_4_ = 0x42b0c0a5;
                  auVar465._16_4_ = 0x42b0c0a5;
                  auVar465._20_4_ = 0x42b0c0a5;
                  auVar465._24_4_ = 0x42b0c0a5;
                  auVar465._28_4_ = 0x42b0c0a5;
                  auVar162 = vminps_avx(auVar465,auVar162);
                  auVar472._8_4_ = 0xc2b0c0a5;
                  auVar472._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar472._12_4_ = 0xc2b0c0a5;
                  auVar472._16_4_ = 0xc2b0c0a5;
                  auVar472._20_4_ = 0xc2b0c0a5;
                  auVar472._24_4_ = 0xc2b0c0a5;
                  auVar472._28_4_ = 0xc2b0c0a5;
                  auVar158 = vmaxps_avx(auVar472,auVar162);
                  auVar429._8_4_ = 0x3fb8aa3b;
                  auVar429._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar429._12_4_ = 0x3fb8aa3b;
                  auVar429._16_4_ = 0x3fb8aa3b;
                  auVar429._20_4_ = 0x3fb8aa3b;
                  auVar429._24_4_ = 0x3fb8aa3b;
                  auVar429._28_4_ = 0x3fb8aa3b;
                  auVar252 = vfmadd213ps_fma(auVar429,auVar158,auVar347);
                  auVar231 = vroundps_avx(ZEXT1632(auVar252),1);
                  auVar162 = vcmpps_avx(ZEXT1632(auVar252),auVar231,1);
                  auVar162 = vandps_avx(auVar162,auVar164);
                  auVar162 = vsubps_avx(auVar231,auVar162);
                  auVar466._8_4_ = 0x3f318000;
                  auVar466._0_8_ = 0x3f3180003f318000;
                  auVar466._12_4_ = 0x3f318000;
                  auVar466._16_4_ = 0x3f318000;
                  auVar466._20_4_ = 0x3f318000;
                  auVar466._24_4_ = 0x3f318000;
                  auVar466._28_4_ = 0x3f318000;
                  auVar252 = vfmsub231ps_fma(auVar158,auVar162,auVar466);
                  auVar473._8_4_ = 0xb95e8083;
                  auVar473._0_8_ = 0xb95e8083b95e8083;
                  auVar473._12_4_ = 0xb95e8083;
                  auVar473._16_4_ = 0xb95e8083;
                  auVar473._20_4_ = 0xb95e8083;
                  auVar473._24_4_ = 0xb95e8083;
                  auVar473._28_4_ = 0xb95e8083;
                  auVar417 = vfnmsub231ps_fma(ZEXT1632(auVar252),auVar162,auVar473);
                  auVar158 = ZEXT1632(auVar417);
                  auVar29._28_4_ = auVar231._28_4_;
                  auVar29._0_28_ =
                       ZEXT1628(CONCAT412(auVar417._12_4_ * auVar417._12_4_,
                                          CONCAT48(auVar417._8_4_ * auVar417._8_4_,
                                                   CONCAT44(auVar417._4_4_ * auVar417._4_4_,
                                                            auVar417._0_4_ * auVar417._0_4_))));
                  auVar259._8_4_ = 0x39506967;
                  auVar259._0_8_ = 0x3950696739506967;
                  auVar259._12_4_ = 0x39506967;
                  auVar259._16_4_ = 0x39506967;
                  auVar259._20_4_ = 0x39506967;
                  auVar259._24_4_ = 0x39506967;
                  auVar259._28_4_ = 0x39506967;
                  auVar415._8_4_ = 0x3ab743ce;
                  auVar415._0_8_ = 0x3ab743ce3ab743ce;
                  auVar415._12_4_ = 0x3ab743ce;
                  auVar415._16_4_ = 0x3ab743ce;
                  auVar415._20_4_ = 0x3ab743ce;
                  auVar415._24_4_ = 0x3ab743ce;
                  auVar415._28_4_ = 0x3ab743ce;
                  auVar252 = vfmadd213ps_fma(auVar259,auVar158,auVar415);
                  auVar416._8_4_ = 0x3c088908;
                  auVar416._0_8_ = 0x3c0889083c088908;
                  auVar416._12_4_ = 0x3c088908;
                  auVar416._16_4_ = 0x3c088908;
                  auVar416._20_4_ = 0x3c088908;
                  auVar416._24_4_ = 0x3c088908;
                  auVar416._28_4_ = 0x3c088908;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar158,auVar416);
                  auVar386._8_4_ = 0x3d2aa9c1;
                  auVar386._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar386._12_4_ = 0x3d2aa9c1;
                  auVar386._16_4_ = 0x3d2aa9c1;
                  auVar386._20_4_ = 0x3d2aa9c1;
                  auVar386._24_4_ = 0x3d2aa9c1;
                  auVar386._28_4_ = 0x3d2aa9c1;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar158,auVar386);
                  auVar158 = ZEXT1632(auVar417);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar158,auVar478);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar158,auVar347);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar29,auVar158);
                  auVar218._0_4_ = auVar252._0_4_ + fVar80;
                  auVar218._4_4_ = auVar252._4_4_ + fVar79;
                  auVar218._8_4_ = auVar252._8_4_ + fVar3;
                  auVar218._12_4_ = auVar252._12_4_ + fVar250;
                  auVar218._16_4_ = fVar507 + 0.0;
                  auVar218._20_4_ = fVar508 + 0.0;
                  auVar218._24_4_ = fVar175 + 0.0;
                  auVar218._28_4_ = fVar28 + 0.0;
                  auVar251._0_4_ = (int)auVar162._0_4_;
                  auVar251._4_4_ = (int)auVar162._4_4_;
                  auVar251._8_4_ = (int)auVar162._8_4_;
                  auVar251._12_4_ = (int)auVar162._12_4_;
                  auVar260._16_4_ = (int)auVar162._16_4_;
                  auVar260._0_16_ = auVar251;
                  auVar260._20_4_ = (int)auVar162._20_4_;
                  auVar260._24_4_ = (int)auVar162._24_4_;
                  auVar260._28_4_ = (int)auVar162._28_4_;
                  auVar417 = vpslld_avx(auVar251,0x17);
                  auVar252 = vpslld_avx(auVar260._16_16_,0x17);
                  auVar252 = vpaddd_avx(auVar252,auVar253);
                  auVar417 = vpaddd_avx(auVar417,auVar253);
                  auVar499._16_16_ = auVar252;
                  auVar499._0_16_ = auVar417;
                  auVar251 = vfmadd213ps_fma(auVar499,auVar218,auVar164);
                  auVar219._8_4_ = 0x800000;
                  auVar219._0_8_ = 0x80000000800000;
                  auVar219._12_4_ = 0x800000;
                  auVar219._16_4_ = 0x800000;
                  auVar219._20_4_ = 0x800000;
                  auVar219._24_4_ = 0x800000;
                  auVar219._28_4_ = 0x800000;
                  auVar162 = vmaxps_avx(ZEXT1632(auVar251),auVar219);
                  auVar417 = vpsrld_avx(auVar162._0_16_,0x17);
                  auVar252 = vpsrld_avx(auVar162._16_16_,0x17);
                  auVar348._8_4_ = 0x807fffff;
                  auVar348._0_8_ = 0x807fffff807fffff;
                  auVar348._12_4_ = 0x807fffff;
                  auVar348._16_4_ = 0x807fffff;
                  auVar348._20_4_ = 0x807fffff;
                  auVar348._24_4_ = 0x807fffff;
                  auVar348._28_4_ = 0x807fffff;
                  auVar162 = vandps_avx(auVar162,auVar348);
                  auVar231 = vorps_avx(auVar162,auVar347);
                  auVar349._8_4_ = 0x3f3504f3;
                  auVar349._0_8_ = 0x3f3504f33f3504f3;
                  auVar349._12_4_ = 0x3f3504f3;
                  auVar349._16_4_ = 0x3f3504f3;
                  auVar349._20_4_ = 0x3f3504f3;
                  auVar349._24_4_ = 0x3f3504f3;
                  auVar349._28_4_ = 0x3f3504f3;
                  auVar158 = vcmpps_avx(auVar349,auVar231,2);
                  auVar162 = vandnps_avx(auVar158,auVar231);
                  auVar220._0_4_ = auVar162._0_4_ + auVar231._0_4_ + -1.0;
                  auVar220._4_4_ = auVar162._4_4_ + auVar231._4_4_ + -1.0;
                  auVar220._8_4_ = auVar162._8_4_ + auVar231._8_4_ + -1.0;
                  auVar220._12_4_ = auVar162._12_4_ + auVar231._12_4_ + -1.0;
                  auVar220._16_4_ = auVar162._16_4_ + auVar231._16_4_ + -1.0;
                  auVar220._20_4_ = auVar162._20_4_ + auVar231._20_4_ + -1.0;
                  auVar220._24_4_ = auVar162._24_4_ + auVar231._24_4_ + -1.0;
                  auVar220._28_4_ = auVar162._28_4_ + auVar231._28_4_ + -1.0;
                  auVar252 = vpsubd_avx(auVar252,auVar158._16_16_);
                  auVar148._8_4_ = 0xffffff81;
                  auVar148._0_8_ = 0xffffff81ffffff81;
                  auVar148._12_4_ = 0xffffff81;
                  auVar252 = vpaddd_avx(auVar252,auVar148);
                  auVar417 = vpsubd_avx(auVar417,auVar158._0_16_);
                  auVar417 = vpaddd_avx(auVar148,auVar417);
                  auVar261._16_16_ = auVar252;
                  auVar261._0_16_ = auVar417;
                  auVar30._4_4_ = auVar220._4_4_ * auVar220._4_4_;
                  auVar30._0_4_ = auVar220._0_4_ * auVar220._0_4_;
                  auVar30._8_4_ = auVar220._8_4_ * auVar220._8_4_;
                  auVar30._12_4_ = auVar220._12_4_ * auVar220._12_4_;
                  auVar30._16_4_ = auVar220._16_4_ * auVar220._16_4_;
                  auVar30._20_4_ = auVar220._20_4_ * auVar220._20_4_;
                  auVar30._24_4_ = auVar220._24_4_ * auVar220._24_4_;
                  auVar30._28_4_ = auVar158._28_4_;
                  auVar430._8_4_ = 0x3d9021bb;
                  auVar430._0_8_ = 0x3d9021bb3d9021bb;
                  auVar430._12_4_ = 0x3d9021bb;
                  auVar430._16_4_ = 0x3d9021bb;
                  auVar430._20_4_ = 0x3d9021bb;
                  auVar430._24_4_ = 0x3d9021bb;
                  auVar430._28_4_ = 0x3d9021bb;
                  auVar446._8_4_ = 0xbdebd1b8;
                  auVar446._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar446._12_4_ = 0xbdebd1b8;
                  auVar446._16_4_ = 0xbdebd1b8;
                  auVar446._20_4_ = 0xbdebd1b8;
                  auVar446._24_4_ = 0xbdebd1b8;
                  auVar446._28_4_ = 0xbdebd1b8;
                  auVar252 = vfmadd213ps_fma(auVar430,auVar220,auVar446);
                  auVar447._8_4_ = 0x3def251a;
                  auVar447._0_8_ = 0x3def251a3def251a;
                  auVar447._12_4_ = 0x3def251a;
                  auVar447._16_4_ = 0x3def251a;
                  auVar447._20_4_ = 0x3def251a;
                  auVar447._24_4_ = 0x3def251a;
                  auVar447._28_4_ = 0x3def251a;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar220,auVar447);
                  auVar448._8_4_ = 0xbdfe5d4f;
                  auVar448._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar448._12_4_ = 0xbdfe5d4f;
                  auVar448._16_4_ = 0xbdfe5d4f;
                  auVar448._20_4_ = 0xbdfe5d4f;
                  auVar448._24_4_ = 0xbdfe5d4f;
                  auVar448._28_4_ = 0xbdfe5d4f;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar220,auVar448);
                  auVar449._8_4_ = 0x3e11e9bf;
                  auVar449._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar449._12_4_ = 0x3e11e9bf;
                  auVar449._16_4_ = 0x3e11e9bf;
                  auVar449._20_4_ = 0x3e11e9bf;
                  auVar449._24_4_ = 0x3e11e9bf;
                  auVar449._28_4_ = 0x3e11e9bf;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar220,auVar449);
                  auVar450._8_4_ = 0xbe2aae50;
                  auVar450._0_8_ = 0xbe2aae50be2aae50;
                  auVar450._12_4_ = 0xbe2aae50;
                  auVar450._16_4_ = 0xbe2aae50;
                  auVar450._20_4_ = 0xbe2aae50;
                  auVar450._24_4_ = 0xbe2aae50;
                  auVar450._28_4_ = 0xbe2aae50;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar220,auVar450);
                  auVar451._8_4_ = 0x3e4cceac;
                  auVar451._0_8_ = 0x3e4cceac3e4cceac;
                  auVar451._12_4_ = 0x3e4cceac;
                  auVar451._16_4_ = 0x3e4cceac;
                  auVar451._20_4_ = 0x3e4cceac;
                  auVar451._24_4_ = 0x3e4cceac;
                  auVar451._28_4_ = 0x3e4cceac;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar220,auVar451);
                  auVar452._8_4_ = 0xbe7ffffc;
                  auVar452._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar452._12_4_ = 0xbe7ffffc;
                  auVar452._16_4_ = 0xbe7ffffc;
                  auVar452._20_4_ = 0xbe7ffffc;
                  auVar452._24_4_ = 0xbe7ffffc;
                  auVar452._28_4_ = 0xbe7ffffc;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar220,auVar452);
                  auVar453._8_4_ = 0x3eaaaaaa;
                  auVar453._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar453._12_4_ = 0x3eaaaaaa;
                  auVar453._16_4_ = 0x3eaaaaaa;
                  auVar453._20_4_ = 0x3eaaaaaa;
                  auVar453._24_4_ = 0x3eaaaaaa;
                  auVar453._28_4_ = 0x3eaaaaaa;
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar220,auVar453);
                  auVar431._0_4_ = auVar220._0_4_ * auVar220._0_4_ * auVar220._0_4_ * auVar252._0_4_
                  ;
                  auVar431._4_4_ = auVar220._4_4_ * auVar220._4_4_ * auVar220._4_4_ * auVar252._4_4_
                  ;
                  auVar431._8_4_ = auVar220._8_4_ * auVar220._8_4_ * auVar220._8_4_ * auVar252._8_4_
                  ;
                  auVar431._12_4_ =
                       auVar220._12_4_ * auVar220._12_4_ * auVar220._12_4_ * auVar252._12_4_;
                  auVar431._16_4_ = auVar220._16_4_ * auVar220._16_4_ * auVar220._16_4_ * 0.0;
                  auVar431._20_4_ = auVar220._20_4_ * auVar220._20_4_ * auVar220._20_4_ * 0.0;
                  auVar431._24_4_ = auVar220._24_4_ * auVar220._24_4_ * auVar220._24_4_ * 0.0;
                  auVar431._28_4_ = 0;
                  auVar158 = vcvtdq2ps_avx(auVar261);
                  auVar252 = vfmadd231ps_fma(auVar431,auVar158,auVar473);
                  auVar252 = vfmsub231ps_fma(ZEXT1632(auVar252),auVar347,auVar30);
                  auVar162 = vcmpps_avx(ZEXT1632(auVar251),_DAT_005a9220,2);
                  auVar231 = vsubps_avx(ZEXT1632(auVar252),auVar220);
                  auVar252 = vfmsub231ps_fma(auVar231,auVar466,auVar158);
                  auVar454._8_4_ = 0xc0000000;
                  auVar454._0_8_ = 0xc0000000c0000000;
                  auVar454._12_4_ = 0xc0000000;
                  auVar454._16_4_ = 0xc0000000;
                  auVar454._20_4_ = 0xc0000000;
                  auVar454._24_4_ = 0xc0000000;
                  auVar454._28_4_ = 0xc0000000;
                  auVar221._0_4_ = auVar252._0_4_ * -2.0;
                  auVar221._4_4_ = auVar252._4_4_ * -2.0;
                  auVar221._8_4_ = auVar252._8_4_ * -2.0;
                  auVar221._12_4_ = auVar252._12_4_ * -2.0;
                  auVar221._16_4_ = 0x80000000;
                  auVar221._20_4_ = 0x80000000;
                  auVar221._24_4_ = 0x80000000;
                  auVar221._28_4_ = 0;
                  auVar262._8_4_ = 0x7fffffff;
                  auVar262._0_8_ = 0x7fffffff7fffffff;
                  auVar262._12_4_ = 0x7fffffff;
                  auVar262._16_4_ = 0x7fffffff;
                  auVar262._20_4_ = 0x7fffffff;
                  auVar262._24_4_ = 0x7fffffff;
                  auVar262._28_4_ = 0x7fffffff;
                  auVar162 = vblendvps_avx(auVar221,auVar262,auVar162);
                  auVar263._8_4_ = 0x42b0c0a5;
                  auVar263._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar263._12_4_ = 0x42b0c0a5;
                  auVar263._16_4_ = 0x42b0c0a5;
                  auVar263._20_4_ = 0x42b0c0a5;
                  auVar263._24_4_ = 0x42b0c0a5;
                  auVar263._28_4_ = 0x42b0c0a5;
                  auVar162 = vminps_avx(auVar162,auVar263);
                  auVar264._8_4_ = 0xc2b0c0a5;
                  auVar264._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar264._12_4_ = 0xc2b0c0a5;
                  auVar264._16_4_ = 0xc2b0c0a5;
                  auVar264._20_4_ = 0xc2b0c0a5;
                  auVar264._24_4_ = 0xc2b0c0a5;
                  auVar264._28_4_ = 0xc2b0c0a5;
                  auVar158 = vmaxps_avx(auVar162,auVar264);
                  auVar265._8_4_ = 0x3fb8aa3b;
                  auVar265._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar265._12_4_ = 0x3fb8aa3b;
                  auVar265._16_4_ = 0x3fb8aa3b;
                  auVar265._20_4_ = 0x3fb8aa3b;
                  auVar265._24_4_ = 0x3fb8aa3b;
                  auVar265._28_4_ = 0x3fb8aa3b;
                  auVar252 = vfmadd213ps_fma(auVar265,auVar158,auVar347);
                  auVar231 = vroundps_avx(ZEXT1632(auVar252),1);
                  auVar162 = vcmpps_avx(ZEXT1632(auVar252),auVar231,1);
                  auVar162 = vandps_avx(auVar162,auVar164);
                  auVar162 = vsubps_avx(auVar231,auVar162);
                  auVar252 = vfmsub231ps_fma(auVar158,auVar162,auVar466);
                  auVar417 = vfnmsub231ps_fma(ZEXT1632(auVar252),auVar162,auVar473);
                  auVar158 = ZEXT1632(auVar417);
                  auVar31._28_4_ = auVar231._28_4_;
                  auVar31._0_28_ =
                       ZEXT1628(CONCAT412(auVar417._12_4_ * auVar417._12_4_,
                                          CONCAT48(auVar417._8_4_ * auVar417._8_4_,
                                                   CONCAT44(auVar417._4_4_ * auVar417._4_4_,
                                                            auVar417._0_4_ * auVar417._0_4_))));
                  auVar432._8_4_ = 0x39506967;
                  auVar432._0_8_ = 0x3950696739506967;
                  auVar432._12_4_ = 0x39506967;
                  auVar432._16_4_ = 0x39506967;
                  auVar432._20_4_ = 0x39506967;
                  auVar432._24_4_ = 0x39506967;
                  auVar432._28_4_ = 0x39506967;
                  auVar467._8_4_ = 0x3ab743ce;
                  auVar467._0_8_ = 0x3ab743ce3ab743ce;
                  auVar467._12_4_ = 0x3ab743ce;
                  auVar467._16_4_ = 0x3ab743ce;
                  auVar467._20_4_ = 0x3ab743ce;
                  auVar467._24_4_ = 0x3ab743ce;
                  auVar467._28_4_ = 0x3ab743ce;
                  auVar252 = vfmadd213ps_fma(auVar432,auVar158,auVar467);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar158,auVar416);
                  auVar356 = ZEXT3264(auVar164);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar158,auVar386);
                  auVar158 = ZEXT1632(auVar417);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar158,auVar478);
                  auVar407 = ZEXT3264(auVar347);
                  auVar252 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar158,auVar347);
                  auVar251 = vfmadd213ps_fma(ZEXT1632(auVar252),auVar31,auVar158);
                  auVar417._0_4_ = (int)auVar162._0_4_;
                  auVar417._4_4_ = (int)auVar162._4_4_;
                  auVar417._8_4_ = (int)auVar162._8_4_;
                  auVar417._12_4_ = (int)auVar162._12_4_;
                  auVar222._16_4_ = (int)auVar162._16_4_;
                  auVar222._0_16_ = auVar417;
                  auVar222._20_4_ = (int)auVar162._20_4_;
                  auVar222._24_4_ = (int)auVar162._24_4_;
                  auVar222._28_4_ = (int)auVar162._28_4_;
                  auVar417 = vpslld_avx(auVar417,0x17);
                  auVar252 = vpslld_avx(auVar222._16_16_,0x17);
                  auVar252 = vpaddd_avx(auVar252,auVar253);
                  auVar417 = vpaddd_avx(auVar417,auVar253);
                  auVar223._16_16_ = auVar252;
                  auVar223._0_16_ = auVar417;
                  auVar266._0_4_ = auVar251._0_4_ + fVar80;
                  auVar266._4_4_ = auVar251._4_4_ + fVar79;
                  auVar266._8_4_ = auVar251._8_4_ + fVar3;
                  auVar266._12_4_ = auVar251._12_4_ + fVar250;
                  auVar266._16_4_ = fVar507 + 0.0;
                  auVar266._20_4_ = fVar508 + 0.0;
                  auVar266._24_4_ = fVar175 + 0.0;
                  auVar266._28_4_ = fVar28 + 0.0;
                  auVar252 = vfmadd213ps_fma(auVar223,auVar266,auVar164);
                  auVar162 = vdivps_avx(auVar164,ZEXT1632(auVar252));
                  auVar252 = vfnmadd213ps_fma(auVar162,auVar454,auVar168);
                  auVar217 = ZEXT1628(auVar252);
                  goto LAB_0029667f;
                case 6:
                  puVar21 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar1 = *puVar21;
                  auVar229._4_4_ = uVar1;
                  auVar229._0_4_ = uVar1;
                  auVar229._8_4_ = uVar1;
                  auVar229._12_4_ = uVar1;
                  auVar229._16_4_ = uVar1;
                  auVar229._20_4_ = uVar1;
                  auVar229._24_4_ = uVar1;
                  auVar229._28_4_ = uVar1;
                  uVar1 = puVar21[1];
                  auVar269._4_4_ = uVar1;
                  auVar269._0_4_ = uVar1;
                  auVar269._8_4_ = uVar1;
                  auVar269._12_4_ = uVar1;
                  auVar269._16_4_ = uVar1;
                  auVar269._20_4_ = uVar1;
                  auVar269._24_4_ = uVar1;
                  auVar269._28_4_ = uVar1;
                  auVar252 = vfmadd231ps_fma(auVar269,auVar162,auVar229);
                  auVar162 = vmaxps_avx(ZEXT1632(auVar252),_DAT_005a9220);
                  auVar162 = vminps_avx(auVar162,auVar164);
                  auVar217 = auVar162._0_28_;
LAB_0029667f:
                  auVar474._0_4_ = auVar217._0_4_ * auVar173._0_4_;
                  auVar474._4_4_ = auVar217._4_4_ * auVar173._4_4_;
                  auVar474._8_4_ = auVar217._8_4_ * auVar173._8_4_;
                  auVar474._12_4_ = auVar217._12_4_ * auVar173._12_4_;
                  auVar474._16_4_ = auVar217._16_4_ * auVar173._16_4_;
                  auVar474._20_4_ = auVar217._20_4_ * auVar173._20_4_;
                  auVar474._24_4_ = auVar217._24_4_ * auVar173._24_4_;
                  auVar162 = auVar474._0_32_;
                }
                *pauVar72 = auVar162;
                pauVar72 = pauVar72 + 1;
                uVar57 = uVar57 + 1;
                iVar2 = iVar2 + 1;
              } while (uVar57 != local_198.w);
            }
            iVar75 = iVar75 + 1;
          } while (iVar75 != local_198.h);
        }
        local_260 = (void *)((long)local_260 + 1);
      } while (local_260 != (void *)(long)local_198.c);
    }
    if ((uVar58 == 4) && (uVar69 == 8)) {
      if ((long)local_198.c < 1) goto LAB_0029a2e9;
      iVar15 = (this->super_Deconvolution).dilation_w;
      iVar16 = (this->super_Deconvolution).dilation_h;
      iVar46 = (this->super_Deconvolution).stride_w;
      iVar51 = (this->super_Deconvolution).stride_h;
      iVar63 = (this->super_Deconvolution).activation_type;
      pvVar25 = (this->super_Deconvolution).bias_data.data;
      uVar17 = (this->super_Deconvolution).kernel_w;
      uVar52 = (this->super_Deconvolution).kernel_h;
      local_260 = (void *)0x0;
      auVar173 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar356 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar474 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar407 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar481 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      do {
        if (0 < local_198.h) {
          iVar62 = bottom_blob->w;
          iVar61 = bottom_blob->h;
          pauVar72 = (undefined1 (*) [32])
                     (local_198.cstep * (long)local_260 * local_198.elemsize + (long)local_198.data)
          ;
          uVar18 = bottom_blob->c;
          iVar75 = 0;
          do {
            if (0 < local_198.w) {
              uVar57 = 0;
              iVar2 = (1 - uVar17) * iVar15;
              do {
                if (pvVar25 == (void *)0x0) {
                  auVar174 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar174 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar25 + (long)local_260 * 0x20)
                                     );
                }
                if (0 < (int)uVar18) {
                  pvVar67 = (void *)((this->weight_data_tm).cstep * (long)local_260 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar20 = bottom_blob->data;
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar52) {
                      uVar65 = 0;
                      uVar55 = 0;
                      do {
                        iVar47 = (((int)uVar55 - uVar52) + 1) * iVar16 + iVar75;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar51, iVar47 % iVar51 == 0)) &&
                            (0 < (int)uVar17)) && (iVar48 < iVar61)) {
                          lVar71 = (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                          uVar66 = uVar65;
                          uVar68 = (ulong)uVar17;
                          iVar47 = iVar2;
                          do {
                            if (((-1 < iVar47) && (iVar48 = iVar47 / iVar46, iVar47 % iVar46 == 0))
                               && (iVar48 < iVar62)) {
                              lVar70 = (long)(iVar48 << 2);
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71);
                              auVar230._4_4_ = uVar1;
                              auVar230._0_4_ = uVar1;
                              auVar230._8_4_ = uVar1;
                              auVar230._12_4_ = uVar1;
                              auVar230._16_4_ = uVar1;
                              auVar230._20_4_ = uVar1;
                              auVar230._24_4_ = uVar1;
                              auVar230._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 4);
                              auVar270._4_4_ = uVar1;
                              auVar270._0_4_ = uVar1;
                              auVar270._8_4_ = uVar1;
                              auVar270._12_4_ = uVar1;
                              auVar270._16_4_ = uVar1;
                              auVar270._20_4_ = uVar1;
                              auVar270._24_4_ = uVar1;
                              auVar270._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 8);
                              auVar350._4_4_ = uVar1;
                              auVar350._0_4_ = uVar1;
                              auVar350._8_4_ = uVar1;
                              auVar350._12_4_ = uVar1;
                              auVar350._16_4_ = uVar1;
                              auVar350._20_4_ = uVar1;
                              auVar350._24_4_ = uVar1;
                              auVar350._28_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 0xc);
                              auVar434._4_4_ = uVar1;
                              auVar434._0_4_ = uVar1;
                              auVar434._8_4_ = uVar1;
                              auVar434._12_4_ = uVar1;
                              auVar434._16_4_ = uVar1;
                              auVar434._20_4_ = uVar1;
                              auVar434._24_4_ = uVar1;
                              auVar434._28_4_ = uVar1;
                              uVar53 = uVar66 & 0xffffffff;
                              auVar253 = vfmadd231ps_fma(auVar174._0_32_,auVar230,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar53 * 4));
                              auVar253 = vfmadd231ps_fma(ZEXT1632(auVar253),auVar270,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x20));
                              auVar253 = vfmadd231ps_fma(ZEXT1632(auVar253),auVar350,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x40));
                              auVar253 = vfmadd231ps_fma(ZEXT1632(auVar253),auVar434,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x60));
                              auVar174 = ZEXT1664(auVar253);
                            }
                            uVar66 = uVar66 + 0x20;
                            iVar47 = iVar47 + iVar15;
                            uVar68 = uVar68 - 1;
                          } while (uVar68 != 0);
                        }
                        uVar55 = uVar55 + 1;
                        uVar65 = uVar65 + (ulong)uVar17 * 0x20;
                      } while (uVar55 != uVar52);
                    }
                    pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar17 * uVar52 * 0x20) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar18);
                }
                auVar168 = auVar174._0_32_;
                auVar162 = auVar407._0_32_;
                auVar158 = auVar481._0_32_;
                auVar478 = auVar356._0_32_;
                auVar164 = auVar173._0_32_;
                auVar347 = auVar474._0_32_;
                auVar468._28_36_ = auVar174._28_36_;
                fVar80 = auVar407._0_4_;
                fVar79 = auVar407._4_4_;
                fVar3 = auVar407._8_4_;
                fVar250 = auVar407._12_4_;
                fVar507 = auVar407._16_4_;
                fVar508 = auVar407._20_4_;
                fVar175 = auVar407._24_4_;
                fVar28 = auVar407._28_4_;
                switch(iVar63) {
                case 1:
                  auVar168 = vmaxps_avx(auVar168,_DAT_005a9220);
                  break;
                case 2:
                  auVar478 = vmaxps_avx(auVar168,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar168 = vminps_avx(auVar168,ZEXT1632(ZEXT816(0) << 0x40));
                  uVar1 = *(this->super_Deconvolution).activation_params.data;
                  auVar167._4_4_ = uVar1;
                  auVar167._0_4_ = uVar1;
                  auVar167._8_4_ = uVar1;
                  auVar167._12_4_ = uVar1;
                  auVar167._16_4_ = uVar1;
                  auVar167._20_4_ = uVar1;
                  auVar167._24_4_ = uVar1;
                  auVar167._28_4_ = uVar1;
                  auVar253 = vfmadd213ps_fma(auVar167,auVar168,auVar478);
                  auVar168 = ZEXT1632(auVar253);
                  break;
                case 3:
                  puVar21 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar1 = *puVar21;
                  auVar238._4_4_ = uVar1;
                  auVar238._0_4_ = uVar1;
                  auVar238._8_4_ = uVar1;
                  auVar238._12_4_ = uVar1;
                  auVar238._16_4_ = uVar1;
                  auVar238._20_4_ = uVar1;
                  auVar238._24_4_ = uVar1;
                  auVar238._28_4_ = uVar1;
                  uVar1 = puVar21[1];
                  auVar502._4_4_ = uVar1;
                  auVar502._0_4_ = uVar1;
                  auVar502._8_4_ = uVar1;
                  auVar502._12_4_ = uVar1;
                  auVar502._16_4_ = uVar1;
                  auVar502._20_4_ = uVar1;
                  auVar502._24_4_ = uVar1;
                  auVar502._28_4_ = uVar1;
                  auVar168 = vmaxps_avx(auVar168,auVar238);
                  auVar168 = vminps_avx(auVar502,auVar168);
                  break;
                case 4:
                  auVar163._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
                  auVar163._8_4_ = -auVar174._8_4_;
                  auVar163._12_4_ = -auVar174._12_4_;
                  auVar163._16_4_ = -auVar174._16_4_;
                  auVar163._20_4_ = -auVar174._20_4_;
                  auVar163._24_4_ = -auVar174._24_4_;
                  auVar163._28_4_ = auVar174._28_4_ ^ 0x80000000;
                  auVar116._8_4_ = 0x42b0c0a5;
                  auVar116._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar116._12_4_ = 0x42b0c0a5;
                  auVar116._16_4_ = 0x42b0c0a5;
                  auVar116._20_4_ = 0x42b0c0a5;
                  auVar116._24_4_ = 0x42b0c0a5;
                  auVar116._28_4_ = 0x42b0c0a5;
                  auVar168 = vminps_avx(auVar163,auVar116);
                  auVar164 = vmaxps_avx(auVar164,auVar168);
                  auVar253 = vfmadd213ps_fma(auVar347,auVar164,auVar478);
                  auVar347 = vroundps_avx(ZEXT1632(auVar253),1);
                  auVar168 = vcmpps_avx(ZEXT1632(auVar253),auVar347,1);
                  auVar168 = vandps_avx(auVar168,auVar162);
                  auVar168 = vsubps_avx(auVar347,auVar168);
                  auVar117._8_4_ = 0x3f318000;
                  auVar117._0_8_ = 0x3f3180003f318000;
                  auVar117._12_4_ = 0x3f318000;
                  auVar117._16_4_ = 0x3f318000;
                  auVar117._20_4_ = 0x3f318000;
                  auVar117._24_4_ = 0x3f318000;
                  auVar117._28_4_ = 0x3f318000;
                  auVar253 = vfmsub231ps_fma(auVar164,auVar168,auVar117);
                  auVar275._8_4_ = 0x395e8083;
                  auVar275._0_8_ = 0x395e8083395e8083;
                  auVar275._12_4_ = 0x395e8083;
                  auVar275._16_4_ = 0x395e8083;
                  auVar275._20_4_ = 0x395e8083;
                  auVar275._24_4_ = 0x395e8083;
                  auVar275._28_4_ = 0x395e8083;
                  auVar252 = vfmsub231ps_fma(ZEXT1632(auVar253),auVar168,auVar275);
                  auVar164 = ZEXT1632(auVar252);
                  auVar36._28_4_ = auVar347._28_4_;
                  auVar36._0_28_ =
                       ZEXT1628(CONCAT412(auVar252._12_4_ * auVar252._12_4_,
                                          CONCAT48(auVar252._8_4_ * auVar252._8_4_,
                                                   CONCAT44(auVar252._4_4_ * auVar252._4_4_,
                                                            auVar252._0_4_ * auVar252._0_4_))));
                  auVar118._8_4_ = 0x3ab743ce;
                  auVar118._0_8_ = 0x3ab743ce3ab743ce;
                  auVar118._12_4_ = 0x3ab743ce;
                  auVar118._16_4_ = 0x3ab743ce;
                  auVar118._20_4_ = 0x3ab743ce;
                  auVar118._24_4_ = 0x3ab743ce;
                  auVar118._28_4_ = 0x3ab743ce;
                  auVar253 = vfmadd213ps_fma(auVar158,auVar164,auVar118);
                  auVar276._8_4_ = 0x3c088908;
                  auVar276._0_8_ = 0x3c0889083c088908;
                  auVar276._12_4_ = 0x3c088908;
                  auVar276._16_4_ = 0x3c088908;
                  auVar276._20_4_ = 0x3c088908;
                  auVar276._24_4_ = 0x3c088908;
                  auVar276._28_4_ = 0x3c088908;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar164,auVar276);
                  auVar277._8_4_ = 0x3d2aa9c1;
                  auVar277._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar277._12_4_ = 0x3d2aa9c1;
                  auVar277._16_4_ = 0x3d2aa9c1;
                  auVar277._20_4_ = 0x3d2aa9c1;
                  auVar277._24_4_ = 0x3d2aa9c1;
                  auVar277._28_4_ = 0x3d2aa9c1;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar164,auVar277);
                  auVar119._8_4_ = 0x3e2aaaaa;
                  auVar119._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar119._12_4_ = 0x3e2aaaaa;
                  auVar119._16_4_ = 0x3e2aaaaa;
                  auVar119._20_4_ = 0x3e2aaaaa;
                  auVar119._24_4_ = 0x3e2aaaaa;
                  auVar119._28_4_ = 0x3e2aaaaa;
                  auVar164 = ZEXT1632(auVar252);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar164,auVar119);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar164,auVar478);
                  auVar417 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar36,auVar164);
                  auVar133._0_4_ = (int)auVar168._0_4_;
                  auVar133._4_4_ = (int)auVar168._4_4_;
                  auVar133._8_4_ = (int)auVar168._8_4_;
                  auVar133._12_4_ = (int)auVar168._12_4_;
                  auVar165._16_4_ = (int)auVar168._16_4_;
                  auVar165._0_16_ = auVar133;
                  auVar165._20_4_ = (int)auVar168._20_4_;
                  auVar165._24_4_ = (int)auVar168._24_4_;
                  auVar165._28_4_ = (int)auVar168._28_4_;
                  auVar252 = vpslld_avx(auVar133,0x17);
                  auVar253 = vpslld_avx(auVar165._16_16_,0x17);
                  auVar83._8_4_ = 0x3f800000;
                  auVar83._0_8_ = 0x3f8000003f800000;
                  auVar83._12_4_ = 0x3f800000;
                  auVar253 = vpaddd_avx(auVar253,auVar83);
                  auVar252 = vpaddd_avx(auVar252,auVar83);
                  auVar166._16_16_ = auVar253;
                  auVar166._0_16_ = auVar252;
                  auVar239._0_4_ = auVar417._0_4_ + fVar80;
                  auVar239._4_4_ = auVar417._4_4_ + fVar79;
                  auVar239._8_4_ = auVar417._8_4_ + fVar3;
                  auVar239._12_4_ = auVar417._12_4_ + fVar250;
                  auVar239._16_4_ = fVar507 + 0.0;
                  auVar239._20_4_ = fVar508 + 0.0;
                  auVar239._24_4_ = fVar175 + 0.0;
                  auVar239._28_4_ = fVar28 + 0.0;
                  auVar253 = vfmadd213ps_fma(auVar166,auVar239,auVar162);
                  auVar168 = vdivps_avx(auVar162,ZEXT1632(auVar253));
                  break;
                case 5:
                  auVar455._8_4_ = 0x42b0c0a5;
                  auVar455._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar455._12_4_ = 0x42b0c0a5;
                  auVar455._16_4_ = 0x42b0c0a5;
                  auVar455._20_4_ = 0x42b0c0a5;
                  auVar455._24_4_ = 0x42b0c0a5;
                  auVar455._28_4_ = 0x42b0c0a5;
                  auVar168 = vminps_avx(auVar455,auVar168);
                  auVar231 = vmaxps_avx(auVar164,auVar168);
                  auVar253 = vfmadd213ps_fma(auVar347,auVar231,auVar478);
                  auVar464 = vroundps_avx(ZEXT1632(auVar253),1);
                  auVar168 = vcmpps_avx(ZEXT1632(auVar253),auVar464,1);
                  auVar168 = vandps_avx(auVar168,auVar162);
                  auVar168 = vsubps_avx(auVar464,auVar168);
                  auVar362._8_4_ = 0x3f318000;
                  auVar362._0_8_ = 0x3f3180003f318000;
                  auVar362._12_4_ = 0x3f318000;
                  auVar362._16_4_ = 0x3f318000;
                  auVar362._20_4_ = 0x3f318000;
                  auVar362._24_4_ = 0x3f318000;
                  auVar362._28_4_ = 0x3f318000;
                  auVar253 = vfmsub231ps_fma(auVar231,auVar168,auVar362);
                  auVar113._8_4_ = 0xb95e8083;
                  auVar113._0_8_ = 0xb95e8083b95e8083;
                  auVar113._12_4_ = 0xb95e8083;
                  auVar113._16_4_ = 0xb95e8083;
                  auVar113._20_4_ = 0xb95e8083;
                  auVar113._24_4_ = 0xb95e8083;
                  auVar113._28_4_ = 0xb95e8083;
                  auVar252 = vfnmsub231ps_fma(ZEXT1632(auVar253),auVar168,auVar113);
                  auVar231 = ZEXT1632(auVar252);
                  auVar33._28_4_ = auVar464._28_4_;
                  auVar33._0_28_ =
                       ZEXT1628(CONCAT412(auVar252._12_4_ * auVar252._12_4_,
                                          CONCAT48(auVar252._8_4_ * auVar252._8_4_,
                                                   CONCAT44(auVar252._4_4_ * auVar252._4_4_,
                                                            auVar252._0_4_ * auVar252._0_4_))));
                  auVar479._8_4_ = 0x3ab743ce;
                  auVar479._0_8_ = 0x3ab743ce3ab743ce;
                  auVar479._12_4_ = 0x3ab743ce;
                  auVar479._16_4_ = 0x3ab743ce;
                  auVar479._20_4_ = 0x3ab743ce;
                  auVar479._24_4_ = 0x3ab743ce;
                  auVar479._28_4_ = 0x3ab743ce;
                  auVar253 = vfmadd213ps_fma(auVar158,auVar231,auVar479);
                  auVar387._8_4_ = 0x3c088908;
                  auVar387._0_8_ = 0x3c0889083c088908;
                  auVar387._12_4_ = 0x3c088908;
                  auVar387._16_4_ = 0x3c088908;
                  auVar387._20_4_ = 0x3c088908;
                  auVar387._24_4_ = 0x3c088908;
                  auVar387._28_4_ = 0x3c088908;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar231,auVar387);
                  auVar332._8_4_ = 0x3d2aa9c1;
                  auVar332._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar332._12_4_ = 0x3d2aa9c1;
                  auVar332._16_4_ = 0x3d2aa9c1;
                  auVar332._20_4_ = 0x3d2aa9c1;
                  auVar332._24_4_ = 0x3d2aa9c1;
                  auVar332._28_4_ = 0x3d2aa9c1;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar231,auVar332);
                  auVar333._8_4_ = 0x3e2aaaaa;
                  auVar333._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar333._12_4_ = 0x3e2aaaaa;
                  auVar333._16_4_ = 0x3e2aaaaa;
                  auVar333._20_4_ = 0x3e2aaaaa;
                  auVar333._24_4_ = 0x3e2aaaaa;
                  auVar333._28_4_ = 0x3e2aaaaa;
                  auVar231 = ZEXT1632(auVar252);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar231,auVar333);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar231,auVar478);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar33,auVar231);
                  auVar232._0_4_ = auVar253._0_4_ + fVar80;
                  auVar232._4_4_ = auVar253._4_4_ + fVar79;
                  auVar232._8_4_ = auVar253._8_4_ + fVar3;
                  auVar232._12_4_ = auVar253._12_4_ + fVar250;
                  auVar232._16_4_ = fVar507 + 0.0;
                  auVar232._20_4_ = fVar508 + 0.0;
                  auVar232._24_4_ = fVar175 + 0.0;
                  auVar232._28_4_ = fVar28 + 0.0;
                  auVar382._0_4_ = (int)auVar168._0_4_;
                  auVar382._4_4_ = (int)auVar168._4_4_;
                  auVar382._8_4_ = (int)auVar168._8_4_;
                  auVar382._12_4_ = (int)auVar168._12_4_;
                  auVar271._16_4_ = (int)auVar168._16_4_;
                  auVar271._0_16_ = auVar382;
                  auVar271._20_4_ = (int)auVar168._20_4_;
                  auVar271._24_4_ = (int)auVar168._24_4_;
                  auVar271._28_4_ = (int)auVar168._28_4_;
                  auVar252 = vpslld_avx(auVar382,0x17);
                  auVar253 = vpslld_avx(auVar271._16_16_,0x17);
                  auVar366._8_4_ = 0x3f800000;
                  auVar366._0_8_ = 0x3f8000003f800000;
                  auVar366._12_4_ = 0x3f800000;
                  auVar253 = vpaddd_avx(auVar366,auVar253);
                  auVar252 = vpaddd_avx(auVar252,auVar366);
                  auVar501._16_16_ = auVar253;
                  auVar501._0_16_ = auVar252;
                  auVar417 = vfmadd213ps_fma(auVar501,auVar232,auVar162);
                  auVar233._8_4_ = 0x800000;
                  auVar233._0_8_ = 0x80000000800000;
                  auVar233._12_4_ = 0x800000;
                  auVar233._16_4_ = 0x800000;
                  auVar233._20_4_ = 0x800000;
                  auVar233._24_4_ = 0x800000;
                  auVar233._28_4_ = 0x800000;
                  auVar168 = vmaxps_avx(ZEXT1632(auVar417),auVar233);
                  auVar252 = vpsrld_avx(auVar168._0_16_,0x17);
                  auVar253 = vpsrld_avx(auVar168._16_16_,0x17);
                  auVar334._8_4_ = 0x807fffff;
                  auVar334._0_8_ = 0x807fffff807fffff;
                  auVar334._12_4_ = 0x807fffff;
                  auVar334._16_4_ = 0x807fffff;
                  auVar334._20_4_ = 0x807fffff;
                  auVar334._24_4_ = 0x807fffff;
                  auVar334._28_4_ = 0x807fffff;
                  auVar168 = vandps_avx(auVar168,auVar334);
                  auVar464 = vorps_avx(auVar168,auVar478);
                  auVar335._8_4_ = 0x3f3504f3;
                  auVar335._0_8_ = 0x3f3504f33f3504f3;
                  auVar335._12_4_ = 0x3f3504f3;
                  auVar335._16_4_ = 0x3f3504f3;
                  auVar335._20_4_ = 0x3f3504f3;
                  auVar335._24_4_ = 0x3f3504f3;
                  auVar335._28_4_ = 0x3f3504f3;
                  auVar231 = vcmpps_avx(auVar335,auVar464,2);
                  auVar168 = vandnps_avx(auVar231,auVar464);
                  auVar234._0_4_ = auVar168._0_4_ + auVar464._0_4_ + -1.0;
                  auVar234._4_4_ = auVar168._4_4_ + auVar464._4_4_ + -1.0;
                  auVar234._8_4_ = auVar168._8_4_ + auVar464._8_4_ + -1.0;
                  auVar234._12_4_ = auVar168._12_4_ + auVar464._12_4_ + -1.0;
                  auVar234._16_4_ = auVar168._16_4_ + auVar464._16_4_ + -1.0;
                  auVar234._20_4_ = auVar168._20_4_ + auVar464._20_4_ + -1.0;
                  auVar234._24_4_ = auVar168._24_4_ + auVar464._24_4_ + -1.0;
                  auVar234._28_4_ = auVar168._28_4_ + auVar464._28_4_ + -1.0;
                  auVar253 = vpsubd_avx(auVar253,auVar231._16_16_);
                  auVar439._8_4_ = 0xffffff81;
                  auVar439._0_8_ = 0xffffff81ffffff81;
                  auVar439._12_4_ = 0xffffff81;
                  auVar253 = vpaddd_avx(auVar253,auVar439);
                  auVar252 = vpsubd_avx(auVar252,auVar231._0_16_);
                  auVar252 = vpaddd_avx(auVar439,auVar252);
                  auVar272._16_16_ = auVar253;
                  auVar272._0_16_ = auVar252;
                  auVar34._4_4_ = auVar234._4_4_ * auVar234._4_4_;
                  auVar34._0_4_ = auVar234._0_4_ * auVar234._0_4_;
                  auVar34._8_4_ = auVar234._8_4_ * auVar234._8_4_;
                  auVar34._12_4_ = auVar234._12_4_ * auVar234._12_4_;
                  auVar34._16_4_ = auVar234._16_4_ * auVar234._16_4_;
                  auVar34._20_4_ = auVar234._20_4_ * auVar234._20_4_;
                  auVar34._24_4_ = auVar234._24_4_ * auVar234._24_4_;
                  auVar34._28_4_ = auVar231._28_4_;
                  auVar435._8_4_ = 0x3d9021bb;
                  auVar435._0_8_ = 0x3d9021bb3d9021bb;
                  auVar435._12_4_ = 0x3d9021bb;
                  auVar435._16_4_ = 0x3d9021bb;
                  auVar435._20_4_ = 0x3d9021bb;
                  auVar435._24_4_ = 0x3d9021bb;
                  auVar435._28_4_ = 0x3d9021bb;
                  auVar388._8_4_ = 0xbdebd1b8;
                  auVar388._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar388._12_4_ = 0xbdebd1b8;
                  auVar388._16_4_ = 0xbdebd1b8;
                  auVar388._20_4_ = 0xbdebd1b8;
                  auVar388._24_4_ = 0xbdebd1b8;
                  auVar388._28_4_ = 0xbdebd1b8;
                  auVar253 = vfmadd213ps_fma(auVar435,auVar234,auVar388);
                  auVar389._8_4_ = 0x3def251a;
                  auVar389._0_8_ = 0x3def251a3def251a;
                  auVar389._12_4_ = 0x3def251a;
                  auVar389._16_4_ = 0x3def251a;
                  auVar389._20_4_ = 0x3def251a;
                  auVar389._24_4_ = 0x3def251a;
                  auVar389._28_4_ = 0x3def251a;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar234,auVar389);
                  auVar390._8_4_ = 0xbdfe5d4f;
                  auVar390._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar390._12_4_ = 0xbdfe5d4f;
                  auVar390._16_4_ = 0xbdfe5d4f;
                  auVar390._20_4_ = 0xbdfe5d4f;
                  auVar390._24_4_ = 0xbdfe5d4f;
                  auVar390._28_4_ = 0xbdfe5d4f;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar234,auVar390);
                  auVar391._8_4_ = 0x3e11e9bf;
                  auVar391._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar391._12_4_ = 0x3e11e9bf;
                  auVar391._16_4_ = 0x3e11e9bf;
                  auVar391._20_4_ = 0x3e11e9bf;
                  auVar391._24_4_ = 0x3e11e9bf;
                  auVar391._28_4_ = 0x3e11e9bf;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar234,auVar391);
                  auVar392._8_4_ = 0xbe2aae50;
                  auVar392._0_8_ = 0xbe2aae50be2aae50;
                  auVar392._12_4_ = 0xbe2aae50;
                  auVar392._16_4_ = 0xbe2aae50;
                  auVar392._20_4_ = 0xbe2aae50;
                  auVar392._24_4_ = 0xbe2aae50;
                  auVar392._28_4_ = 0xbe2aae50;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar234,auVar392);
                  auVar393._8_4_ = 0x3e4cceac;
                  auVar393._0_8_ = 0x3e4cceac3e4cceac;
                  auVar393._12_4_ = 0x3e4cceac;
                  auVar393._16_4_ = 0x3e4cceac;
                  auVar393._20_4_ = 0x3e4cceac;
                  auVar393._24_4_ = 0x3e4cceac;
                  auVar393._28_4_ = 0x3e4cceac;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar234,auVar393);
                  auVar394._8_4_ = 0xbe7ffffc;
                  auVar394._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar394._12_4_ = 0xbe7ffffc;
                  auVar394._16_4_ = 0xbe7ffffc;
                  auVar394._20_4_ = 0xbe7ffffc;
                  auVar394._24_4_ = 0xbe7ffffc;
                  auVar394._28_4_ = 0xbe7ffffc;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar234,auVar394);
                  auVar395._8_4_ = 0x3eaaaaaa;
                  auVar395._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar395._12_4_ = 0x3eaaaaaa;
                  auVar395._16_4_ = 0x3eaaaaaa;
                  auVar395._20_4_ = 0x3eaaaaaa;
                  auVar395._24_4_ = 0x3eaaaaaa;
                  auVar395._28_4_ = 0x3eaaaaaa;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar234,auVar395);
                  auVar436._0_4_ = auVar234._0_4_ * auVar234._0_4_ * auVar234._0_4_ * auVar253._0_4_
                  ;
                  auVar436._4_4_ = auVar234._4_4_ * auVar234._4_4_ * auVar234._4_4_ * auVar253._4_4_
                  ;
                  auVar436._8_4_ = auVar234._8_4_ * auVar234._8_4_ * auVar234._8_4_ * auVar253._8_4_
                  ;
                  auVar436._12_4_ =
                       auVar234._12_4_ * auVar234._12_4_ * auVar234._12_4_ * auVar253._12_4_;
                  auVar436._16_4_ = auVar234._16_4_ * auVar234._16_4_ * auVar234._16_4_ * 0.0;
                  auVar436._20_4_ = auVar234._20_4_ * auVar234._20_4_ * auVar234._20_4_ * 0.0;
                  auVar436._24_4_ = auVar234._24_4_ * auVar234._24_4_ * auVar234._24_4_ * 0.0;
                  auVar436._28_4_ = 0;
                  auVar231 = vcvtdq2ps_avx(auVar272);
                  auVar456._8_4_ = 0xb95e8083;
                  auVar456._0_8_ = 0xb95e8083b95e8083;
                  auVar456._12_4_ = 0xb95e8083;
                  auVar456._16_4_ = 0xb95e8083;
                  auVar456._20_4_ = 0xb95e8083;
                  auVar456._24_4_ = 0xb95e8083;
                  auVar456._28_4_ = 0xb95e8083;
                  auVar253 = vfmadd231ps_fma(auVar436,auVar231,auVar456);
                  auVar253 = vfmsub231ps_fma(ZEXT1632(auVar253),auVar478,auVar34);
                  auVar168 = vcmpps_avx(ZEXT1632(auVar417),ZEXT832(0) << 0x20,2);
                  auVar464 = vsubps_avx(ZEXT1632(auVar253),auVar234);
                  auVar253 = vfmsub231ps_fma(auVar464,auVar362,auVar231);
                  auVar396._8_4_ = 0xc0000000;
                  auVar396._0_8_ = 0xc0000000c0000000;
                  auVar396._12_4_ = 0xc0000000;
                  auVar396._16_4_ = 0xc0000000;
                  auVar396._20_4_ = 0xc0000000;
                  auVar396._24_4_ = 0xc0000000;
                  auVar396._28_4_ = 0xc0000000;
                  auVar235._0_4_ = auVar253._0_4_ * -2.0;
                  auVar235._4_4_ = auVar253._4_4_ * -2.0;
                  auVar235._8_4_ = auVar253._8_4_ * -2.0;
                  auVar235._12_4_ = auVar253._12_4_ * -2.0;
                  auVar235._16_4_ = 0x80000000;
                  auVar235._20_4_ = 0x80000000;
                  auVar235._24_4_ = 0x80000000;
                  auVar235._28_4_ = 0;
                  auVar273._8_4_ = 0x7fffffff;
                  auVar273._0_8_ = 0x7fffffff7fffffff;
                  auVar273._12_4_ = 0x7fffffff;
                  auVar273._16_4_ = 0x7fffffff;
                  auVar273._20_4_ = 0x7fffffff;
                  auVar273._24_4_ = 0x7fffffff;
                  auVar273._28_4_ = 0x7fffffff;
                  auVar168 = vblendvps_avx(auVar235,auVar273,auVar168);
                  auVar168 = vminps_avx(auVar455,auVar168);
                  auVar173 = ZEXT3264(auVar164);
                  auVar164 = vmaxps_avx(auVar164,auVar168);
                  auVar474 = ZEXT3264(auVar347);
                  auVar253 = vfmadd213ps_fma(auVar347,auVar164,auVar478);
                  auVar347 = vroundps_avx(ZEXT1632(auVar253),1);
                  auVar168 = vcmpps_avx(ZEXT1632(auVar253),auVar347,1);
                  auVar168 = vandps_avx(auVar168,auVar162);
                  auVar168 = vsubps_avx(auVar347,auVar168);
                  auVar253 = vfmsub231ps_fma(auVar164,auVar168,auVar362);
                  auVar252 = vfnmsub231ps_fma(ZEXT1632(auVar253),auVar168,auVar456);
                  auVar164 = ZEXT1632(auVar252);
                  auVar35._28_4_ = auVar347._28_4_;
                  auVar35._0_28_ =
                       ZEXT1628(CONCAT412(auVar252._12_4_ * auVar252._12_4_,
                                          CONCAT48(auVar252._8_4_ * auVar252._8_4_,
                                                   CONCAT44(auVar252._4_4_ * auVar252._4_4_,
                                                            auVar252._0_4_ * auVar252._0_4_))));
                  auVar481 = ZEXT3264(auVar158);
                  auVar253 = vfmadd213ps_fma(auVar158,auVar164,auVar479);
                  auVar336._8_4_ = 0x3c088908;
                  auVar336._0_8_ = 0x3c0889083c088908;
                  auVar336._12_4_ = 0x3c088908;
                  auVar336._16_4_ = 0x3c088908;
                  auVar336._20_4_ = 0x3c088908;
                  auVar336._24_4_ = 0x3c088908;
                  auVar336._28_4_ = 0x3c088908;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar164,auVar336);
                  auVar337._8_4_ = 0x3d2aa9c1;
                  auVar337._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar337._12_4_ = 0x3d2aa9c1;
                  auVar337._16_4_ = 0x3d2aa9c1;
                  auVar337._20_4_ = 0x3d2aa9c1;
                  auVar337._24_4_ = 0x3d2aa9c1;
                  auVar337._28_4_ = 0x3d2aa9c1;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar164,auVar337);
                  auVar356 = ZEXT3264(auVar478);
                  auVar407 = ZEXT3264(auVar162);
                  auVar114._8_4_ = 0x3e2aaaaa;
                  auVar114._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar114._12_4_ = 0x3e2aaaaa;
                  auVar114._16_4_ = 0x3e2aaaaa;
                  auVar114._20_4_ = 0x3e2aaaaa;
                  auVar114._24_4_ = 0x3e2aaaaa;
                  auVar114._28_4_ = 0x3e2aaaaa;
                  auVar164 = ZEXT1632(auVar252);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar164,auVar114);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar164,auVar478);
                  auVar417 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar35,auVar164);
                  auVar176._0_4_ = (int)auVar168._0_4_;
                  auVar176._4_4_ = (int)auVar168._4_4_;
                  auVar176._8_4_ = (int)auVar168._8_4_;
                  auVar176._12_4_ = (int)auVar168._12_4_;
                  auVar236._16_4_ = (int)auVar168._16_4_;
                  auVar236._0_16_ = auVar176;
                  auVar236._20_4_ = (int)auVar168._20_4_;
                  auVar236._24_4_ = (int)auVar168._24_4_;
                  auVar236._28_4_ = (int)auVar168._28_4_;
                  auVar252 = vpslld_avx(auVar176,0x17);
                  auVar253 = vpslld_avx(auVar236._16_16_,0x17);
                  auVar82._8_4_ = 0x3f800000;
                  auVar82._0_8_ = 0x3f8000003f800000;
                  auVar82._12_4_ = 0x3f800000;
                  auVar253 = vpaddd_avx(auVar253,auVar82);
                  auVar252 = vpaddd_avx(auVar252,auVar82);
                  auVar237._16_16_ = auVar253;
                  auVar237._0_16_ = auVar252;
                  auVar274._0_4_ = auVar417._0_4_ + fVar80;
                  auVar274._4_4_ = auVar417._4_4_ + fVar79;
                  auVar274._8_4_ = auVar417._8_4_ + fVar3;
                  auVar274._12_4_ = auVar417._12_4_ + fVar250;
                  auVar274._16_4_ = fVar507 + 0.0;
                  auVar274._20_4_ = fVar508 + 0.0;
                  auVar274._24_4_ = fVar175 + 0.0;
                  auVar274._28_4_ = fVar28 + 0.0;
                  auVar253 = vfmadd213ps_fma(auVar237,auVar274,auVar162);
                  auVar168 = vdivps_avx(auVar162,ZEXT1632(auVar253));
                  auVar115._8_4_ = 0xbf800000;
                  auVar115._0_8_ = 0xbf800000bf800000;
                  auVar115._12_4_ = 0xbf800000;
                  auVar115._16_4_ = 0xbf800000;
                  auVar115._20_4_ = 0xbf800000;
                  auVar115._24_4_ = 0xbf800000;
                  auVar115._28_4_ = 0xbf800000;
                  auVar253 = vfnmadd213ps_fma(auVar168,auVar396,auVar115);
                  auVar217 = ZEXT1628(auVar253);
                  goto LAB_00296e61;
                case 6:
                  puVar21 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar1 = *puVar21;
                  auVar240._4_4_ = uVar1;
                  auVar240._0_4_ = uVar1;
                  auVar240._8_4_ = uVar1;
                  auVar240._12_4_ = uVar1;
                  auVar240._16_4_ = uVar1;
                  auVar240._20_4_ = uVar1;
                  auVar240._24_4_ = uVar1;
                  auVar240._28_4_ = uVar1;
                  uVar1 = puVar21[1];
                  auVar278._4_4_ = uVar1;
                  auVar278._0_4_ = uVar1;
                  auVar278._8_4_ = uVar1;
                  auVar278._12_4_ = uVar1;
                  auVar278._16_4_ = uVar1;
                  auVar278._20_4_ = uVar1;
                  auVar278._24_4_ = uVar1;
                  auVar278._28_4_ = uVar1;
                  auVar253 = vfmadd231ps_fma(auVar278,auVar168,auVar240);
                  auVar168 = vmaxps_avx(ZEXT1632(auVar253),_DAT_005a9220);
                  auVar168 = vminps_avx(auVar168,auVar162);
                  auVar217 = auVar168._0_28_;
LAB_00296e61:
                  auVar468._0_4_ = auVar217._0_4_ * auVar174._0_4_;
                  auVar468._4_4_ = auVar217._4_4_ * auVar174._4_4_;
                  auVar468._8_4_ = auVar217._8_4_ * auVar174._8_4_;
                  auVar468._12_4_ = auVar217._12_4_ * auVar174._12_4_;
                  auVar468._16_4_ = auVar217._16_4_ * auVar174._16_4_;
                  auVar468._20_4_ = auVar217._20_4_ * auVar174._20_4_;
                  auVar468._24_4_ = auVar217._24_4_ * auVar174._24_4_;
                  auVar168 = auVar468._0_32_;
                }
                *pauVar72 = auVar168;
                pauVar72 = pauVar72 + 1;
                uVar57 = uVar57 + 1;
                iVar2 = iVar2 + 1;
              } while (uVar57 != local_198.w);
            }
            iVar75 = iVar75 + 1;
          } while (iVar75 != local_198.h);
        }
        local_260 = (void *)((long)local_260 + 1);
      } while (local_260 != (void *)(long)local_198.c);
    }
    if ((uVar58 == 8) && (uVar69 == 4)) {
      if ((long)local_198.c < 1) goto LAB_0029a2e9;
      iVar15 = (this->super_Deconvolution).dilation_w;
      iVar16 = (this->super_Deconvolution).dilation_h;
      iVar46 = (this->super_Deconvolution).stride_w;
      iVar51 = (this->super_Deconvolution).stride_h;
      iVar63 = (this->super_Deconvolution).activation_type;
      pvVar25 = (this->super_Deconvolution).bias_data.data;
      uVar17 = (this->super_Deconvolution).kernel_w;
      uVar52 = (this->super_Deconvolution).kernel_h;
      local_260 = (void *)0x0;
      auVar407 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar339._8_4_ = 0x3f000000;
      auVar339._0_8_ = 0x3f0000003f000000;
      auVar339._12_4_ = 0x3f000000;
      auVar356 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      auVar476._8_4_ = 0x3ab743ce;
      auVar476._0_8_ = 0x3ab743ce3ab743ce;
      auVar476._12_4_ = 0x3ab743ce;
      do {
        if (0 < local_198.h) {
          iVar62 = bottom_blob->w;
          iVar61 = bottom_blob->h;
          pauVar73 = (undefined1 (*) [16])
                     (local_198.cstep * (long)local_260 * local_198.elemsize + (long)local_198.data)
          ;
          uVar18 = bottom_blob->c;
          iVar75 = 0;
          do {
            if (0 < local_198.w) {
              uVar57 = 0;
              iVar2 = (1 - uVar17) * iVar15;
              do {
                if (pvVar25 == (void *)0x0) {
                  auVar173 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar173 = ZEXT1664(*(undefined1 (*) [16])((long)pvVar25 + (long)local_260 * 0x10)
                                     );
                }
                auVar137 = auVar173._0_16_;
                if (0 < (int)uVar18) {
                  pvVar67 = (void *)((this->weight_data_tm).cstep * (long)local_260 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  pvVar20 = bottom_blob->data;
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar52) {
                      uVar55 = 0;
                      uVar65 = 0;
                      do {
                        iVar47 = (((int)uVar65 - uVar52) + 1) * iVar16 + iVar75;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar51, iVar47 % iVar51 == 0)) &&
                            (0 < (int)uVar17)) && (iVar48 < iVar61)) {
                          lVar71 = (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                   bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                          uVar66 = uVar55;
                          uVar68 = (ulong)uVar17;
                          iVar47 = iVar2;
                          do {
                            if (((-1 < iVar47) && (iVar48 = iVar47 / iVar46, iVar47 % iVar46 == 0))
                               && (iVar48 < iVar62)) {
                              lVar70 = (long)(iVar48 << 3);
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71);
                              auVar177._4_4_ = uVar1;
                              auVar177._0_4_ = uVar1;
                              auVar177._8_4_ = uVar1;
                              auVar177._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 4);
                              auVar288._4_4_ = uVar1;
                              auVar288._0_4_ = uVar1;
                              auVar288._8_4_ = uVar1;
                              auVar288._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 8);
                              auVar367._4_4_ = uVar1;
                              auVar367._0_4_ = uVar1;
                              auVar367._8_4_ = uVar1;
                              auVar367._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 0xc);
                              auVar408._4_4_ = uVar1;
                              auVar408._0_4_ = uVar1;
                              auVar408._8_4_ = uVar1;
                              auVar408._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 0x10);
                              auVar418._4_4_ = uVar1;
                              auVar418._0_4_ = uVar1;
                              auVar418._8_4_ = uVar1;
                              auVar418._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 0x14);
                              auVar483._4_4_ = uVar1;
                              auVar483._0_4_ = uVar1;
                              auVar483._8_4_ = uVar1;
                              auVar483._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 0x18);
                              auVar440._4_4_ = uVar1;
                              auVar440._0_4_ = uVar1;
                              auVar440._8_4_ = uVar1;
                              auVar440._12_4_ = uVar1;
                              uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 0x1c);
                              auVar459._4_4_ = uVar1;
                              auVar459._0_4_ = uVar1;
                              auVar459._8_4_ = uVar1;
                              auVar459._12_4_ = uVar1;
                              uVar53 = uVar66 & 0xffffffff;
                              auVar253 = vfmadd231ps_fma(auVar173._0_16_,auVar177,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar53 * 4));
                              auVar253 = vfmadd231ps_fma(auVar253,auVar288,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x10));
                              auVar253 = vfmadd231ps_fma(auVar253,auVar367,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x20));
                              auVar253 = vfmadd231ps_fma(auVar253,auVar408,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x30));
                              auVar253 = vfmadd231ps_fma(auVar253,auVar418,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x40));
                              auVar253 = vfmadd231ps_fma(auVar253,auVar483,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x50));
                              auVar253 = vfmadd231ps_fma(auVar253,auVar440,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x60));
                              auVar253 = vfmadd231ps_fma(auVar253,auVar459,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar67 + uVar53 * 4 + 0x70));
                              auVar173 = ZEXT1664(auVar253);
                            }
                            uVar66 = uVar66 + 0x20;
                            iVar47 = iVar47 + iVar15;
                            uVar68 = uVar68 - 1;
                          } while (uVar68 != 0);
                        }
                        uVar65 = uVar65 + 1;
                        uVar55 = uVar55 + (ulong)uVar17 * 0x20;
                      } while (uVar65 != uVar52);
                    }
                    auVar137 = auVar173._0_16_;
                    pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar17 * uVar52 * 0x20) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar18);
                }
                auVar252 = auVar407._0_16_;
                auVar253 = auVar356._0_16_;
                fVar80 = auVar356._0_4_;
                fVar79 = auVar356._4_4_;
                fVar3 = auVar356._8_4_;
                fVar250 = auVar356._12_4_;
                fVar175 = auVar137._4_4_;
                fVar507 = auVar137._8_4_;
                fVar508 = auVar137._12_4_;
                switch(iVar63) {
                case 1:
                  auVar137 = vmaxps_avx(auVar137,auVar252);
                  break;
                case 2:
                  auVar253 = vmaxps_avx(auVar137,auVar252);
                  auVar252 = vminps_avx(auVar137,auVar252);
                  uVar1 = *(this->super_Deconvolution).activation_params.data;
                  auVar136._4_4_ = uVar1;
                  auVar136._0_4_ = uVar1;
                  auVar136._8_4_ = uVar1;
                  auVar136._12_4_ = uVar1;
                  auVar137 = vfmadd213ps_fma(auVar136,auVar252,auVar253);
                  break;
                case 3:
                  puVar21 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar1 = *puVar21;
                  auVar371._4_4_ = uVar1;
                  auVar371._0_4_ = uVar1;
                  auVar371._8_4_ = uVar1;
                  auVar371._12_4_ = uVar1;
                  uVar1 = puVar21[1];
                  auVar486._4_4_ = uVar1;
                  auVar486._0_4_ = uVar1;
                  auVar486._8_4_ = uVar1;
                  auVar486._12_4_ = uVar1;
                  auVar253 = vmaxps_avx(auVar371,auVar137);
                  auVar137 = vminps_avx(auVar486,auVar253);
                  break;
                case 4:
                  auVar134._0_8_ = auVar137._0_8_ ^ 0x8000000080000000;
                  auVar134._8_4_ = -fVar507;
                  auVar134._12_4_ = -fVar508;
                  auVar183._8_4_ = 0x42b0c0a5;
                  auVar183._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar183._12_4_ = 0x42b0c0a5;
                  auVar252 = vminps_avx(auVar134,auVar183);
                  auVar184._8_4_ = 0xc2b0c0a5;
                  auVar184._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar184._12_4_ = 0xc2b0c0a5;
                  auVar251 = vmaxps_avx(auVar252,auVar184);
                  auVar372._8_4_ = 0x3fb8aa3b;
                  auVar372._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar372._12_4_ = 0x3fb8aa3b;
                  auVar252 = vfmadd213ps_fma(auVar372,auVar251,auVar339);
                  auVar487._0_4_ = (int)auVar252._0_4_;
                  auVar487._4_4_ = (int)auVar252._4_4_;
                  auVar487._8_4_ = (int)auVar252._8_4_;
                  auVar487._12_4_ = (int)auVar252._12_4_;
                  auVar417 = vcvtdq2ps_avx(auVar487);
                  auVar252 = vcmpps_avx(auVar252,auVar417,1);
                  auVar252 = vandps_avx(auVar252,auVar253);
                  auVar252 = vsubps_avx(auVar417,auVar252);
                  auVar85._8_4_ = 0x3f318000;
                  auVar85._0_8_ = 0x3f3180003f318000;
                  auVar85._12_4_ = 0x3f318000;
                  auVar417 = vfmsub231ps_fma(auVar251,auVar252,auVar85);
                  auVar185._8_4_ = 0x395e8083;
                  auVar185._0_8_ = 0x395e8083395e8083;
                  auVar185._12_4_ = 0x395e8083;
                  auVar251 = vfmsub231ps_fma(auVar417,auVar252,auVar185);
                  auVar488._0_4_ = auVar251._0_4_ * auVar251._0_4_;
                  auVar488._4_4_ = auVar251._4_4_ * auVar251._4_4_;
                  auVar488._8_4_ = auVar251._8_4_ * auVar251._8_4_;
                  auVar488._12_4_ = auVar251._12_4_ * auVar251._12_4_;
                  auVar420._8_4_ = 0x39506967;
                  auVar420._0_8_ = 0x3950696739506967;
                  auVar420._12_4_ = 0x39506967;
                  auVar186._8_4_ = 0x3ab743ce;
                  auVar186._0_8_ = 0x3ab743ce3ab743ce;
                  auVar186._12_4_ = 0x3ab743ce;
                  auVar417 = vfmadd213ps_fma(auVar420,auVar251,auVar186);
                  auVar187._8_4_ = 0x3c088908;
                  auVar187._0_8_ = 0x3c0889083c088908;
                  auVar187._12_4_ = 0x3c088908;
                  auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar187);
                  auVar86._8_4_ = 0x3d2aa9c1;
                  auVar86._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar86._12_4_ = 0x3d2aa9c1;
                  auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar86);
                  auVar87._8_4_ = 0x3e2aaaaa;
                  auVar87._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar87._12_4_ = 0x3e2aaaaa;
                  auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar87);
                  auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar339);
                  auVar417 = vfmadd213ps_fma(auVar417,auVar488,auVar251);
                  auVar135._0_4_ = auVar417._0_4_ + fVar80;
                  auVar135._4_4_ = auVar417._4_4_ + fVar79;
                  auVar135._8_4_ = auVar417._8_4_ + fVar3;
                  auVar135._12_4_ = auVar417._12_4_ + fVar250;
                  auVar373._0_4_ = (int)auVar252._0_4_;
                  auVar373._4_4_ = (int)auVar252._4_4_;
                  auVar373._8_4_ = (int)auVar252._8_4_;
                  auVar373._12_4_ = (int)auVar252._12_4_;
                  auVar252 = vpslld_avx(auVar373,0x17);
                  auVar252 = vpaddd_avx(auVar252,auVar253);
                  auVar252 = vfmadd213ps_fma(auVar252,auVar135,auVar253);
                  auVar137 = vdivps_avx(auVar253,auVar252);
                  break;
                case 5:
                  auVar441._8_4_ = 0x42b0c0a5;
                  auVar441._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar441._12_4_ = 0x42b0c0a5;
                  auVar252 = vminps_avx(auVar441,auVar137);
                  auVar460._8_4_ = 0xc2b0c0a5;
                  auVar460._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar460._12_4_ = 0xc2b0c0a5;
                  auVar251 = vmaxps_avx(auVar252,auVar460);
                  auVar469._8_4_ = 0x3fb8aa3b;
                  auVar469._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar469._12_4_ = 0x3fb8aa3b;
                  auVar252 = vfmadd213ps_fma(auVar469,auVar251,auVar339);
                  auVar484._0_4_ = (int)auVar252._0_4_;
                  auVar484._4_4_ = (int)auVar252._4_4_;
                  auVar484._8_4_ = (int)auVar252._8_4_;
                  auVar484._12_4_ = (int)auVar252._12_4_;
                  auVar417 = vcvtdq2ps_avx(auVar484);
                  auVar252 = vcmpps_avx(auVar252,auVar417,1);
                  auVar252 = vandps_avx(auVar252,auVar253);
                  auVar252 = vsubps_avx(auVar417,auVar252);
                  auVar442._8_4_ = 0x3f318000;
                  auVar442._0_8_ = 0x3f3180003f318000;
                  auVar442._12_4_ = 0x3f318000;
                  auVar417 = vfmsub231ps_fma(auVar251,auVar252,auVar442);
                  auVar461._8_4_ = 0xb95e8083;
                  auVar461._0_8_ = 0xb95e8083b95e8083;
                  auVar461._12_4_ = 0xb95e8083;
                  auVar251 = vfnmsub231ps_fma(auVar417,auVar252,auVar461);
                  auVar485._0_4_ = auVar251._0_4_ * auVar251._0_4_;
                  auVar485._4_4_ = auVar251._4_4_ * auVar251._4_4_;
                  auVar485._8_4_ = auVar251._8_4_ * auVar251._8_4_;
                  auVar485._12_4_ = auVar251._12_4_ * auVar251._12_4_;
                  auVar357._8_4_ = 0x39506967;
                  auVar357._0_8_ = 0x3950696739506967;
                  auVar357._12_4_ = 0x39506967;
                  auVar417 = vfmadd213ps_fma(auVar357,auVar251,auVar476);
                  auVar254._8_4_ = 0x3c088908;
                  auVar254._0_8_ = 0x3c0889083c088908;
                  auVar254._12_4_ = 0x3c088908;
                  auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar254);
                  auVar351._8_4_ = 0x3d2aa9c1;
                  auVar351._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar351._12_4_ = 0x3d2aa9c1;
                  auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar351);
                  auVar255._8_4_ = 0x3e2aaaaa;
                  auVar255._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar255._12_4_ = 0x3e2aaaaa;
                  auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar255);
                  auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar339);
                  auVar417 = vfmadd213ps_fma(auVar417,auVar485,auVar251);
                  auVar178._0_4_ = auVar417._0_4_ + fVar80;
                  auVar178._4_4_ = auVar417._4_4_ + fVar79;
                  auVar178._8_4_ = auVar417._8_4_ + fVar3;
                  auVar178._12_4_ = auVar417._12_4_ + fVar250;
                  auVar368._0_4_ = (int)auVar252._0_4_;
                  auVar368._4_4_ = (int)auVar252._4_4_;
                  auVar368._8_4_ = (int)auVar252._8_4_;
                  auVar368._12_4_ = (int)auVar252._12_4_;
                  auVar252 = vpslld_avx(auVar368,0x17);
                  auVar252 = vpaddd_avx(auVar252,auVar253);
                  auVar81 = vfmadd213ps_fma(auVar252,auVar178,auVar253);
                  auVar179._8_4_ = 0x800000;
                  auVar179._0_8_ = 0x80000000800000;
                  auVar179._12_4_ = 0x800000;
                  auVar252 = vmaxps_avx(auVar81,auVar179);
                  auVar417 = vpsrld_avx(auVar252,0x17);
                  auVar289._8_4_ = 0xffffff82;
                  auVar289._0_8_ = 0xffffff82ffffff82;
                  auVar289._12_4_ = 0xffffff82;
                  auVar417 = vpaddd_avx(auVar417,auVar289);
                  auVar290._8_4_ = 0x807fffff;
                  auVar290._0_8_ = 0x807fffff807fffff;
                  auVar290._12_4_ = 0x807fffff;
                  auVar252 = vandps_avx(auVar252,auVar290);
                  auVar148 = vorps_avx(auVar252,auVar339);
                  auVar251 = vcvtdq2ps_avx(auVar417);
                  auVar291._8_4_ = 0x3f3504f3;
                  auVar291._0_8_ = 0x3f3504f33f3504f3;
                  auVar291._12_4_ = 0x3f3504f3;
                  auVar417 = vcmpps_avx(auVar148,auVar291,1);
                  auVar252 = vandps_avx(auVar417,auVar148);
                  auVar180._0_4_ = auVar252._0_4_ + auVar148._0_4_ + -1.0;
                  auVar180._4_4_ = auVar252._4_4_ + auVar148._4_4_ + -1.0;
                  auVar180._8_4_ = auVar252._8_4_ + auVar148._8_4_ + -1.0;
                  auVar180._12_4_ = auVar252._12_4_ + auVar148._12_4_ + -1.0;
                  auVar252 = vandps_avx(auVar417,auVar253);
                  auVar417 = vsubps_avx(auVar251,auVar252);
                  auVar409._0_4_ = auVar180._0_4_ * auVar180._0_4_;
                  auVar409._4_4_ = auVar180._4_4_ * auVar180._4_4_;
                  auVar409._8_4_ = auVar180._8_4_ * auVar180._8_4_;
                  auVar409._12_4_ = auVar180._12_4_ * auVar180._12_4_;
                  auVar419._8_4_ = 0x3d9021bb;
                  auVar419._0_8_ = 0x3d9021bb3d9021bb;
                  auVar419._12_4_ = 0x3d9021bb;
                  auVar292._8_4_ = 0xbdebd1b8;
                  auVar292._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar292._12_4_ = 0xbdebd1b8;
                  auVar252 = vfmadd213ps_fma(auVar419,auVar180,auVar292);
                  auVar293._8_4_ = 0x3def251a;
                  auVar293._0_8_ = 0x3def251a3def251a;
                  auVar293._12_4_ = 0x3def251a;
                  auVar252 = vfmadd213ps_fma(auVar252,auVar180,auVar293);
                  auVar294._8_4_ = 0xbdfe5d4f;
                  auVar294._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar294._12_4_ = 0xbdfe5d4f;
                  auVar252 = vfmadd213ps_fma(auVar252,auVar180,auVar294);
                  auVar295._8_4_ = 0x3e11e9bf;
                  auVar295._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar295._12_4_ = 0x3e11e9bf;
                  auVar252 = vfmadd213ps_fma(auVar252,auVar180,auVar295);
                  auVar296._8_4_ = 0xbe2aae50;
                  auVar296._0_8_ = 0xbe2aae50be2aae50;
                  auVar296._12_4_ = 0xbe2aae50;
                  auVar252 = vfmadd213ps_fma(auVar252,auVar180,auVar296);
                  auVar297._8_4_ = 0x3e4cceac;
                  auVar297._0_8_ = 0x3e4cceac3e4cceac;
                  auVar297._12_4_ = 0x3e4cceac;
                  auVar252 = vfmadd213ps_fma(auVar252,auVar180,auVar297);
                  auVar298._8_4_ = 0xbe7ffffc;
                  auVar298._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar298._12_4_ = 0xbe7ffffc;
                  auVar252 = vfmadd213ps_fma(auVar252,auVar180,auVar298);
                  auVar299._8_4_ = 0x3eaaaaaa;
                  auVar299._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar299._12_4_ = 0x3eaaaaaa;
                  auVar252 = vfmadd213ps_fma(auVar252,auVar180,auVar299);
                  auVar300._0_4_ = auVar252._0_4_ * auVar409._0_4_ * auVar180._0_4_;
                  auVar300._4_4_ = auVar252._4_4_ * auVar409._4_4_ * auVar180._4_4_;
                  auVar300._8_4_ = auVar252._8_4_ * auVar409._8_4_ * auVar180._8_4_;
                  auVar300._12_4_ = auVar252._12_4_ * auVar409._12_4_ * auVar180._12_4_;
                  auVar252 = vfmadd231ps_fma(auVar300,auVar417,auVar461);
                  auVar251 = vfmsub231ps_fma(auVar252,auVar339,auVar409);
                  auVar252 = vcmpps_avx(auVar81,_DAT_005a5060,2);
                  auVar251 = vsubps_avx(auVar251,auVar180);
                  auVar417 = vfnmadd231ps_fma(auVar251,auVar442,auVar417);
                  auVar181._0_4_ = auVar417._0_4_ + auVar417._0_4_;
                  auVar181._4_4_ = auVar417._4_4_ + auVar417._4_4_;
                  auVar181._8_4_ = auVar417._8_4_ + auVar417._8_4_;
                  auVar181._12_4_ = auVar417._12_4_ + auVar417._12_4_;
                  auVar301._8_4_ = 0x7fffffff;
                  auVar301._0_8_ = 0x7fffffff7fffffff;
                  auVar301._12_4_ = 0x7fffffff;
                  auVar252 = vblendvps_avx(auVar181,auVar301,auVar252);
                  auVar302._8_4_ = 0x42b0c0a5;
                  auVar302._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar302._12_4_ = 0x42b0c0a5;
                  auVar252 = vminps_avx(auVar252,auVar302);
                  auVar303._8_4_ = 0xc2b0c0a5;
                  auVar303._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar303._12_4_ = 0xc2b0c0a5;
                  auVar251 = vmaxps_avx(auVar252,auVar303);
                  auVar252 = vfmadd213ps_fma(auVar469,auVar251,auVar339);
                  auVar369._0_4_ = (int)auVar252._0_4_;
                  auVar369._4_4_ = (int)auVar252._4_4_;
                  auVar369._8_4_ = (int)auVar252._8_4_;
                  auVar369._12_4_ = (int)auVar252._12_4_;
                  auVar417 = vcvtdq2ps_avx(auVar369);
                  auVar252 = vcmpps_avx(auVar252,auVar417,1);
                  auVar252 = vandps_avx(auVar252,auVar253);
                  auVar252 = vsubps_avx(auVar417,auVar252);
                  auVar417 = vfmsub231ps_fma(auVar251,auVar252,auVar442);
                  auVar251 = vfnmsub231ps_fma(auVar417,auVar252,auVar461);
                  auVar370._0_4_ = auVar251._0_4_ * auVar251._0_4_;
                  auVar370._4_4_ = auVar251._4_4_ * auVar251._4_4_;
                  auVar370._8_4_ = auVar251._8_4_ * auVar251._8_4_;
                  auVar370._12_4_ = auVar251._12_4_ * auVar251._12_4_;
                  auVar417 = vfmadd213ps_fma(auVar357,auVar251,auVar476);
                  auVar358._8_4_ = 0x3c088908;
                  auVar358._0_8_ = 0x3c0889083c088908;
                  auVar358._12_4_ = 0x3c088908;
                  auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar358);
                  auVar407 = ZEXT864(0);
                  auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar351);
                  auVar356 = ZEXT1664(auVar253);
                  auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar255);
                  auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar339);
                  auVar417 = vfmadd213ps_fma(auVar417,auVar370,auVar251);
                  auVar182._0_4_ = auVar417._0_4_ + fVar80;
                  auVar182._4_4_ = auVar417._4_4_ + fVar79;
                  auVar182._8_4_ = auVar417._8_4_ + fVar3;
                  auVar182._12_4_ = auVar417._12_4_ + fVar250;
                  auVar304._0_4_ = (int)auVar252._0_4_;
                  auVar304._4_4_ = (int)auVar252._4_4_;
                  auVar304._8_4_ = (int)auVar252._8_4_;
                  auVar304._12_4_ = (int)auVar252._12_4_;
                  auVar252 = vpslld_avx(auVar304,0x17);
                  auVar252 = vpaddd_avx(auVar252,auVar253);
                  auVar253 = vfmadd213ps_fma(auVar252,auVar182,auVar253);
                  auVar84._8_4_ = 0x40000000;
                  auVar84._0_8_ = 0x4000000040000000;
                  auVar84._12_4_ = 0x40000000;
                  auVar253 = vdivps_avx(auVar84,auVar253);
                  auVar137 = vfmsub231ps_fma(auVar137,auVar137,auVar253);
                  break;
                case 6:
                  puVar21 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar1 = *puVar21;
                  auVar188._4_4_ = uVar1;
                  auVar188._0_4_ = uVar1;
                  auVar188._8_4_ = uVar1;
                  auVar188._12_4_ = uVar1;
                  uVar1 = puVar21[1];
                  auVar305._4_4_ = uVar1;
                  auVar305._0_4_ = uVar1;
                  auVar305._8_4_ = uVar1;
                  auVar305._12_4_ = uVar1;
                  auVar417 = vfmadd231ps_fma(auVar305,auVar137,auVar188);
                  auVar252 = vmaxps_avx(auVar417,auVar252);
                  auVar253 = vminps_avx(auVar252,auVar253);
                  auVar137._0_4_ = auVar253._0_4_ * auVar137._0_4_;
                  auVar137._4_4_ = auVar253._4_4_ * fVar175;
                  auVar137._8_4_ = auVar253._8_4_ * fVar507;
                  auVar137._12_4_ = auVar253._12_4_ * fVar508;
                }
                *pauVar73 = auVar137;
                pauVar73 = pauVar73 + 1;
                uVar57 = uVar57 + 1;
                iVar2 = iVar2 + 1;
              } while (uVar57 != local_198.w);
            }
            iVar75 = iVar75 + 1;
          } while (iVar75 != local_198.h);
        }
        local_260 = (void *)((long)local_260 + 1);
      } while (local_260 != (void *)(long)local_198.c);
    }
    if ((uVar58 == 1) && (uVar69 == 8)) {
      if ((long)local_198.c < 1) goto LAB_0029a2e9;
      iVar15 = (this->super_Deconvolution).dilation_w;
      iVar16 = (this->super_Deconvolution).dilation_h;
      iVar46 = (this->super_Deconvolution).stride_w;
      iVar51 = (this->super_Deconvolution).stride_h;
      iVar63 = (this->super_Deconvolution).activation_type;
      pvVar25 = (this->super_Deconvolution).bias_data.data;
      uVar17 = (this->super_Deconvolution).kernel_w;
      uVar52 = (this->super_Deconvolution).kernel_h;
      local_260 = (void *)0x0;
      auVar407 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                    CONCAT424(0xc2b0c0a5,
                                              CONCAT420(0xc2b0c0a5,
                                                        CONCAT416(0xc2b0c0a5,
                                                                  CONCAT412(0xc2b0c0a5,
                                                                            CONCAT48(0xc2b0c0a5,
                                                                                                                                                                          
                                                  0xc2b0c0a5c2b0c0a5)))))));
      auVar354._8_4_ = 0x3f000000;
      auVar354._0_8_ = 0x3f0000003f000000;
      auVar354._12_4_ = 0x3f000000;
      auVar354._16_4_ = 0x3f000000;
      auVar354._20_4_ = 0x3f000000;
      auVar354._24_4_ = 0x3f000000;
      auVar354._28_4_ = 0x3f000000;
      auVar173 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                    CONCAT424(0x3fb8aa3b,
                                              CONCAT420(0x3fb8aa3b,
                                                        CONCAT416(0x3fb8aa3b,
                                                                  CONCAT412(0x3fb8aa3b,
                                                                            CONCAT48(0x3fb8aa3b,
                                                                                                                                                                          
                                                  0x3fb8aa3b3fb8aa3b)))))));
      auVar356 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
      auVar474 = ZEXT3264(CONCAT428(0x39506967,
                                    CONCAT424(0x39506967,
                                              CONCAT420(0x39506967,
                                                        CONCAT416(0x39506967,
                                                                  CONCAT412(0x39506967,
                                                                            CONCAT48(0x39506967,
                                                                                                                                                                          
                                                  0x3950696739506967)))))));
      do {
        if (0 < local_198.h) {
          iVar62 = bottom_blob->w;
          iVar61 = bottom_blob->h;
          pauVar72 = (undefined1 (*) [32])
                     (local_198.cstep * (long)local_260 * local_198.elemsize + (long)local_198.data)
          ;
          uVar18 = bottom_blob->c;
          iVar75 = 0;
          do {
            if (0 < local_198.w) {
              uVar57 = 0;
              iVar2 = (1 - uVar17) * iVar15;
              do {
                if (pvVar25 == (void *)0x0) {
                  auVar481 = ZEXT1664((undefined1  [16])0x0);
                }
                else {
                  auVar481 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar25 + (long)local_260 * 0x20)
                                     );
                }
                if (0 < (int)uVar18) {
                  pvVar67 = (void *)((this->weight_data_tm).cstep * (long)local_260 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                  uVar59 = 0;
                  do {
                    if (0 < (int)uVar52) {
                      uVar65 = 0;
                      uVar55 = 0;
                      do {
                        iVar47 = (((int)uVar55 - uVar52) + 1) * iVar16 + iVar75;
                        if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar51, iVar47 % iVar51 == 0)) &&
                            (iVar48 < iVar61)) && (0 < (int)uVar17)) {
                          uVar66 = uVar65;
                          uVar68 = (ulong)uVar17;
                          iVar47 = iVar2;
                          do {
                            if (((-1 < iVar47) && (iVar49 = iVar47 / iVar46, iVar47 % iVar46 == 0))
                               && (iVar49 < iVar62)) {
                              uVar1 = *(undefined4 *)
                                       ((long)bottom_blob->data +
                                       (long)iVar49 * 4 +
                                       (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                       bottom_blob->cstep * bottom_blob->elemsize * uVar59);
                              auVar241._4_4_ = uVar1;
                              auVar241._0_4_ = uVar1;
                              auVar241._8_4_ = uVar1;
                              auVar241._12_4_ = uVar1;
                              auVar241._16_4_ = uVar1;
                              auVar241._20_4_ = uVar1;
                              auVar241._24_4_ = uVar1;
                              auVar241._28_4_ = uVar1;
                              auVar253 = vfmadd231ps_fma(auVar481._0_32_,auVar241,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar67 + (uVar66 & 0xffffffff) * 4
                                                          ));
                              auVar481 = ZEXT1664(auVar253);
                            }
                            uVar66 = uVar66 + 8;
                            iVar47 = iVar47 + iVar15;
                            uVar68 = uVar68 - 1;
                          } while (uVar68 != 0);
                        }
                        uVar55 = uVar55 + 1;
                        uVar65 = uVar65 + (ulong)uVar17 * 8;
                      } while (uVar55 != uVar52);
                    }
                    pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar17 * uVar52 * 8) * 4);
                    uVar59 = uVar59 + 1;
                  } while (uVar59 != uVar18);
                }
                auVar168 = auVar481._0_32_;
                auVar478 = auVar356._0_32_;
                auVar347 = auVar474._0_32_;
                auVar162 = auVar407._0_32_;
                auVar164 = auVar173._0_32_;
                fVar80 = auVar356._0_4_;
                fVar79 = auVar356._4_4_;
                fVar3 = auVar356._8_4_;
                fVar250 = auVar356._12_4_;
                fVar507 = auVar356._16_4_;
                fVar508 = auVar356._20_4_;
                fVar175 = auVar356._24_4_;
                fVar28 = auVar356._28_4_;
                auVar174._28_36_ = auVar481._28_36_;
                switch(iVar63) {
                case 1:
                  auVar168 = vmaxps_avx(auVar168,_DAT_005a9220);
                  break;
                case 2:
                  auVar478 = vmaxps_avx(auVar168,ZEXT1632(ZEXT816(0) << 0x40));
                  auVar168 = vminps_avx(auVar168,ZEXT1632(ZEXT816(0) << 0x40));
                  uVar1 = *(this->super_Deconvolution).activation_params.data;
                  auVar172._4_4_ = uVar1;
                  auVar172._0_4_ = uVar1;
                  auVar172._8_4_ = uVar1;
                  auVar172._12_4_ = uVar1;
                  auVar172._16_4_ = uVar1;
                  auVar172._20_4_ = uVar1;
                  auVar172._24_4_ = uVar1;
                  auVar172._28_4_ = uVar1;
                  auVar253 = vfmadd213ps_fma(auVar172,auVar168,auVar478);
                  auVar168 = ZEXT1632(auVar253);
                  break;
                case 3:
                  puVar21 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar1 = *puVar21;
                  auVar247._4_4_ = uVar1;
                  auVar247._0_4_ = uVar1;
                  auVar247._8_4_ = uVar1;
                  auVar247._12_4_ = uVar1;
                  auVar247._16_4_ = uVar1;
                  auVar247._20_4_ = uVar1;
                  auVar247._24_4_ = uVar1;
                  auVar247._28_4_ = uVar1;
                  uVar1 = puVar21[1];
                  auVar505._4_4_ = uVar1;
                  auVar505._0_4_ = uVar1;
                  auVar505._8_4_ = uVar1;
                  auVar505._12_4_ = uVar1;
                  auVar505._16_4_ = uVar1;
                  auVar505._20_4_ = uVar1;
                  auVar505._24_4_ = uVar1;
                  auVar505._28_4_ = uVar1;
                  auVar168 = vmaxps_avx(auVar168,auVar247);
                  auVar168 = vminps_avx(auVar505,auVar168);
                  break;
                case 4:
                  auVar169._0_8_ = auVar481._0_8_ ^ 0x8000000080000000;
                  auVar169._8_4_ = -auVar481._8_4_;
                  auVar169._12_4_ = -auVar481._12_4_;
                  auVar169._16_4_ = -auVar481._16_4_;
                  auVar169._20_4_ = -auVar481._20_4_;
                  auVar169._24_4_ = -auVar481._24_4_;
                  auVar169._28_4_ = auVar481._28_4_ ^ 0x80000000;
                  auVar128._8_4_ = 0x42b0c0a5;
                  auVar128._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar128._12_4_ = 0x42b0c0a5;
                  auVar128._16_4_ = 0x42b0c0a5;
                  auVar128._20_4_ = 0x42b0c0a5;
                  auVar128._24_4_ = 0x42b0c0a5;
                  auVar128._28_4_ = 0x42b0c0a5;
                  auVar168 = vminps_avx(auVar169,auVar128);
                  auVar162 = vmaxps_avx(auVar162,auVar168);
                  auVar253 = vfmadd213ps_fma(auVar164,auVar162,auVar354);
                  auVar164 = vroundps_avx(ZEXT1632(auVar253),1);
                  auVar168 = vcmpps_avx(ZEXT1632(auVar253),auVar164,1);
                  auVar168 = vandps_avx(auVar168,auVar478);
                  auVar168 = vsubps_avx(auVar164,auVar168);
                  auVar129._8_4_ = 0x3f318000;
                  auVar129._0_8_ = 0x3f3180003f318000;
                  auVar129._12_4_ = 0x3f318000;
                  auVar129._16_4_ = 0x3f318000;
                  auVar129._20_4_ = 0x3f318000;
                  auVar129._24_4_ = 0x3f318000;
                  auVar129._28_4_ = 0x3f318000;
                  auVar253 = vfmsub231ps_fma(auVar162,auVar168,auVar129);
                  auVar283._8_4_ = 0x395e8083;
                  auVar283._0_8_ = 0x395e8083395e8083;
                  auVar283._12_4_ = 0x395e8083;
                  auVar283._16_4_ = 0x395e8083;
                  auVar283._20_4_ = 0x395e8083;
                  auVar283._24_4_ = 0x395e8083;
                  auVar283._28_4_ = 0x395e8083;
                  auVar252 = vfmsub231ps_fma(ZEXT1632(auVar253),auVar168,auVar283);
                  auVar162 = ZEXT1632(auVar252);
                  auVar40._28_4_ = auVar164._28_4_;
                  auVar40._0_28_ =
                       ZEXT1628(CONCAT412(auVar252._12_4_ * auVar252._12_4_,
                                          CONCAT48(auVar252._8_4_ * auVar252._8_4_,
                                                   CONCAT44(auVar252._4_4_ * auVar252._4_4_,
                                                            auVar252._0_4_ * auVar252._0_4_))));
                  auVar130._8_4_ = 0x3ab743ce;
                  auVar130._0_8_ = 0x3ab743ce3ab743ce;
                  auVar130._12_4_ = 0x3ab743ce;
                  auVar130._16_4_ = 0x3ab743ce;
                  auVar130._20_4_ = 0x3ab743ce;
                  auVar130._24_4_ = 0x3ab743ce;
                  auVar130._28_4_ = 0x3ab743ce;
                  auVar253 = vfmadd213ps_fma(auVar347,auVar162,auVar130);
                  auVar284._8_4_ = 0x3c088908;
                  auVar284._0_8_ = 0x3c0889083c088908;
                  auVar284._12_4_ = 0x3c088908;
                  auVar284._16_4_ = 0x3c088908;
                  auVar284._20_4_ = 0x3c088908;
                  auVar284._24_4_ = 0x3c088908;
                  auVar284._28_4_ = 0x3c088908;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar162,auVar284);
                  auVar285._8_4_ = 0x3d2aa9c1;
                  auVar285._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar285._12_4_ = 0x3d2aa9c1;
                  auVar285._16_4_ = 0x3d2aa9c1;
                  auVar285._20_4_ = 0x3d2aa9c1;
                  auVar285._24_4_ = 0x3d2aa9c1;
                  auVar285._28_4_ = 0x3d2aa9c1;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar162,auVar285);
                  auVar286._8_4_ = 0x3e2aaaaa;
                  auVar286._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar286._12_4_ = 0x3e2aaaaa;
                  auVar286._16_4_ = 0x3e2aaaaa;
                  auVar286._20_4_ = 0x3e2aaaaa;
                  auVar286._24_4_ = 0x3e2aaaaa;
                  auVar286._28_4_ = 0x3e2aaaaa;
                  auVar162 = ZEXT1632(auVar252);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar162,auVar286);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar162,auVar354);
                  auVar417 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar40,auVar162);
                  auVar138._0_4_ = (int)auVar168._0_4_;
                  auVar138._4_4_ = (int)auVar168._4_4_;
                  auVar138._8_4_ = (int)auVar168._8_4_;
                  auVar138._12_4_ = (int)auVar168._12_4_;
                  auVar170._16_4_ = (int)auVar168._16_4_;
                  auVar170._0_16_ = auVar138;
                  auVar170._20_4_ = (int)auVar168._20_4_;
                  auVar170._24_4_ = (int)auVar168._24_4_;
                  auVar170._28_4_ = (int)auVar168._28_4_;
                  auVar252 = vpslld_avx(auVar138,0x17);
                  auVar253 = vpslld_avx(auVar170._16_16_,0x17);
                  auVar257._8_4_ = 0x3f800000;
                  auVar257._0_8_ = 0x3f8000003f800000;
                  auVar257._12_4_ = 0x3f800000;
                  auVar253 = vpaddd_avx(auVar253,auVar257);
                  auVar252 = vpaddd_avx(auVar252,auVar257);
                  auVar171._16_16_ = auVar253;
                  auVar171._0_16_ = auVar252;
                  auVar248._0_4_ = auVar417._0_4_ + fVar80;
                  auVar248._4_4_ = auVar417._4_4_ + fVar79;
                  auVar248._8_4_ = auVar417._8_4_ + fVar3;
                  auVar248._12_4_ = auVar417._12_4_ + fVar250;
                  auVar248._16_4_ = fVar507 + 0.0;
                  auVar248._20_4_ = fVar508 + 0.0;
                  auVar248._24_4_ = fVar175 + 0.0;
                  auVar248._28_4_ = fVar28 + 0.0;
                  auVar253 = vfmadd213ps_fma(auVar171,auVar248,auVar478);
                  auVar168 = vdivps_avx(auVar478,ZEXT1632(auVar253));
                  break;
                case 5:
                  auVar457._8_4_ = 0x42b0c0a5;
                  auVar457._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar457._12_4_ = 0x42b0c0a5;
                  auVar457._16_4_ = 0x42b0c0a5;
                  auVar457._20_4_ = 0x42b0c0a5;
                  auVar457._24_4_ = 0x42b0c0a5;
                  auVar457._28_4_ = 0x42b0c0a5;
                  auVar168 = vminps_avx(auVar457,auVar168);
                  auVar158 = vmaxps_avx(auVar162,auVar168);
                  auVar253 = vfmadd213ps_fma(auVar164,auVar158,auVar354);
                  auVar231 = vroundps_avx(ZEXT1632(auVar253),1);
                  auVar168 = vcmpps_avx(ZEXT1632(auVar253),auVar231,1);
                  auVar168 = vandps_avx(auVar168,auVar478);
                  auVar168 = vsubps_avx(auVar231,auVar168);
                  auVar363._8_4_ = 0x3f318000;
                  auVar363._0_8_ = 0x3f3180003f318000;
                  auVar363._12_4_ = 0x3f318000;
                  auVar363._16_4_ = 0x3f318000;
                  auVar363._20_4_ = 0x3f318000;
                  auVar363._24_4_ = 0x3f318000;
                  auVar363._28_4_ = 0x3f318000;
                  auVar253 = vfmsub231ps_fma(auVar158,auVar168,auVar363);
                  auVar120._8_4_ = 0xb95e8083;
                  auVar120._0_8_ = 0xb95e8083b95e8083;
                  auVar120._12_4_ = 0xb95e8083;
                  auVar120._16_4_ = 0xb95e8083;
                  auVar120._20_4_ = 0xb95e8083;
                  auVar120._24_4_ = 0xb95e8083;
                  auVar120._28_4_ = 0xb95e8083;
                  auVar252 = vfnmsub231ps_fma(ZEXT1632(auVar253),auVar168,auVar120);
                  auVar158 = ZEXT1632(auVar252);
                  auVar37._28_4_ = auVar231._28_4_;
                  auVar37._0_28_ =
                       ZEXT1628(CONCAT412(auVar252._12_4_ * auVar252._12_4_,
                                          CONCAT48(auVar252._8_4_ * auVar252._8_4_,
                                                   CONCAT44(auVar252._4_4_ * auVar252._4_4_,
                                                            auVar252._0_4_ * auVar252._0_4_))));
                  auVar480._8_4_ = 0x3ab743ce;
                  auVar480._0_8_ = 0x3ab743ce3ab743ce;
                  auVar480._12_4_ = 0x3ab743ce;
                  auVar480._16_4_ = 0x3ab743ce;
                  auVar480._20_4_ = 0x3ab743ce;
                  auVar480._24_4_ = 0x3ab743ce;
                  auVar480._28_4_ = 0x3ab743ce;
                  auVar253 = vfmadd213ps_fma(auVar347,auVar158,auVar480);
                  auVar397._8_4_ = 0x3c088908;
                  auVar397._0_8_ = 0x3c0889083c088908;
                  auVar397._12_4_ = 0x3c088908;
                  auVar397._16_4_ = 0x3c088908;
                  auVar397._20_4_ = 0x3c088908;
                  auVar397._24_4_ = 0x3c088908;
                  auVar397._28_4_ = 0x3c088908;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar158,auVar397);
                  auVar338._8_4_ = 0x3d2aa9c1;
                  auVar338._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar338._12_4_ = 0x3d2aa9c1;
                  auVar338._16_4_ = 0x3d2aa9c1;
                  auVar338._20_4_ = 0x3d2aa9c1;
                  auVar338._24_4_ = 0x3d2aa9c1;
                  auVar338._28_4_ = 0x3d2aa9c1;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar158,auVar338);
                  auVar121._8_4_ = 0x3e2aaaaa;
                  auVar121._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar121._12_4_ = 0x3e2aaaaa;
                  auVar121._16_4_ = 0x3e2aaaaa;
                  auVar121._20_4_ = 0x3e2aaaaa;
                  auVar121._24_4_ = 0x3e2aaaaa;
                  auVar121._28_4_ = 0x3e2aaaaa;
                  auVar158 = ZEXT1632(auVar252);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar158,auVar121);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar158,auVar354);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar37,auVar158);
                  auVar242._0_4_ = auVar253._0_4_ + fVar80;
                  auVar242._4_4_ = auVar253._4_4_ + fVar79;
                  auVar242._8_4_ = auVar253._8_4_ + fVar3;
                  auVar242._12_4_ = auVar253._12_4_ + fVar250;
                  auVar242._16_4_ = fVar507 + 0.0;
                  auVar242._20_4_ = fVar508 + 0.0;
                  auVar242._24_4_ = fVar175 + 0.0;
                  auVar242._28_4_ = fVar28 + 0.0;
                  auVar256._0_4_ = (int)auVar168._0_4_;
                  auVar256._4_4_ = (int)auVar168._4_4_;
                  auVar256._8_4_ = (int)auVar168._8_4_;
                  auVar256._12_4_ = (int)auVar168._12_4_;
                  auVar279._16_4_ = (int)auVar168._16_4_;
                  auVar279._0_16_ = auVar256;
                  auVar279._20_4_ = (int)auVar168._20_4_;
                  auVar279._24_4_ = (int)auVar168._24_4_;
                  auVar279._28_4_ = (int)auVar168._28_4_;
                  auVar252 = vpslld_avx(auVar256,0x17);
                  auVar253 = vpslld_avx(auVar279._16_16_,0x17);
                  auVar374._8_4_ = 0x3f800000;
                  auVar374._0_8_ = 0x3f8000003f800000;
                  auVar374._12_4_ = 0x3f800000;
                  auVar253 = vpaddd_avx(auVar374,auVar253);
                  auVar252 = vpaddd_avx(auVar252,auVar374);
                  auVar503._16_16_ = auVar253;
                  auVar503._0_16_ = auVar252;
                  auVar417 = vfmadd213ps_fma(auVar503,auVar242,auVar478);
                  auVar122._8_4_ = 0x800000;
                  auVar122._0_8_ = 0x80000000800000;
                  auVar122._12_4_ = 0x800000;
                  auVar122._16_4_ = 0x800000;
                  auVar122._20_4_ = 0x800000;
                  auVar122._24_4_ = 0x800000;
                  auVar122._28_4_ = 0x800000;
                  auVar168 = vmaxps_avx(ZEXT1632(auVar417),auVar122);
                  auVar252 = vpsrld_avx(auVar168._0_16_,0x17);
                  auVar253 = vpsrld_avx(auVar168._16_16_,0x17);
                  auVar123._8_4_ = 0x807fffff;
                  auVar123._0_8_ = 0x807fffff807fffff;
                  auVar123._12_4_ = 0x807fffff;
                  auVar123._16_4_ = 0x807fffff;
                  auVar123._20_4_ = 0x807fffff;
                  auVar123._24_4_ = 0x807fffff;
                  auVar123._28_4_ = 0x807fffff;
                  auVar168 = vandps_avx(auVar168,auVar123);
                  auVar231 = vorps_avx(auVar168,auVar354);
                  auVar124._8_4_ = 0x3f3504f3;
                  auVar124._0_8_ = 0x3f3504f33f3504f3;
                  auVar124._12_4_ = 0x3f3504f3;
                  auVar124._16_4_ = 0x3f3504f3;
                  auVar124._20_4_ = 0x3f3504f3;
                  auVar124._24_4_ = 0x3f3504f3;
                  auVar124._28_4_ = 0x3f3504f3;
                  auVar158 = vcmpps_avx(auVar124,auVar231,2);
                  auVar168 = vandnps_avx(auVar158,auVar231);
                  auVar243._0_4_ = auVar168._0_4_ + auVar231._0_4_ + -1.0;
                  auVar243._4_4_ = auVar168._4_4_ + auVar231._4_4_ + -1.0;
                  auVar243._8_4_ = auVar168._8_4_ + auVar231._8_4_ + -1.0;
                  auVar243._12_4_ = auVar168._12_4_ + auVar231._12_4_ + -1.0;
                  auVar243._16_4_ = auVar168._16_4_ + auVar231._16_4_ + -1.0;
                  auVar243._20_4_ = auVar168._20_4_ + auVar231._20_4_ + -1.0;
                  auVar243._24_4_ = auVar168._24_4_ + auVar231._24_4_ + -1.0;
                  auVar243._28_4_ = auVar168._28_4_ + auVar231._28_4_ + -1.0;
                  auVar253 = vpsubd_avx(auVar253,auVar158._16_16_);
                  auVar443._8_4_ = 0xffffff81;
                  auVar443._0_8_ = 0xffffff81ffffff81;
                  auVar443._12_4_ = 0xffffff81;
                  auVar253 = vpaddd_avx(auVar253,auVar443);
                  auVar252 = vpsubd_avx(auVar252,auVar158._0_16_);
                  auVar252 = vpaddd_avx(auVar443,auVar252);
                  auVar280._16_16_ = auVar253;
                  auVar280._0_16_ = auVar252;
                  auVar38._4_4_ = auVar243._4_4_ * auVar243._4_4_;
                  auVar38._0_4_ = auVar243._0_4_ * auVar243._0_4_;
                  auVar38._8_4_ = auVar243._8_4_ * auVar243._8_4_;
                  auVar38._12_4_ = auVar243._12_4_ * auVar243._12_4_;
                  auVar38._16_4_ = auVar243._16_4_ * auVar243._16_4_;
                  auVar38._20_4_ = auVar243._20_4_ * auVar243._20_4_;
                  auVar38._24_4_ = auVar243._24_4_ * auVar243._24_4_;
                  auVar38._28_4_ = auVar158._28_4_;
                  auVar437._8_4_ = 0x3d9021bb;
                  auVar437._0_8_ = 0x3d9021bb3d9021bb;
                  auVar437._12_4_ = 0x3d9021bb;
                  auVar437._16_4_ = 0x3d9021bb;
                  auVar437._20_4_ = 0x3d9021bb;
                  auVar437._24_4_ = 0x3d9021bb;
                  auVar437._28_4_ = 0x3d9021bb;
                  auVar398._8_4_ = 0xbdebd1b8;
                  auVar398._0_8_ = 0xbdebd1b8bdebd1b8;
                  auVar398._12_4_ = 0xbdebd1b8;
                  auVar398._16_4_ = 0xbdebd1b8;
                  auVar398._20_4_ = 0xbdebd1b8;
                  auVar398._24_4_ = 0xbdebd1b8;
                  auVar398._28_4_ = 0xbdebd1b8;
                  auVar253 = vfmadd213ps_fma(auVar437,auVar243,auVar398);
                  auVar399._8_4_ = 0x3def251a;
                  auVar399._0_8_ = 0x3def251a3def251a;
                  auVar399._12_4_ = 0x3def251a;
                  auVar399._16_4_ = 0x3def251a;
                  auVar399._20_4_ = 0x3def251a;
                  auVar399._24_4_ = 0x3def251a;
                  auVar399._28_4_ = 0x3def251a;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar243,auVar399);
                  auVar400._8_4_ = 0xbdfe5d4f;
                  auVar400._0_8_ = 0xbdfe5d4fbdfe5d4f;
                  auVar400._12_4_ = 0xbdfe5d4f;
                  auVar400._16_4_ = 0xbdfe5d4f;
                  auVar400._20_4_ = 0xbdfe5d4f;
                  auVar400._24_4_ = 0xbdfe5d4f;
                  auVar400._28_4_ = 0xbdfe5d4f;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar243,auVar400);
                  auVar401._8_4_ = 0x3e11e9bf;
                  auVar401._0_8_ = 0x3e11e9bf3e11e9bf;
                  auVar401._12_4_ = 0x3e11e9bf;
                  auVar401._16_4_ = 0x3e11e9bf;
                  auVar401._20_4_ = 0x3e11e9bf;
                  auVar401._24_4_ = 0x3e11e9bf;
                  auVar401._28_4_ = 0x3e11e9bf;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar243,auVar401);
                  auVar402._8_4_ = 0xbe2aae50;
                  auVar402._0_8_ = 0xbe2aae50be2aae50;
                  auVar402._12_4_ = 0xbe2aae50;
                  auVar402._16_4_ = 0xbe2aae50;
                  auVar402._20_4_ = 0xbe2aae50;
                  auVar402._24_4_ = 0xbe2aae50;
                  auVar402._28_4_ = 0xbe2aae50;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar243,auVar402);
                  auVar403._8_4_ = 0x3e4cceac;
                  auVar403._0_8_ = 0x3e4cceac3e4cceac;
                  auVar403._12_4_ = 0x3e4cceac;
                  auVar403._16_4_ = 0x3e4cceac;
                  auVar403._20_4_ = 0x3e4cceac;
                  auVar403._24_4_ = 0x3e4cceac;
                  auVar403._28_4_ = 0x3e4cceac;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar243,auVar403);
                  auVar404._8_4_ = 0xbe7ffffc;
                  auVar404._0_8_ = 0xbe7ffffcbe7ffffc;
                  auVar404._12_4_ = 0xbe7ffffc;
                  auVar404._16_4_ = 0xbe7ffffc;
                  auVar404._20_4_ = 0xbe7ffffc;
                  auVar404._24_4_ = 0xbe7ffffc;
                  auVar404._28_4_ = 0xbe7ffffc;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar243,auVar404);
                  auVar405._8_4_ = 0x3eaaaaaa;
                  auVar405._0_8_ = 0x3eaaaaaa3eaaaaaa;
                  auVar405._12_4_ = 0x3eaaaaaa;
                  auVar405._16_4_ = 0x3eaaaaaa;
                  auVar405._20_4_ = 0x3eaaaaaa;
                  auVar405._24_4_ = 0x3eaaaaaa;
                  auVar405._28_4_ = 0x3eaaaaaa;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar243,auVar405);
                  auVar438._0_4_ = auVar243._0_4_ * auVar243._0_4_ * auVar243._0_4_ * auVar253._0_4_
                  ;
                  auVar438._4_4_ = auVar243._4_4_ * auVar243._4_4_ * auVar243._4_4_ * auVar253._4_4_
                  ;
                  auVar438._8_4_ = auVar243._8_4_ * auVar243._8_4_ * auVar243._8_4_ * auVar253._8_4_
                  ;
                  auVar438._12_4_ =
                       auVar243._12_4_ * auVar243._12_4_ * auVar243._12_4_ * auVar253._12_4_;
                  auVar438._16_4_ = auVar243._16_4_ * auVar243._16_4_ * auVar243._16_4_ * 0.0;
                  auVar438._20_4_ = auVar243._20_4_ * auVar243._20_4_ * auVar243._20_4_ * 0.0;
                  auVar438._24_4_ = auVar243._24_4_ * auVar243._24_4_ * auVar243._24_4_ * 0.0;
                  auVar438._28_4_ = 0;
                  auVar158 = vcvtdq2ps_avx(auVar280);
                  auVar458._8_4_ = 0xb95e8083;
                  auVar458._0_8_ = 0xb95e8083b95e8083;
                  auVar458._12_4_ = 0xb95e8083;
                  auVar458._16_4_ = 0xb95e8083;
                  auVar458._20_4_ = 0xb95e8083;
                  auVar458._24_4_ = 0xb95e8083;
                  auVar458._28_4_ = 0xb95e8083;
                  auVar253 = vfmadd231ps_fma(auVar438,auVar158,auVar458);
                  auVar253 = vfmsub231ps_fma(ZEXT1632(auVar253),auVar354,auVar38);
                  auVar168 = vcmpps_avx(ZEXT1632(auVar417),ZEXT832(0) << 0x20,2);
                  auVar231 = vsubps_avx(ZEXT1632(auVar253),auVar243);
                  auVar253 = vfmsub231ps_fma(auVar231,auVar363,auVar158);
                  auVar406._8_4_ = 0xc0000000;
                  auVar406._0_8_ = 0xc0000000c0000000;
                  auVar406._12_4_ = 0xc0000000;
                  auVar406._16_4_ = 0xc0000000;
                  auVar406._20_4_ = 0xc0000000;
                  auVar406._24_4_ = 0xc0000000;
                  auVar406._28_4_ = 0xc0000000;
                  auVar244._0_4_ = auVar253._0_4_ * -2.0;
                  auVar244._4_4_ = auVar253._4_4_ * -2.0;
                  auVar244._8_4_ = auVar253._8_4_ * -2.0;
                  auVar244._12_4_ = auVar253._12_4_ * -2.0;
                  auVar244._16_4_ = 0x80000000;
                  auVar244._20_4_ = 0x80000000;
                  auVar244._24_4_ = 0x80000000;
                  auVar244._28_4_ = 0;
                  auVar281._8_4_ = 0x7fffffff;
                  auVar281._0_8_ = 0x7fffffff7fffffff;
                  auVar281._12_4_ = 0x7fffffff;
                  auVar281._16_4_ = 0x7fffffff;
                  auVar281._20_4_ = 0x7fffffff;
                  auVar281._24_4_ = 0x7fffffff;
                  auVar281._28_4_ = 0x7fffffff;
                  auVar168 = vblendvps_avx(auVar244,auVar281,auVar168);
                  auVar168 = vminps_avx(auVar457,auVar168);
                  auVar407 = ZEXT3264(auVar162);
                  auVar162 = vmaxps_avx(auVar162,auVar168);
                  auVar173 = ZEXT3264(auVar164);
                  auVar253 = vfmadd213ps_fma(auVar164,auVar162,auVar354);
                  auVar164 = vroundps_avx(ZEXT1632(auVar253),1);
                  auVar168 = vcmpps_avx(ZEXT1632(auVar253),auVar164,1);
                  auVar168 = vandps_avx(auVar168,auVar478);
                  auVar168 = vsubps_avx(auVar164,auVar168);
                  auVar253 = vfmsub231ps_fma(auVar162,auVar168,auVar363);
                  auVar252 = vfnmsub231ps_fma(ZEXT1632(auVar253),auVar168,auVar458);
                  auVar162 = ZEXT1632(auVar252);
                  auVar39._28_4_ = auVar164._28_4_;
                  auVar39._0_28_ =
                       ZEXT1628(CONCAT412(auVar252._12_4_ * auVar252._12_4_,
                                          CONCAT48(auVar252._8_4_ * auVar252._8_4_,
                                                   CONCAT44(auVar252._4_4_ * auVar252._4_4_,
                                                            auVar252._0_4_ * auVar252._0_4_))));
                  auVar474 = ZEXT3264(auVar347);
                  auVar253 = vfmadd213ps_fma(auVar347,auVar162,auVar480);
                  auVar504._8_4_ = 0x3c088908;
                  auVar504._0_8_ = 0x3c0889083c088908;
                  auVar504._12_4_ = 0x3c088908;
                  auVar504._16_4_ = 0x3c088908;
                  auVar504._20_4_ = 0x3c088908;
                  auVar504._24_4_ = 0x3c088908;
                  auVar504._28_4_ = 0x3c088908;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar162,auVar504);
                  auVar125._8_4_ = 0x3d2aa9c1;
                  auVar125._0_8_ = 0x3d2aa9c13d2aa9c1;
                  auVar125._12_4_ = 0x3d2aa9c1;
                  auVar125._16_4_ = 0x3d2aa9c1;
                  auVar125._20_4_ = 0x3d2aa9c1;
                  auVar125._24_4_ = 0x3d2aa9c1;
                  auVar125._28_4_ = 0x3d2aa9c1;
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar162,auVar125);
                  auVar126._8_4_ = 0x3e2aaaaa;
                  auVar126._0_8_ = 0x3e2aaaaa3e2aaaaa;
                  auVar126._12_4_ = 0x3e2aaaaa;
                  auVar126._16_4_ = 0x3e2aaaaa;
                  auVar126._20_4_ = 0x3e2aaaaa;
                  auVar126._24_4_ = 0x3e2aaaaa;
                  auVar126._28_4_ = 0x3e2aaaaa;
                  auVar162 = ZEXT1632(auVar252);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar162,auVar126);
                  auVar253 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar162,auVar354);
                  auVar417 = vfmadd213ps_fma(ZEXT1632(auVar253),auVar39,auVar162);
                  auVar356 = ZEXT3264(auVar478);
                  auVar189._0_4_ = (int)auVar168._0_4_;
                  auVar189._4_4_ = (int)auVar168._4_4_;
                  auVar189._8_4_ = (int)auVar168._8_4_;
                  auVar189._12_4_ = (int)auVar168._12_4_;
                  auVar245._16_4_ = (int)auVar168._16_4_;
                  auVar245._0_16_ = auVar189;
                  auVar245._20_4_ = (int)auVar168._20_4_;
                  auVar245._24_4_ = (int)auVar168._24_4_;
                  auVar245._28_4_ = (int)auVar168._28_4_;
                  auVar252 = vpslld_avx(auVar189,0x17);
                  auVar253 = vpslld_avx(auVar245._16_16_,0x17);
                  auVar306._8_4_ = 0x3f800000;
                  auVar306._0_8_ = 0x3f8000003f800000;
                  auVar306._12_4_ = 0x3f800000;
                  auVar253 = vpaddd_avx(auVar253,auVar306);
                  auVar252 = vpaddd_avx(auVar252,auVar306);
                  auVar246._16_16_ = auVar253;
                  auVar246._0_16_ = auVar252;
                  auVar282._0_4_ = auVar417._0_4_ + fVar80;
                  auVar282._4_4_ = auVar417._4_4_ + fVar79;
                  auVar282._8_4_ = auVar417._8_4_ + fVar3;
                  auVar282._12_4_ = auVar417._12_4_ + fVar250;
                  auVar282._16_4_ = fVar507 + 0.0;
                  auVar282._20_4_ = fVar508 + 0.0;
                  auVar282._24_4_ = fVar175 + 0.0;
                  auVar282._28_4_ = fVar28 + 0.0;
                  auVar253 = vfmadd213ps_fma(auVar246,auVar282,auVar478);
                  auVar168 = vdivps_avx(auVar478,ZEXT1632(auVar253));
                  auVar127._8_4_ = 0xbf800000;
                  auVar127._0_8_ = 0xbf800000bf800000;
                  auVar127._12_4_ = 0xbf800000;
                  auVar127._16_4_ = 0xbf800000;
                  auVar127._20_4_ = 0xbf800000;
                  auVar127._24_4_ = 0xbf800000;
                  auVar127._28_4_ = 0xbf800000;
                  auVar253 = vfnmadd213ps_fma(auVar168,auVar406,auVar127);
                  auVar217 = ZEXT1628(auVar253);
                  goto LAB_00297d89;
                case 6:
                  puVar21 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                  uVar1 = *puVar21;
                  auVar249._4_4_ = uVar1;
                  auVar249._0_4_ = uVar1;
                  auVar249._8_4_ = uVar1;
                  auVar249._12_4_ = uVar1;
                  auVar249._16_4_ = uVar1;
                  auVar249._20_4_ = uVar1;
                  auVar249._24_4_ = uVar1;
                  auVar249._28_4_ = uVar1;
                  uVar1 = puVar21[1];
                  auVar287._4_4_ = uVar1;
                  auVar287._0_4_ = uVar1;
                  auVar287._8_4_ = uVar1;
                  auVar287._12_4_ = uVar1;
                  auVar287._16_4_ = uVar1;
                  auVar287._20_4_ = uVar1;
                  auVar287._24_4_ = uVar1;
                  auVar287._28_4_ = uVar1;
                  auVar253 = vfmadd231ps_fma(auVar287,auVar168,auVar249);
                  auVar168 = vmaxps_avx(ZEXT1632(auVar253),_DAT_005a9220);
                  auVar168 = vminps_avx(auVar168,auVar478);
                  auVar217 = auVar168._0_28_;
LAB_00297d89:
                  auVar174._0_4_ = auVar217._0_4_ * auVar481._0_4_;
                  auVar174._4_4_ = auVar217._4_4_ * auVar481._4_4_;
                  auVar174._8_4_ = auVar217._8_4_ * auVar481._8_4_;
                  auVar174._12_4_ = auVar217._12_4_ * auVar481._12_4_;
                  auVar174._16_4_ = auVar217._16_4_ * auVar481._16_4_;
                  auVar174._20_4_ = auVar217._20_4_ * auVar481._20_4_;
                  auVar174._24_4_ = auVar217._24_4_ * auVar481._24_4_;
                  auVar168 = auVar174._0_32_;
                }
                *pauVar72 = auVar168;
                pauVar72 = pauVar72 + 1;
                uVar57 = uVar57 + 1;
                iVar2 = iVar2 + 1;
              } while (uVar57 != local_198.w);
            }
            iVar75 = iVar75 + 1;
          } while (iVar75 != local_198.h);
        }
        local_260 = (void *)((long)local_260 + 1);
      } while (local_260 != (void *)(long)local_198.c);
    }
    if ((uVar58 == 8) && (uVar69 == 1)) {
      local_140 = (long)local_198.c;
      if (0 < local_140) {
        iVar15 = (this->super_Deconvolution).dilation_w;
        iVar16 = (this->super_Deconvolution).dilation_h;
        iVar46 = (this->super_Deconvolution).stride_w;
        iVar51 = (this->super_Deconvolution).stride_h;
        iVar63 = (this->super_Deconvolution).activation_type;
        pvVar25 = (this->super_Deconvolution).bias_data.data;
        uVar58 = (this->super_Deconvolution).kernel_w;
        uVar17 = (this->super_Deconvolution).kernel_h;
        lVar71 = local_198.elemsize * local_198.cstep;
        local_148 = local_198.data;
        iVar62 = bottom_blob->w;
        iVar61 = bottom_blob->h;
        uVar69 = bottom_blob->c;
        local_260 = (void *)0x0;
        do {
          if (0 < iVar45) {
            sVar26 = (this->weight_data_tm).cstep;
            sVar22 = (this->weight_data_tm).elemsize;
            local_210 = (float *)(lVar71 * (long)local_260 + (long)local_148);
            pvVar67 = (this->weight_data_tm).data;
            iVar75 = 0;
            do {
              if (0 < iVar64) {
                iVar47 = bottom_blob->w;
                pvVar20 = bottom_blob->data;
                sVar23 = bottom_blob->elemsize;
                sVar24 = bottom_blob->cstep;
                pfVar76 = (float *)(this->super_Deconvolution).activation_params.data;
                uVar52 = 0;
                iVar2 = (1 - uVar58) * iVar15;
                do {
                  if (pvVar25 == (void *)0x0) {
                    fVar80 = 0.0;
                  }
                  else {
                    fVar80 = *(float *)((long)pvVar25 + (long)local_260 * 4);
                  }
                  if ((int)uVar69 < 1) {
                    auVar168 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                  }
                  else {
                    auVar356 = ZEXT1664((undefined1  [16])0x0);
                    uVar59 = 0;
                    pvVar78 = (void *)(sVar26 * (long)local_260 * sVar22 + (long)pvVar67);
                    do {
                      if (0 < (int)uVar17) {
                        uVar65 = 0;
                        uVar55 = 0;
                        do {
                          iVar48 = (((int)uVar55 - uVar17) + 1) * iVar16 + iVar75;
                          if ((((-1 < iVar48) && (iVar49 = iVar48 / iVar51, iVar48 % iVar51 == 0))
                              && (0 < (int)uVar58)) && (iVar49 < iVar61)) {
                            uVar66 = (ulong)uVar58;
                            uVar68 = uVar65;
                            iVar48 = iVar2;
                            do {
                              if (((-1 < iVar48) && (iVar50 = iVar48 / iVar46, iVar48 % iVar46 == 0)
                                  ) && (iVar50 < iVar62)) {
                                auVar253 = vfmadd231ps_fma(auVar356._0_32_,
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar20 +
                                                            (long)(iVar50 << 3) * 4 +
                                                            (long)iVar49 * (long)iVar47 * sVar23 +
                                                            sVar24 * sVar23 * uVar59),
                                                           *(undefined1 (*) [32])
                                                            ((long)pvVar78 +
                                                            (uVar68 & 0xffffffff) * 4));
                                auVar356 = ZEXT1664(auVar253);
                              }
                              uVar68 = uVar68 + 8;
                              iVar48 = iVar48 + iVar15;
                              uVar66 = uVar66 - 1;
                            } while (uVar66 != 0);
                          }
                          uVar55 = uVar55 + 1;
                          uVar65 = uVar65 + (ulong)uVar58 * 8;
                        } while (uVar55 != uVar17);
                      }
                      auVar168 = auVar356._0_32_;
                      pvVar78 = (void *)((long)pvVar78 + (long)(int)(uVar58 * uVar17 * 8) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar69);
                  }
                  auVar139._0_4_ = auVar168._16_4_ + auVar168._0_4_;
                  auVar139._4_4_ = auVar168._20_4_ + auVar168._4_4_;
                  auVar139._8_4_ = auVar168._24_4_ + auVar168._8_4_;
                  auVar139._12_4_ = auVar168._28_4_ + auVar168._12_4_;
                  auVar253 = vshufpd_avx(auVar139,auVar139,1);
                  auVar140._0_4_ = auVar253._0_4_ + auVar139._0_4_;
                  auVar140._4_4_ = auVar253._4_4_ + auVar139._4_4_;
                  auVar140._8_4_ = auVar253._8_4_ + auVar139._8_4_;
                  auVar140._12_4_ = auVar253._12_4_ + auVar139._12_4_;
                  auVar253 = vmovshdup_avx(auVar140);
                  fVar80 = auVar253._0_4_ + fVar80 + auVar140._0_4_;
                  auVar253 = ZEXT416((uint)fVar80);
                  fVar79 = fVar80;
                  switch(iVar63) {
                  case 1:
                    auVar253 = vmaxss_avx(auVar253,ZEXT416(0));
                    fVar79 = auVar253._0_4_;
                    break;
                  case 2:
                    auVar88._0_12_ = ZEXT812(0);
                    auVar88._12_4_ = 0;
                    auVar253 = vcmpss_avx(auVar88,auVar253,1);
                    auVar191._8_4_ = 0x3f800000;
                    auVar191._0_8_ = 0x3f8000003f800000;
                    auVar191._12_4_ = 0x3f800000;
                    auVar253 = vblendvps_avx(ZEXT416((uint)*pfVar76),auVar191,auVar253);
                    fVar79 = auVar253._0_4_ * fVar80;
                    break;
                  case 3:
                    auVar253 = vmaxss_avx(auVar253,ZEXT416((uint)*pfVar76));
                    fVar79 = auVar253._0_4_;
                    if (pfVar76[1] < auVar253._0_4_) {
                      fVar79 = pfVar76[1];
                    }
                    break;
                  case 4:
                    auVar253 = vminss_avx(auVar253,ZEXT416(0x42b0c0a5));
                    auVar141._0_8_ = auVar253._0_8_ ^ 0x8000000080000000;
                    auVar141._8_4_ = auVar253._8_4_ ^ 0x80000000;
                    auVar141._12_4_ = auVar253._12_4_ ^ 0x80000000;
                    auVar253 = vcmpss_avx(auVar253,ZEXT416(0xc2b0c0a5),1);
                    auVar190._8_4_ = 0x42b0c0a5;
                    auVar190._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar190._12_4_ = 0x42b0c0a5;
                    auVar253 = vblendvps_avx(auVar141,auVar190,auVar253);
                    fVar80 = expf(auVar253._0_4_);
                    fVar79 = 1.0 / (fVar80 + 1.0);
                    break;
                  case 5:
                    fVar79 = expf(fVar80);
                    fVar79 = logf(fVar79 + 1.0);
                    fVar79 = tanhf(fVar79);
                    fVar79 = fVar79 * fVar80;
                    break;
                  case 6:
                    fVar3 = *pfVar76;
                    fVar250 = -pfVar76[1] / fVar3;
                    fVar79 = 0.0;
                    if ((fVar250 <= fVar80) && (fVar79 = fVar80, fVar80 <= fVar250 + 1.0 / fVar3)) {
                      auVar253 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar253,
                                                 ZEXT416((uint)pfVar76[1]));
                      fVar79 = auVar253._0_4_ * fVar80;
                    }
                  }
                  *local_210 = fVar79;
                  local_210 = local_210 + 1;
                  uVar52 = uVar52 + 1;
                  iVar2 = iVar2 + 1;
                } while (uVar52 != iVar64);
              }
              iVar75 = iVar75 + 1;
            } while (iVar75 != iVar45);
          }
          local_260 = (void *)((long)local_260 + 1);
        } while (local_260 != (void *)local_140);
      }
    }
    else {
      local_138._0_4_ = uVar69 ^ 4;
      if ((uVar58 == 4 && uVar69 == 4) && (0 < (long)local_198.c)) {
        iVar15 = (this->super_Deconvolution).dilation_w;
        iVar16 = (this->super_Deconvolution).dilation_h;
        iVar46 = (this->super_Deconvolution).stride_w;
        iVar51 = (this->super_Deconvolution).stride_h;
        iVar63 = (this->super_Deconvolution).activation_type;
        pvVar25 = (this->super_Deconvolution).bias_data.data;
        uVar17 = (this->super_Deconvolution).kernel_w;
        uVar52 = (this->super_Deconvolution).kernel_h;
        local_260 = (void *)0x0;
        auVar407 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar352._8_4_ = 0x3f000000;
        auVar352._0_8_ = 0x3f0000003f000000;
        auVar352._12_4_ = 0x3f000000;
        auVar356 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar477._8_4_ = 0x3ab743ce;
        auVar477._0_8_ = 0x3ab743ce3ab743ce;
        auVar477._12_4_ = 0x3ab743ce;
        auVar258._8_4_ = 0x3c088908;
        auVar258._0_8_ = 0x3c0889083c088908;
        auVar258._12_4_ = 0x3c088908;
        do {
          if (0 < local_198.h) {
            iVar62 = bottom_blob->w;
            iVar61 = bottom_blob->h;
            pauVar73 = (undefined1 (*) [16])
                       (local_198.cstep * (long)local_260 * local_198.elemsize +
                       (long)local_198.data);
            uVar18 = bottom_blob->c;
            iVar75 = 0;
            do {
              if (0 < local_198.w) {
                uVar57 = 0;
                iVar2 = (1 - uVar17) * iVar15;
                do {
                  if (pvVar25 == (void *)0x0) {
                    auVar173 = ZEXT1664((undefined1  [16])0x0);
                  }
                  else {
                    auVar173 = ZEXT1664(*(undefined1 (*) [16])
                                         ((long)pvVar25 + (long)local_260 * 0x10));
                  }
                  auVar145 = auVar173._0_16_;
                  if (0 < (int)uVar18) {
                    pvVar67 = (void *)((this->weight_data_tm).cstep * (long)local_260 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    pvVar20 = bottom_blob->data;
                    uVar59 = 0;
                    do {
                      if (0 < (int)uVar52) {
                        uVar55 = 0;
                        uVar65 = 0;
                        do {
                          iVar47 = (((int)uVar65 - uVar52) + 1) * iVar16 + iVar75;
                          if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar51, iVar47 % iVar51 == 0))
                              && (0 < (int)uVar17)) && (iVar48 < iVar61)) {
                            lVar71 = (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize +
                                     bottom_blob->cstep * bottom_blob->elemsize * uVar59;
                            uVar66 = uVar55;
                            uVar68 = (ulong)uVar17;
                            iVar47 = iVar2;
                            do {
                              if (((-1 < iVar47) && (iVar48 = iVar47 / iVar46, iVar47 % iVar46 == 0)
                                  ) && (iVar48 < iVar62)) {
                                lVar70 = (long)(iVar48 << 2);
                                uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71);
                                auVar192._4_4_ = uVar1;
                                auVar192._0_4_ = uVar1;
                                auVar192._8_4_ = uVar1;
                                auVar192._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 4);
                                auVar307._4_4_ = uVar1;
                                auVar307._0_4_ = uVar1;
                                auVar307._8_4_ = uVar1;
                                auVar307._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 8);
                                auVar375._4_4_ = uVar1;
                                auVar375._0_4_ = uVar1;
                                auVar375._8_4_ = uVar1;
                                auVar375._12_4_ = uVar1;
                                uVar1 = *(undefined4 *)((long)pvVar20 + lVar70 * 4 + lVar71 + 0xc);
                                auVar410._4_4_ = uVar1;
                                auVar410._0_4_ = uVar1;
                                auVar410._8_4_ = uVar1;
                                auVar410._12_4_ = uVar1;
                                uVar53 = uVar66 & 0xffffffff;
                                auVar253 = vfmadd231ps_fma(auVar173._0_16_,auVar192,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar67 + uVar53 * 4));
                                auVar253 = vfmadd231ps_fma(auVar253,auVar307,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar67 + uVar53 * 4 + 0x10));
                                auVar253 = vfmadd231ps_fma(auVar253,auVar375,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar67 + uVar53 * 4 + 0x20));
                                auVar253 = vfmadd231ps_fma(auVar253,auVar410,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar67 + uVar53 * 4 + 0x30));
                                auVar173 = ZEXT1664(auVar253);
                              }
                              uVar66 = uVar66 + 0x10;
                              iVar47 = iVar47 + iVar15;
                              uVar68 = uVar68 - 1;
                            } while (uVar68 != 0);
                          }
                          uVar65 = uVar65 + 1;
                          uVar55 = uVar55 + (ulong)uVar17 * 0x10;
                        } while (uVar65 != uVar52);
                      }
                      auVar145 = auVar173._0_16_;
                      pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar17 * uVar52 * 0x10) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar18);
                  }
                  auVar252 = auVar407._0_16_;
                  auVar253 = auVar356._0_16_;
                  fVar80 = auVar356._0_4_;
                  fVar79 = auVar356._4_4_;
                  fVar3 = auVar356._8_4_;
                  fVar250 = auVar356._12_4_;
                  fVar175 = auVar145._4_4_;
                  fVar507 = auVar145._8_4_;
                  fVar508 = auVar145._12_4_;
                  switch(iVar63) {
                  case 1:
                    auVar145 = vmaxps_avx(auVar252,auVar145);
                    break;
                  case 2:
                    auVar253 = vmaxps_avx(auVar252,auVar145);
                    auVar252 = vminps_avx(auVar252,auVar145);
                    uVar1 = *(this->super_Deconvolution).activation_params.data;
                    auVar144._4_4_ = uVar1;
                    auVar144._0_4_ = uVar1;
                    auVar144._8_4_ = uVar1;
                    auVar144._12_4_ = uVar1;
                    auVar145 = vfmadd213ps_fma(auVar144,auVar252,auVar253);
                    break;
                  case 3:
                    puVar21 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar1 = *puVar21;
                    auVar379._4_4_ = uVar1;
                    auVar379._0_4_ = uVar1;
                    auVar379._8_4_ = uVar1;
                    auVar379._12_4_ = uVar1;
                    uVar1 = puVar21[1];
                    auVar491._4_4_ = uVar1;
                    auVar491._0_4_ = uVar1;
                    auVar491._8_4_ = uVar1;
                    auVar491._12_4_ = uVar1;
                    auVar253 = vmaxps_avx(auVar379,auVar145);
                    auVar145 = vminps_avx(auVar491,auVar253);
                    break;
                  case 4:
                    auVar142._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                    auVar142._8_4_ = -fVar507;
                    auVar142._12_4_ = -fVar508;
                    auVar198._8_4_ = 0x42b0c0a5;
                    auVar198._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar198._12_4_ = 0x42b0c0a5;
                    auVar252 = vminps_avx(auVar142,auVar198);
                    auVar199._8_4_ = 0xc2b0c0a5;
                    auVar199._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar199._12_4_ = 0xc2b0c0a5;
                    auVar251 = vmaxps_avx(auVar252,auVar199);
                    auVar380._8_4_ = 0x3fb8aa3b;
                    auVar380._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar380._12_4_ = 0x3fb8aa3b;
                    auVar252 = vfmadd213ps_fma(auVar380,auVar251,auVar352);
                    auVar492._0_4_ = (int)auVar252._0_4_;
                    auVar492._4_4_ = (int)auVar252._4_4_;
                    auVar492._8_4_ = (int)auVar252._8_4_;
                    auVar492._12_4_ = (int)auVar252._12_4_;
                    auVar417 = vcvtdq2ps_avx(auVar492);
                    auVar252 = vcmpps_avx(auVar252,auVar417,1);
                    auVar252 = vandps_avx(auVar252,auVar253);
                    auVar252 = vsubps_avx(auVar417,auVar252);
                    auVar91._8_4_ = 0x3f318000;
                    auVar91._0_8_ = 0x3f3180003f318000;
                    auVar91._12_4_ = 0x3f318000;
                    auVar417 = vfmsub231ps_fma(auVar251,auVar252,auVar91);
                    auVar200._8_4_ = 0x395e8083;
                    auVar200._0_8_ = 0x395e8083395e8083;
                    auVar200._12_4_ = 0x395e8083;
                    auVar251 = vfmsub231ps_fma(auVar417,auVar252,auVar200);
                    auVar493._0_4_ = auVar251._0_4_ * auVar251._0_4_;
                    auVar493._4_4_ = auVar251._4_4_ * auVar251._4_4_;
                    auVar493._8_4_ = auVar251._8_4_ * auVar251._8_4_;
                    auVar493._12_4_ = auVar251._12_4_ * auVar251._12_4_;
                    auVar422._8_4_ = 0x39506967;
                    auVar422._0_8_ = 0x3950696739506967;
                    auVar422._12_4_ = 0x39506967;
                    auVar201._8_4_ = 0x3ab743ce;
                    auVar201._0_8_ = 0x3ab743ce3ab743ce;
                    auVar201._12_4_ = 0x3ab743ce;
                    auVar417 = vfmadd213ps_fma(auVar422,auVar251,auVar201);
                    auVar202._8_4_ = 0x3c088908;
                    auVar202._0_8_ = 0x3c0889083c088908;
                    auVar202._12_4_ = 0x3c088908;
                    auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar202);
                    auVar92._8_4_ = 0x3d2aa9c1;
                    auVar92._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar92._12_4_ = 0x3d2aa9c1;
                    auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar92);
                    auVar93._8_4_ = 0x3e2aaaaa;
                    auVar93._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar93._12_4_ = 0x3e2aaaaa;
                    auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar93);
                    auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar352);
                    auVar417 = vfmadd213ps_fma(auVar417,auVar493,auVar251);
                    auVar143._0_4_ = auVar417._0_4_ + fVar80;
                    auVar143._4_4_ = auVar417._4_4_ + fVar79;
                    auVar143._8_4_ = auVar417._8_4_ + fVar3;
                    auVar143._12_4_ = auVar417._12_4_ + fVar250;
                    auVar407 = ZEXT864(0) << 0x20;
                    auVar381._0_4_ = (int)auVar252._0_4_;
                    auVar381._4_4_ = (int)auVar252._4_4_;
                    auVar381._8_4_ = (int)auVar252._8_4_;
                    auVar381._12_4_ = (int)auVar252._12_4_;
                    auVar252 = vpslld_avx(auVar381,0x17);
                    auVar252 = vpaddd_avx(auVar252,auVar253);
                    auVar252 = vfmadd213ps_fma(auVar252,auVar143,auVar253);
                    auVar145 = vdivps_avx(auVar253,auVar252);
                    break;
                  case 5:
                    auVar444._8_4_ = 0x42b0c0a5;
                    auVar444._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar444._12_4_ = 0x42b0c0a5;
                    auVar252 = vminps_avx(auVar444,auVar145);
                    auVar462._8_4_ = 0xc2b0c0a5;
                    auVar462._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar462._12_4_ = 0xc2b0c0a5;
                    auVar251 = vmaxps_avx(auVar252,auVar462);
                    auVar470._8_4_ = 0x3fb8aa3b;
                    auVar470._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar470._12_4_ = 0x3fb8aa3b;
                    auVar252 = vfmadd213ps_fma(auVar470,auVar251,auVar352);
                    auVar489._0_4_ = (int)auVar252._0_4_;
                    auVar489._4_4_ = (int)auVar252._4_4_;
                    auVar489._8_4_ = (int)auVar252._8_4_;
                    auVar489._12_4_ = (int)auVar252._12_4_;
                    auVar417 = vcvtdq2ps_avx(auVar489);
                    auVar252 = vcmpps_avx(auVar252,auVar417,1);
                    auVar252 = vandps_avx(auVar252,auVar253);
                    auVar252 = vsubps_avx(auVar417,auVar252);
                    auVar445._8_4_ = 0x3f318000;
                    auVar445._0_8_ = 0x3f3180003f318000;
                    auVar445._12_4_ = 0x3f318000;
                    auVar417 = vfmsub231ps_fma(auVar251,auVar252,auVar445);
                    auVar463._8_4_ = 0xb95e8083;
                    auVar463._0_8_ = 0xb95e8083b95e8083;
                    auVar463._12_4_ = 0xb95e8083;
                    auVar251 = vfnmsub231ps_fma(auVar417,auVar252,auVar463);
                    auVar490._0_4_ = auVar251._0_4_ * auVar251._0_4_;
                    auVar490._4_4_ = auVar251._4_4_ * auVar251._4_4_;
                    auVar490._8_4_ = auVar251._8_4_ * auVar251._8_4_;
                    auVar490._12_4_ = auVar251._12_4_ * auVar251._12_4_;
                    auVar359._8_4_ = 0x39506967;
                    auVar359._0_8_ = 0x3950696739506967;
                    auVar359._12_4_ = 0x39506967;
                    auVar417 = vfmadd213ps_fma(auVar359,auVar251,auVar477);
                    auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar258);
                    auVar340._8_4_ = 0x3d2aa9c1;
                    auVar340._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar340._12_4_ = 0x3d2aa9c1;
                    auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar340);
                    auVar308._8_4_ = 0x3e2aaaaa;
                    auVar308._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar308._12_4_ = 0x3e2aaaaa;
                    auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar308);
                    auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar352);
                    auVar417 = vfmadd213ps_fma(auVar417,auVar490,auVar251);
                    auVar193._0_4_ = auVar417._0_4_ + fVar80;
                    auVar193._4_4_ = auVar417._4_4_ + fVar79;
                    auVar193._8_4_ = auVar417._8_4_ + fVar3;
                    auVar193._12_4_ = auVar417._12_4_ + fVar250;
                    auVar376._0_4_ = (int)auVar252._0_4_;
                    auVar376._4_4_ = (int)auVar252._4_4_;
                    auVar376._8_4_ = (int)auVar252._8_4_;
                    auVar376._12_4_ = (int)auVar252._12_4_;
                    auVar252 = vpslld_avx(auVar376,0x17);
                    auVar252 = vpaddd_avx(auVar252,auVar253);
                    auVar81 = vfmadd213ps_fma(auVar252,auVar193,auVar253);
                    auVar194._8_4_ = 0x800000;
                    auVar194._0_8_ = 0x80000000800000;
                    auVar194._12_4_ = 0x800000;
                    auVar252 = vmaxps_avx(auVar81,auVar194);
                    auVar417 = vpsrld_avx(auVar252,0x17);
                    auVar309._8_4_ = 0xffffff82;
                    auVar309._0_8_ = 0xffffff82ffffff82;
                    auVar309._12_4_ = 0xffffff82;
                    auVar417 = vpaddd_avx(auVar417,auVar309);
                    auVar310._8_4_ = 0x807fffff;
                    auVar310._0_8_ = 0x807fffff807fffff;
                    auVar310._12_4_ = 0x807fffff;
                    auVar252 = vandps_avx(auVar252,auVar310);
                    auVar148 = vorps_avx(auVar252,auVar352);
                    auVar251 = vcvtdq2ps_avx(auVar417);
                    auVar311._8_4_ = 0x3f3504f3;
                    auVar311._0_8_ = 0x3f3504f33f3504f3;
                    auVar311._12_4_ = 0x3f3504f3;
                    auVar417 = vcmpps_avx(auVar148,auVar311,1);
                    auVar252 = vandps_avx(auVar417,auVar148);
                    auVar195._0_4_ = auVar252._0_4_ + auVar148._0_4_ + -1.0;
                    auVar195._4_4_ = auVar252._4_4_ + auVar148._4_4_ + -1.0;
                    auVar195._8_4_ = auVar252._8_4_ + auVar148._8_4_ + -1.0;
                    auVar195._12_4_ = auVar252._12_4_ + auVar148._12_4_ + -1.0;
                    auVar252 = vandps_avx(auVar417,auVar253);
                    auVar417 = vsubps_avx(auVar251,auVar252);
                    auVar411._0_4_ = auVar195._0_4_ * auVar195._0_4_;
                    auVar411._4_4_ = auVar195._4_4_ * auVar195._4_4_;
                    auVar411._8_4_ = auVar195._8_4_ * auVar195._8_4_;
                    auVar411._12_4_ = auVar195._12_4_ * auVar195._12_4_;
                    auVar421._8_4_ = 0x3d9021bb;
                    auVar421._0_8_ = 0x3d9021bb3d9021bb;
                    auVar421._12_4_ = 0x3d9021bb;
                    auVar312._8_4_ = 0xbdebd1b8;
                    auVar312._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar312._12_4_ = 0xbdebd1b8;
                    auVar252 = vfmadd213ps_fma(auVar421,auVar195,auVar312);
                    auVar313._8_4_ = 0x3def251a;
                    auVar313._0_8_ = 0x3def251a3def251a;
                    auVar313._12_4_ = 0x3def251a;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar195,auVar313);
                    auVar314._8_4_ = 0xbdfe5d4f;
                    auVar314._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar314._12_4_ = 0xbdfe5d4f;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar195,auVar314);
                    auVar315._8_4_ = 0x3e11e9bf;
                    auVar315._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar315._12_4_ = 0x3e11e9bf;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar195,auVar315);
                    auVar316._8_4_ = 0xbe2aae50;
                    auVar316._0_8_ = 0xbe2aae50be2aae50;
                    auVar316._12_4_ = 0xbe2aae50;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar195,auVar316);
                    auVar317._8_4_ = 0x3e4cceac;
                    auVar317._0_8_ = 0x3e4cceac3e4cceac;
                    auVar317._12_4_ = 0x3e4cceac;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar195,auVar317);
                    auVar318._8_4_ = 0xbe7ffffc;
                    auVar318._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar318._12_4_ = 0xbe7ffffc;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar195,auVar318);
                    auVar319._8_4_ = 0x3eaaaaaa;
                    auVar319._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar319._12_4_ = 0x3eaaaaaa;
                    auVar252 = vfmadd213ps_fma(auVar252,auVar195,auVar319);
                    auVar320._0_4_ = auVar252._0_4_ * auVar411._0_4_ * auVar195._0_4_;
                    auVar320._4_4_ = auVar252._4_4_ * auVar411._4_4_ * auVar195._4_4_;
                    auVar320._8_4_ = auVar252._8_4_ * auVar411._8_4_ * auVar195._8_4_;
                    auVar320._12_4_ = auVar252._12_4_ * auVar411._12_4_ * auVar195._12_4_;
                    auVar407 = ZEXT864(0) << 0x20;
                    auVar252 = vfmadd231ps_fma(auVar320,auVar417,auVar463);
                    auVar251 = vfmsub231ps_fma(auVar252,auVar352,auVar411);
                    auVar252 = vcmpps_avx(auVar81,ZEXT816(0) << 0x20,2);
                    auVar251 = vsubps_avx(auVar251,auVar195);
                    auVar417 = vfnmadd231ps_fma(auVar251,auVar445,auVar417);
                    auVar196._0_4_ = auVar417._0_4_ + auVar417._0_4_;
                    auVar196._4_4_ = auVar417._4_4_ + auVar417._4_4_;
                    auVar196._8_4_ = auVar417._8_4_ + auVar417._8_4_;
                    auVar196._12_4_ = auVar417._12_4_ + auVar417._12_4_;
                    auVar321._8_4_ = 0x7fffffff;
                    auVar321._0_8_ = 0x7fffffff7fffffff;
                    auVar321._12_4_ = 0x7fffffff;
                    auVar252 = vblendvps_avx(auVar196,auVar321,auVar252);
                    auVar322._8_4_ = 0x42b0c0a5;
                    auVar322._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar322._12_4_ = 0x42b0c0a5;
                    auVar252 = vminps_avx(auVar252,auVar322);
                    auVar323._8_4_ = 0xc2b0c0a5;
                    auVar323._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar323._12_4_ = 0xc2b0c0a5;
                    auVar251 = vmaxps_avx(auVar252,auVar323);
                    auVar252 = vfmadd213ps_fma(auVar470,auVar251,auVar352);
                    auVar377._0_4_ = (int)auVar252._0_4_;
                    auVar377._4_4_ = (int)auVar252._4_4_;
                    auVar377._8_4_ = (int)auVar252._8_4_;
                    auVar377._12_4_ = (int)auVar252._12_4_;
                    auVar417 = vcvtdq2ps_avx(auVar377);
                    auVar252 = vcmpps_avx(auVar252,auVar417,1);
                    auVar252 = vandps_avx(auVar252,auVar253);
                    auVar252 = vsubps_avx(auVar417,auVar252);
                    auVar417 = vfmsub231ps_fma(auVar251,auVar252,auVar445);
                    auVar251 = vfnmsub231ps_fma(auVar417,auVar252,auVar463);
                    auVar378._0_4_ = auVar251._0_4_ * auVar251._0_4_;
                    auVar378._4_4_ = auVar251._4_4_ * auVar251._4_4_;
                    auVar378._8_4_ = auVar251._8_4_ * auVar251._8_4_;
                    auVar378._12_4_ = auVar251._12_4_ * auVar251._12_4_;
                    auVar417 = vfmadd213ps_fma(auVar359,auVar251,auVar477);
                    auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar258);
                    auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar340);
                    auVar356 = ZEXT1664(auVar253);
                    auVar89._8_4_ = 0x3e2aaaaa;
                    auVar89._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar89._12_4_ = 0x3e2aaaaa;
                    auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar89);
                    auVar417 = vfmadd213ps_fma(auVar417,auVar251,auVar352);
                    auVar417 = vfmadd213ps_fma(auVar417,auVar378,auVar251);
                    auVar197._0_4_ = auVar417._0_4_ + fVar80;
                    auVar197._4_4_ = auVar417._4_4_ + fVar79;
                    auVar197._8_4_ = auVar417._8_4_ + fVar3;
                    auVar197._12_4_ = auVar417._12_4_ + fVar250;
                    auVar324._0_4_ = (int)auVar252._0_4_;
                    auVar324._4_4_ = (int)auVar252._4_4_;
                    auVar324._8_4_ = (int)auVar252._8_4_;
                    auVar324._12_4_ = (int)auVar252._12_4_;
                    auVar252 = vpslld_avx(auVar324,0x17);
                    auVar252 = vpaddd_avx(auVar252,auVar253);
                    auVar253 = vfmadd213ps_fma(auVar252,auVar197,auVar253);
                    auVar90._8_4_ = 0x40000000;
                    auVar90._0_8_ = 0x4000000040000000;
                    auVar90._12_4_ = 0x40000000;
                    auVar253 = vdivps_avx(auVar90,auVar253);
                    auVar145 = vfmsub231ps_fma(auVar145,auVar145,auVar253);
                    break;
                  case 6:
                    puVar21 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar1 = *puVar21;
                    auVar203._4_4_ = uVar1;
                    auVar203._0_4_ = uVar1;
                    auVar203._8_4_ = uVar1;
                    auVar203._12_4_ = uVar1;
                    uVar1 = puVar21[1];
                    auVar325._4_4_ = uVar1;
                    auVar325._0_4_ = uVar1;
                    auVar325._8_4_ = uVar1;
                    auVar325._12_4_ = uVar1;
                    auVar417 = vfmadd231ps_fma(auVar325,auVar145,auVar203);
                    auVar252 = vmaxps_avx(auVar252,auVar417);
                    auVar253 = vminps_avx(auVar252,auVar253);
                    auVar145._0_4_ = auVar253._0_4_ * auVar145._0_4_;
                    auVar145._4_4_ = auVar253._4_4_ * fVar175;
                    auVar145._8_4_ = auVar253._8_4_ * fVar507;
                    auVar145._12_4_ = auVar253._12_4_ * fVar508;
                  }
                  *pauVar73 = auVar145;
                  pauVar73 = pauVar73 + 1;
                  uVar57 = uVar57 + 1;
                  iVar2 = iVar2 + 1;
                } while (uVar57 != local_198.w);
              }
              iVar75 = iVar75 + 1;
            } while (iVar75 != local_198.h);
          }
          local_260 = (void *)((long)local_260 + 1);
        } while (local_260 != (void *)(long)local_198.c);
      }
      local_138._0_4_ = (uint)local_138 | uVar58 ^ 1;
      if (((uint)local_138 == 0) && (0 < (long)local_198.c)) {
        iVar15 = (this->super_Deconvolution).dilation_w;
        iVar16 = (this->super_Deconvolution).dilation_h;
        iVar46 = (this->super_Deconvolution).stride_w;
        iVar51 = (this->super_Deconvolution).stride_h;
        iVar63 = (this->super_Deconvolution).activation_type;
        pvVar25 = (this->super_Deconvolution).bias_data.data;
        uVar17 = (this->super_Deconvolution).kernel_w;
        uVar52 = (this->super_Deconvolution).kernel_h;
        local_260 = (void *)0x0;
        auVar481 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar174 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
        auVar468 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
        auVar173 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar407 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
        auVar474 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
        auVar475 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
        auVar356 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
        auVar482 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
        do {
          if (0 < local_198.h) {
            iVar62 = bottom_blob->w;
            iVar61 = bottom_blob->h;
            pauVar73 = (undefined1 (*) [16])
                       (local_198.cstep * (long)local_260 * local_198.elemsize +
                       (long)local_198.data);
            uVar18 = bottom_blob->c;
            iVar75 = 0;
            do {
              if (0 < local_198.w) {
                uVar57 = 0;
                iVar2 = (1 - uVar17) * iVar15;
                do {
                  if (pvVar25 == (void *)0x0) {
                    auVar494 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar494 = *(undefined1 (*) [16])((long)pvVar25 + (long)local_260 * 0x10);
                  }
                  auVar506 = ZEXT1664(auVar494);
                  if (0 < (int)uVar18) {
                    pvVar67 = (void *)((this->weight_data_tm).cstep * (long)local_260 *
                                       (this->weight_data_tm).elemsize +
                                      (long)(this->weight_data_tm).data);
                    uVar59 = 0;
                    do {
                      if (0 < (int)uVar52) {
                        uVar55 = 0;
                        uVar65 = 0;
                        do {
                          iVar47 = (((int)uVar65 - uVar52) + 1) * iVar16 + iVar75;
                          if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar51, iVar47 % iVar51 == 0))
                              && (iVar48 < iVar61)) && (0 < (int)uVar17)) {
                            uVar66 = uVar55;
                            uVar68 = (ulong)uVar17;
                            iVar47 = iVar2;
                            do {
                              if (((-1 < iVar47) && (iVar49 = iVar47 / iVar46, iVar47 % iVar46 == 0)
                                  ) && (iVar49 < iVar62)) {
                                uVar1 = *(undefined4 *)
                                         ((long)bottom_blob->data +
                                         (long)iVar49 * 4 +
                                         (long)iVar48 * (long)bottom_blob->w * bottom_blob->elemsize
                                         + bottom_blob->cstep * bottom_blob->elemsize * uVar59);
                                auVar146._4_4_ = uVar1;
                                auVar146._0_4_ = uVar1;
                                auVar146._8_4_ = uVar1;
                                auVar146._12_4_ = uVar1;
                                auVar253 = vfmadd231ps_fma(auVar506._0_16_,auVar146,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar67 +
                                                            (uVar66 & 0xffffffff) * 4));
                                auVar506 = ZEXT1664(auVar253);
                              }
                              uVar66 = uVar66 + 4;
                              iVar47 = iVar47 + iVar15;
                              uVar68 = uVar68 - 1;
                            } while (uVar68 != 0);
                          }
                          uVar65 = uVar65 + 1;
                          uVar55 = uVar55 + (ulong)uVar17 * 4;
                        } while (uVar65 != uVar52);
                      }
                      auVar494 = auVar506._0_16_;
                      pvVar67 = (void *)((long)pvVar67 + (long)(int)(uVar17 * uVar52 * 4) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar18);
                  }
                  auVar148 = auVar481._0_16_;
                  auVar252 = auVar407._0_16_;
                  auVar417 = auVar173._0_16_;
                  auVar251 = auVar474._0_16_;
                  auVar253 = auVar356._0_16_;
                  auVar176 = auVar482._0_16_;
                  auVar82 = auVar475._0_16_;
                  auVar132 = auVar468._0_16_;
                  auVar81 = auVar174._0_16_;
                  fVar80 = auVar407._0_4_;
                  fVar79 = auVar407._4_4_;
                  fVar3 = auVar407._8_4_;
                  fVar250 = auVar407._12_4_;
                  fVar507 = auVar494._4_4_;
                  fVar508 = auVar494._8_4_;
                  fVar175 = auVar494._12_4_;
                  switch(iVar63) {
                  case 1:
                    auVar494 = vmaxps_avx(auVar494,auVar148);
                    break;
                  case 2:
                    auVar253 = vmaxps_avx(auVar494,auVar148);
                    auVar252 = vminps_avx(auVar494,auVar148);
                    uVar1 = *(this->super_Deconvolution).activation_params.data;
                    auVar497._4_4_ = uVar1;
                    auVar497._0_4_ = uVar1;
                    auVar497._8_4_ = uVar1;
                    auVar497._12_4_ = uVar1;
                    auVar494 = vfmadd213ps_fma(auVar497,auVar252,auVar253);
                    break;
                  case 3:
                    puVar21 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar1 = *puVar21;
                    auVar150._4_4_ = uVar1;
                    auVar150._0_4_ = uVar1;
                    auVar150._8_4_ = uVar1;
                    auVar150._12_4_ = uVar1;
                    uVar1 = puVar21[1];
                    auVar383._4_4_ = uVar1;
                    auVar383._0_4_ = uVar1;
                    auVar383._8_4_ = uVar1;
                    auVar383._12_4_ = uVar1;
                    auVar253 = vmaxps_avx(auVar494,auVar150);
                    auVar494 = vminps_avx(auVar383,auVar253);
                    break;
                  case 4:
                    auVar151._0_8_ = auVar494._0_8_ ^ 0x8000000080000000;
                    auVar151._8_4_ = -fVar508;
                    auVar151._12_4_ = -fVar175;
                    auVar104._8_4_ = 0x42b0c0a5;
                    auVar104._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar104._12_4_ = 0x42b0c0a5;
                    auVar148 = vminps_avx(auVar151,auVar104);
                    auVar382 = vmaxps_avx(auVar81,auVar148);
                    auVar148 = vfmadd213ps_fma(auVar132,auVar382,auVar417);
                    auVar495._0_4_ = (int)auVar148._0_4_;
                    auVar495._4_4_ = (int)auVar148._4_4_;
                    auVar495._8_4_ = (int)auVar148._8_4_;
                    auVar495._12_4_ = (int)auVar148._12_4_;
                    auVar81 = vcvtdq2ps_avx(auVar495);
                    auVar148 = vcmpps_avx(auVar148,auVar81,1);
                    auVar148 = vandps_avx(auVar148,auVar252);
                    auVar148 = vsubps_avx(auVar81,auVar148);
                    auVar251 = vfmsub231ps_fma(auVar382,auVar148,auVar251);
                    auVar210._8_4_ = 0x395e8083;
                    auVar210._0_8_ = 0x395e8083395e8083;
                    auVar210._12_4_ = 0x395e8083;
                    auVar251 = vfmsub231ps_fma(auVar251,auVar148,auVar210);
                    auVar496._0_4_ = auVar251._0_4_ * auVar251._0_4_;
                    auVar496._4_4_ = auVar251._4_4_ * auVar251._4_4_;
                    auVar496._8_4_ = auVar251._8_4_ * auVar251._8_4_;
                    auVar496._12_4_ = auVar251._12_4_ * auVar251._12_4_;
                    auVar253 = vfmadd213ps_fma(auVar253,auVar251,auVar82);
                    auVar253 = vfmadd213ps_fma(auVar253,auVar251,auVar176);
                    auVar211._8_4_ = 0x3d2aa9c1;
                    auVar211._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar211._12_4_ = 0x3d2aa9c1;
                    auVar253 = vfmadd213ps_fma(auVar253,auVar251,auVar211);
                    auVar105._8_4_ = 0x3e2aaaaa;
                    auVar105._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar105._12_4_ = 0x3e2aaaaa;
                    auVar253 = vfmadd213ps_fma(auVar253,auVar251,auVar105);
                    auVar253 = vfmadd213ps_fma(auVar253,auVar251,auVar417);
                    auVar253 = vfmadd213ps_fma(auVar253,auVar496,auVar251);
                    auVar152._0_4_ = auVar253._0_4_ + fVar80;
                    auVar152._4_4_ = auVar253._4_4_ + fVar79;
                    auVar152._8_4_ = auVar253._8_4_ + fVar3;
                    auVar152._12_4_ = auVar253._12_4_ + fVar250;
                    auVar384._0_4_ = (int)auVar148._0_4_;
                    auVar384._4_4_ = (int)auVar148._4_4_;
                    auVar384._8_4_ = (int)auVar148._8_4_;
                    auVar384._12_4_ = (int)auVar148._12_4_;
                    auVar253 = vpslld_avx(auVar384,0x17);
                    auVar253 = vpaddd_avx(auVar253,auVar252);
                    auVar253 = vfmadd213ps_fma(auVar253,auVar152,auVar252);
                    auVar494 = vdivps_avx(auVar252,auVar253);
                    break;
                  case 5:
                    auVar94._8_4_ = 0x42b0c0a5;
                    auVar94._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar94._12_4_ = 0x42b0c0a5;
                    auVar148 = vminps_avx(auVar494,auVar94);
                    auVar366 = vmaxps_avx(auVar81,auVar148);
                    auVar148 = vfmadd213ps_fma(auVar132,auVar366,auVar417);
                    auVar423._0_4_ = (int)auVar148._0_4_;
                    auVar423._4_4_ = (int)auVar148._4_4_;
                    auVar423._8_4_ = (int)auVar148._8_4_;
                    auVar423._12_4_ = (int)auVar148._12_4_;
                    auVar382 = vcvtdq2ps_avx(auVar423);
                    auVar148 = vcmpps_avx(auVar148,auVar382,1);
                    auVar148 = vandps_avx(auVar148,auVar252);
                    auVar148 = vsubps_avx(auVar382,auVar148);
                    auVar382 = vfmsub231ps_fma(auVar366,auVar148,auVar251);
                    auVar204._8_4_ = 0xb95e8083;
                    auVar204._0_8_ = 0xb95e8083b95e8083;
                    auVar204._12_4_ = 0xb95e8083;
                    auVar366 = vfnmsub231ps_fma(auVar382,auVar148,auVar204);
                    auVar424._0_4_ = auVar366._0_4_ * auVar366._0_4_;
                    auVar424._4_4_ = auVar366._4_4_ * auVar366._4_4_;
                    auVar424._8_4_ = auVar366._8_4_ * auVar366._8_4_;
                    auVar424._12_4_ = auVar366._12_4_ * auVar366._12_4_;
                    auVar382 = vfmadd213ps_fma(auVar253,auVar366,auVar82);
                    auVar382 = vfmadd213ps_fma(auVar382,auVar366,auVar176);
                    auVar341._8_4_ = 0x3d2aa9c1;
                    auVar341._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar341._12_4_ = 0x3d2aa9c1;
                    auVar382 = vfmadd213ps_fma(auVar382,auVar366,auVar341);
                    auVar342._8_4_ = 0x3e2aaaaa;
                    auVar342._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar342._12_4_ = 0x3e2aaaaa;
                    auVar382 = vfmadd213ps_fma(auVar382,auVar366,auVar342);
                    auVar382 = vfmadd213ps_fma(auVar382,auVar366,auVar417);
                    auVar382 = vfmadd213ps_fma(auVar382,auVar424,auVar366);
                    auVar205._0_4_ = auVar382._0_4_ + fVar80;
                    auVar205._4_4_ = auVar382._4_4_ + fVar79;
                    auVar205._8_4_ = auVar382._8_4_ + fVar3;
                    auVar205._12_4_ = auVar382._12_4_ + fVar250;
                    auVar147._0_4_ = (int)auVar148._0_4_;
                    auVar147._4_4_ = (int)auVar148._4_4_;
                    auVar147._8_4_ = (int)auVar148._8_4_;
                    auVar147._12_4_ = (int)auVar148._12_4_;
                    auVar148 = vpslld_avx(auVar147,0x17);
                    auVar148 = vpaddd_avx(auVar148,auVar252);
                    auVar83 = vfmadd213ps_fma(auVar148,auVar205,auVar252);
                    auVar206._8_4_ = 0x800000;
                    auVar206._0_8_ = 0x80000000800000;
                    auVar206._12_4_ = 0x800000;
                    auVar148 = vmaxps_avx(auVar83,auVar206);
                    auVar382 = vpsrld_avx(auVar148,0x17);
                    auVar343._8_4_ = 0xffffff82;
                    auVar343._0_8_ = 0xffffff82ffffff82;
                    auVar343._12_4_ = 0xffffff82;
                    auVar382 = vpaddd_avx(auVar382,auVar343);
                    auVar344._8_4_ = 0x807fffff;
                    auVar344._0_8_ = 0x807fffff807fffff;
                    auVar344._12_4_ = 0x807fffff;
                    auVar148 = vandps_avx(auVar148,auVar344);
                    auVar439 = vorps_avx(auVar148,auVar417);
                    auVar366 = vcvtdq2ps_avx(auVar382);
                    auVar345._8_4_ = 0x3f3504f3;
                    auVar345._0_8_ = 0x3f3504f33f3504f3;
                    auVar345._12_4_ = 0x3f3504f3;
                    auVar382 = vcmpps_avx(auVar439,auVar345,1);
                    auVar148 = vandps_avx(auVar382,auVar439);
                    auVar207._0_4_ = auVar148._0_4_ + auVar439._0_4_ + -1.0;
                    auVar207._4_4_ = auVar148._4_4_ + auVar439._4_4_ + -1.0;
                    auVar207._8_4_ = auVar148._8_4_ + auVar439._8_4_ + -1.0;
                    auVar207._12_4_ = auVar148._12_4_ + auVar439._12_4_ + -1.0;
                    auVar148 = vandps_avx(auVar382,auVar252);
                    auVar382 = vsubps_avx(auVar366,auVar148);
                    auVar412._0_4_ = auVar207._0_4_ * auVar207._0_4_;
                    auVar412._4_4_ = auVar207._4_4_ * auVar207._4_4_;
                    auVar412._8_4_ = auVar207._8_4_ * auVar207._8_4_;
                    auVar412._12_4_ = auVar207._12_4_ * auVar207._12_4_;
                    auVar425._8_4_ = 0x3d9021bb;
                    auVar425._0_8_ = 0x3d9021bb3d9021bb;
                    auVar425._12_4_ = 0x3d9021bb;
                    auVar95._8_4_ = 0xbdebd1b8;
                    auVar95._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar95._12_4_ = 0xbdebd1b8;
                    auVar148 = vfmadd213ps_fma(auVar425,auVar207,auVar95);
                    auVar96._8_4_ = 0x3def251a;
                    auVar96._0_8_ = 0x3def251a3def251a;
                    auVar96._12_4_ = 0x3def251a;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar207,auVar96);
                    auVar97._8_4_ = 0xbdfe5d4f;
                    auVar97._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar97._12_4_ = 0xbdfe5d4f;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar207,auVar97);
                    auVar98._8_4_ = 0x3e11e9bf;
                    auVar98._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar98._12_4_ = 0x3e11e9bf;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar207,auVar98);
                    auVar99._8_4_ = 0xbe2aae50;
                    auVar99._0_8_ = 0xbe2aae50be2aae50;
                    auVar99._12_4_ = 0xbe2aae50;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar207,auVar99);
                    auVar100._8_4_ = 0x3e4cceac;
                    auVar100._0_8_ = 0x3e4cceac3e4cceac;
                    auVar100._12_4_ = 0x3e4cceac;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar207,auVar100);
                    auVar101._8_4_ = 0xbe7ffffc;
                    auVar101._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar101._12_4_ = 0xbe7ffffc;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar207,auVar101);
                    auVar102._8_4_ = 0x3eaaaaaa;
                    auVar102._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar102._12_4_ = 0x3eaaaaaa;
                    auVar148 = vfmadd213ps_fma(auVar148,auVar207,auVar102);
                    auVar326._0_4_ = auVar148._0_4_ * auVar412._0_4_ * auVar207._0_4_;
                    auVar326._4_4_ = auVar148._4_4_ * auVar412._4_4_ * auVar207._4_4_;
                    auVar326._8_4_ = auVar148._8_4_ * auVar412._8_4_ * auVar207._8_4_;
                    auVar326._12_4_ = auVar148._12_4_ * auVar412._12_4_ * auVar207._12_4_;
                    auVar426._8_4_ = 0xb95e8083;
                    auVar426._0_8_ = 0xb95e8083b95e8083;
                    auVar426._12_4_ = 0xb95e8083;
                    auVar148 = vfmadd231ps_fma(auVar326,auVar382,auVar426);
                    auVar366 = vfmsub231ps_fma(auVar148,auVar417,auVar412);
                    auVar174 = ZEXT1664(auVar81);
                    auVar468 = ZEXT1664(auVar132);
                    auVar475 = ZEXT1664(auVar82);
                    auVar482 = ZEXT1664(auVar176);
                    auVar356 = ZEXT1664(auVar253);
                    auVar474 = ZEXT1664(auVar251);
                    auVar41._12_4_ = 0;
                    auVar41._0_12_ = ZEXT412(0);
                    auVar481 = ZEXT1264(ZEXT412(0)) << 0x20;
                    auVar148 = vcmpps_avx(auVar83,auVar41 << 0x20,2);
                    auVar366 = vsubps_avx(auVar366,auVar207);
                    auVar382 = vfnmadd231ps_fma(auVar366,auVar251,auVar382);
                    auVar208._0_4_ = auVar382._0_4_ + auVar382._0_4_;
                    auVar208._4_4_ = auVar382._4_4_ + auVar382._4_4_;
                    auVar208._8_4_ = auVar382._8_4_ + auVar382._8_4_;
                    auVar208._12_4_ = auVar382._12_4_ + auVar382._12_4_;
                    auVar327._8_4_ = 0x7fffffff;
                    auVar327._0_8_ = 0x7fffffff7fffffff;
                    auVar327._12_4_ = 0x7fffffff;
                    auVar148 = vblendvps_avx(auVar208,auVar327,auVar148);
                    auVar148 = vminps_avx(auVar94,auVar148);
                    auVar382 = vmaxps_avx(auVar81,auVar148);
                    auVar148 = vfmadd213ps_fma(auVar132,auVar382,auVar417);
                    auVar328._0_4_ = (int)auVar148._0_4_;
                    auVar328._4_4_ = (int)auVar148._4_4_;
                    auVar328._8_4_ = (int)auVar148._8_4_;
                    auVar328._12_4_ = (int)auVar148._12_4_;
                    auVar81 = vcvtdq2ps_avx(auVar328);
                    auVar148 = vcmpps_avx(auVar148,auVar81,1);
                    auVar148 = vandps_avx(auVar148,auVar252);
                    auVar148 = vsubps_avx(auVar81,auVar148);
                    auVar251 = vfmsub231ps_fma(auVar382,auVar148,auVar251);
                    auVar329._8_4_ = 0xb95e8083;
                    auVar329._0_8_ = 0xb95e8083b95e8083;
                    auVar329._12_4_ = 0xb95e8083;
                    auVar251 = vfnmsub231ps_fma(auVar251,auVar148,auVar329);
                    auVar330._0_4_ = auVar251._0_4_ * auVar251._0_4_;
                    auVar330._4_4_ = auVar251._4_4_ * auVar251._4_4_;
                    auVar330._8_4_ = auVar251._8_4_ * auVar251._8_4_;
                    auVar330._12_4_ = auVar251._12_4_ * auVar251._12_4_;
                    auVar253 = vfmadd213ps_fma(auVar253,auVar251,auVar82);
                    auVar253 = vfmadd213ps_fma(auVar253,auVar251,auVar176);
                    auVar346._8_4_ = 0x3d2aa9c1;
                    auVar346._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar346._12_4_ = 0x3d2aa9c1;
                    auVar253 = vfmadd213ps_fma(auVar253,auVar251,auVar346);
                    auVar173 = ZEXT1664(auVar417);
                    auVar353._8_4_ = 0x3e2aaaaa;
                    auVar353._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar353._12_4_ = 0x3e2aaaaa;
                    auVar253 = vfmadd213ps_fma(auVar253,auVar251,auVar353);
                    auVar253 = vfmadd213ps_fma(auVar253,auVar251,auVar417);
                    auVar253 = vfmadd213ps_fma(auVar253,auVar330,auVar251);
                    auVar407 = ZEXT1664(auVar252);
                    auVar149._0_4_ = auVar253._0_4_ + fVar80;
                    auVar149._4_4_ = auVar253._4_4_ + fVar79;
                    auVar149._8_4_ = auVar253._8_4_ + fVar3;
                    auVar149._12_4_ = auVar253._12_4_ + fVar250;
                    auVar209._0_4_ = (int)auVar148._0_4_;
                    auVar209._4_4_ = (int)auVar148._4_4_;
                    auVar209._8_4_ = (int)auVar148._8_4_;
                    auVar209._12_4_ = (int)auVar148._12_4_;
                    auVar253 = vpslld_avx(auVar209,0x17);
                    auVar253 = vpaddd_avx(auVar253,auVar252);
                    auVar253 = vfmadd213ps_fma(auVar253,auVar149,auVar252);
                    auVar103._8_4_ = 0x40000000;
                    auVar103._0_8_ = 0x4000000040000000;
                    auVar103._12_4_ = 0x40000000;
                    auVar253 = vdivps_avx(auVar103,auVar253);
                    auVar494 = vfmsub231ps_fma(auVar494,auVar494,auVar253);
                    break;
                  case 6:
                    puVar21 = (undefined4 *)(this->super_Deconvolution).activation_params.data;
                    uVar1 = *puVar21;
                    auVar153._4_4_ = uVar1;
                    auVar153._0_4_ = uVar1;
                    auVar153._8_4_ = uVar1;
                    auVar153._12_4_ = uVar1;
                    uVar1 = puVar21[1];
                    auVar212._4_4_ = uVar1;
                    auVar212._0_4_ = uVar1;
                    auVar212._8_4_ = uVar1;
                    auVar212._12_4_ = uVar1;
                    auVar253 = vfmadd231ps_fma(auVar212,auVar494,auVar153);
                    auVar253 = vmaxps_avx(auVar148,auVar253);
                    auVar253 = vminps_avx(auVar253,auVar252);
                    auVar494._0_4_ = auVar494._0_4_ * auVar253._0_4_;
                    auVar494._4_4_ = fVar507 * auVar253._4_4_;
                    auVar494._8_4_ = fVar508 * auVar253._8_4_;
                    auVar494._12_4_ = fVar175 * auVar253._12_4_;
                  }
                  *pauVar73 = auVar494;
                  pauVar73 = pauVar73 + 1;
                  uVar57 = uVar57 + 1;
                  iVar2 = iVar2 + 1;
                } while (uVar57 != local_198.w);
              }
              iVar75 = iVar75 + 1;
            } while (iVar75 != local_198.h);
          }
          local_260 = (void *)((long)local_260 + 1);
        } while (local_260 != (void *)(long)local_198.c);
      }
      if ((uVar58 == 4 && (uVar69 ^ 1) == 0) &&
         (local_138 = (void *)(long)local_198.c, 0 < (long)local_138)) {
        iVar15 = (this->super_Deconvolution).dilation_w;
        iVar16 = (this->super_Deconvolution).dilation_h;
        iVar46 = (this->super_Deconvolution).stride_w;
        iVar51 = (this->super_Deconvolution).stride_h;
        iVar63 = (this->super_Deconvolution).activation_type;
        pvVar25 = (this->super_Deconvolution).bias_data.data;
        uVar17 = (this->super_Deconvolution).kernel_w;
        uVar52 = (this->super_Deconvolution).kernel_h;
        local_128 = local_198.elemsize * local_198.cstep;
        local_d0 = local_198.data;
        iVar62 = bottom_blob->w;
        iVar61 = bottom_blob->h;
        uVar18 = bottom_blob->c;
        local_260 = (void *)0x0;
        do {
          if (0 < iVar45) {
            sVar26 = (this->weight_data_tm).cstep;
            sVar22 = (this->weight_data_tm).elemsize;
            local_210 = (float *)(local_128 * (long)local_260 + (long)local_d0);
            pvVar67 = (this->weight_data_tm).data;
            iVar75 = 0;
            do {
              if (0 < iVar64) {
                iVar47 = bottom_blob->w;
                pvVar20 = bottom_blob->data;
                sVar23 = bottom_blob->elemsize;
                sVar24 = bottom_blob->cstep;
                pfVar76 = (float *)(this->super_Deconvolution).activation_params.data;
                uVar57 = 0;
                iVar2 = (1 - uVar17) * iVar15;
                do {
                  if (pvVar25 == (void *)0x0) {
                    fVar80 = 0.0;
                  }
                  else {
                    fVar80 = *(float *)((long)pvVar25 + (long)local_260 * 4);
                  }
                  if ((int)uVar18 < 1) {
                    auVar253 = (undefined1  [16])0x0;
                  }
                  else {
                    auVar356 = ZEXT1664((undefined1  [16])0x0);
                    uVar59 = 0;
                    pvVar78 = (void *)(sVar26 * (long)local_260 * sVar22 + (long)pvVar67);
                    do {
                      if (0 < (int)uVar52) {
                        uVar65 = 0;
                        uVar55 = 0;
                        do {
                          iVar48 = (((int)uVar55 - uVar52) + 1) * iVar16 + iVar75;
                          if ((((-1 < iVar48) && (iVar49 = iVar48 / iVar51, iVar48 % iVar51 == 0))
                              && (0 < (int)uVar17)) && (iVar49 < iVar61)) {
                            uVar66 = (ulong)uVar17;
                            uVar68 = uVar65;
                            iVar48 = iVar2;
                            do {
                              if (((-1 < iVar48) && (iVar50 = iVar48 / iVar46, iVar48 % iVar46 == 0)
                                  ) && (iVar50 < iVar62)) {
                                auVar253 = vfmadd231ps_fma(auVar356._0_16_,
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar20 +
                                                            (long)(iVar50 << 2) * 4 +
                                                            (long)iVar49 * (long)iVar47 * sVar23 +
                                                            sVar24 * sVar23 * uVar59),
                                                           *(undefined1 (*) [16])
                                                            ((long)pvVar78 +
                                                            (uVar68 & 0xffffffff) * 4));
                                auVar356 = ZEXT1664(auVar253);
                              }
                              uVar68 = uVar68 + 4;
                              iVar48 = iVar48 + iVar15;
                              uVar66 = uVar66 - 1;
                            } while (uVar66 != 0);
                          }
                          uVar55 = uVar55 + 1;
                          uVar65 = uVar65 + (ulong)uVar17 * 4;
                        } while (uVar55 != uVar52);
                      }
                      auVar253 = auVar356._0_16_;
                      pvVar78 = (void *)((long)pvVar78 + (long)(int)(uVar17 * uVar52 * 4) * 4);
                      uVar59 = uVar59 + 1;
                    } while (uVar59 != uVar18);
                  }
                  auVar252 = vshufpd_avx(auVar253,auVar253,1);
                  auVar154._0_4_ = auVar252._0_4_ + auVar253._0_4_;
                  auVar154._4_4_ = auVar252._4_4_ + auVar253._4_4_;
                  auVar154._8_4_ = auVar252._8_4_ + auVar253._8_4_;
                  auVar154._12_4_ = auVar252._12_4_ + auVar253._12_4_;
                  auVar253 = vmovshdup_avx(auVar154);
                  fVar80 = auVar253._0_4_ + fVar80 + auVar154._0_4_;
                  auVar253 = ZEXT416((uint)fVar80);
                  fVar79 = fVar80;
                  if (iVar63 - 1U < 6) {
                    switch(iVar63) {
                    case 1:
                      auVar253 = vmaxss_avx(ZEXT416((uint)fVar80),ZEXT416(0));
                      fVar79 = auVar253._0_4_;
                      break;
                    case 2:
                      auVar106._0_12_ = ZEXT812(0);
                      auVar106._12_4_ = 0;
                      auVar253 = vcmpss_avx(auVar106,ZEXT416((uint)fVar80),1);
                      auVar214._8_4_ = 0x3f800000;
                      auVar214._0_8_ = 0x3f8000003f800000;
                      auVar214._12_4_ = 0x3f800000;
                      auVar253 = vblendvps_avx(ZEXT416((uint)*pfVar76),auVar214,auVar253);
                      fVar79 = auVar253._0_4_ * fVar80;
                      break;
                    case 3:
                      auVar253 = vmaxss_avx(auVar253,ZEXT416((uint)*pfVar76));
                      fVar79 = auVar253._0_4_;
                      if (pfVar76[1] < auVar253._0_4_) {
                        fVar79 = pfVar76[1];
                      }
                      break;
                    case 4:
                      auVar253 = vminss_avx(auVar253,ZEXT416(0x42b0c0a5));
                      auVar155._0_8_ = auVar253._0_8_ ^ 0x8000000080000000;
                      auVar155._8_4_ = auVar253._8_4_ ^ 0x80000000;
                      auVar155._12_4_ = auVar253._12_4_ ^ 0x80000000;
                      auVar253 = vcmpss_avx(auVar253,ZEXT416(0xc2b0c0a5),1);
                      auVar213._8_4_ = 0x42b0c0a5;
                      auVar213._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar213._12_4_ = 0x42b0c0a5;
                      auVar253 = vblendvps_avx(auVar155,auVar213,auVar253);
                      fVar80 = expf(auVar253._0_4_);
                      fVar79 = 1.0 / (fVar80 + 1.0);
                      break;
                    case 5:
                      fVar79 = expf(fVar80);
                      fVar79 = logf(fVar79 + 1.0);
                      fVar79 = tanhf(fVar79);
                      fVar79 = fVar79 * fVar80;
                      break;
                    case 6:
                      fVar3 = *pfVar76;
                      fVar250 = -pfVar76[1] / fVar3;
                      fVar79 = 0.0;
                      if ((fVar250 <= fVar80) && (fVar79 = fVar80, fVar80 <= fVar250 + 1.0 / fVar3))
                      {
                        auVar253 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar253,
                                                   ZEXT416((uint)pfVar76[1]));
                        fVar79 = auVar253._0_4_ * fVar80;
                      }
                    }
                  }
                  *local_210 = fVar79;
                  local_210 = local_210 + 1;
                  uVar57 = uVar57 + 1;
                  iVar2 = iVar2 + 1;
                } while (uVar57 != iVar64);
              }
              iVar75 = iVar75 + 1;
            } while (iVar75 != iVar45);
          }
          local_260 = (void *)((long)local_260 + 1);
        } while (local_260 != local_138);
      }
      iVar16 = local_198.h;
      iVar15 = local_198.w;
      if (((uVar69 ^ 1) == 0 && uVar58 == 1) &&
         (lVar71 = (long)(this->super_Deconvolution).num_output, 0 < lVar71)) {
        local_138 = local_198.data;
        local_128 = local_198.cstep * local_198.elemsize;
        iVar64 = bottom_blob->w;
        iVar45 = bottom_blob->h;
        uVar58 = bottom_blob->c;
        uVar59 = (ulong)(uint)local_198.w;
        lVar60 = (long)local_14c;
        lVar70 = (long)local_198.w;
        local_148 = (void *)CONCAT44(local_148._4_4_,-(int)local_148);
        local_260 = (void *)0x0;
        do {
          if (0 < iVar16) {
            local_258 = (void *)(local_128 * (long)local_260 + (long)local_138);
            iVar46 = (this->super_Deconvolution).bias_term;
            iVar51 = (this->super_Deconvolution).activation_type;
            sVar26 = (this->weight_data_tm).cstep;
            sVar22 = (this->weight_data_tm).elemsize;
            pvVar25 = (this->weight_data_tm).data;
            iVar63 = 0;
            do {
              if (0 < iVar15) {
                pvVar67 = (this->super_Deconvolution).bias_data.data;
                iVar62 = bottom_blob->w;
                pvVar20 = bottom_blob->data;
                sVar23 = bottom_blob->elemsize;
                sVar24 = bottom_blob->cstep;
                uVar17 = (this->super_Deconvolution).kernel_h;
                iVar61 = iVar63 - (int)local_140;
                pfVar76 = (float *)(this->super_Deconvolution).activation_params.data;
                local_230 = (ulong)local_148 & 0xffffffff;
                uVar65 = 0;
                do {
                  if (iVar46 == 0) {
                    auVar356 = ZEXT1664(ZEXT816(0) << 0x40);
                  }
                  else {
                    auVar356 = ZEXT464(*(uint *)((long)pvVar67 + (long)local_260 * 4));
                  }
                  auVar253 = auVar356._0_16_;
                  if (0 < (int)uVar58) {
                    iVar75 = (this->super_Deconvolution).stride_h;
                    uVar69 = (this->super_Deconvolution).kernel_w;
                    iVar2 = (this->super_Deconvolution).stride_w;
                    uVar55 = 0;
                    pvVar78 = (void *)(sVar26 * sVar22 * (long)local_260 + (long)pvVar25);
                    do {
                      if (0 < (int)uVar17) {
                        uVar66 = 0;
                        pvVar77 = pvVar78;
                        do {
                          iVar47 = (this->super_Deconvolution).dilation_h * (int)uVar66 + iVar61;
                          if ((((-1 < iVar47) && (iVar48 = iVar47 / iVar75, iVar47 % iVar75 == 0))
                              && (iVar48 < iVar45)) && (0 < (int)uVar69)) {
                            uVar68 = 0;
                            iVar47 = (int)local_230;
                            do {
                              if (((-1 < iVar47) && (iVar49 = iVar47 / iVar2, iVar47 % iVar2 == 0))
                                 && (iVar49 < iVar64)) {
                                auVar253 = vfmadd231ss_fma(auVar356._0_16_,
                                                           ZEXT416(*(uint *)((long)pvVar77 +
                                                                            uVar68 * 4)),
                                                           ZEXT416(*(uint *)((long)pvVar20 +
                                                                            (long)iVar49 * 4 +
                                                                            (long)iVar48 *
                                                                            (long)iVar62 * sVar23 +
                                                                            sVar24 * sVar23 * uVar55
                                                                            )));
                                auVar356 = ZEXT1664(auVar253);
                              }
                              uVar68 = uVar68 + 1;
                              iVar47 = iVar47 + (this->super_Deconvolution).dilation_w;
                            } while (uVar69 != uVar68);
                          }
                          uVar66 = uVar66 + 1;
                          pvVar77 = (void *)((long)pvVar77 + (ulong)uVar69 * 4);
                        } while (uVar66 != uVar17);
                      }
                      auVar253 = auVar356._0_16_;
                      uVar55 = uVar55 + 1;
                      pvVar78 = (void *)((long)pvVar78 + lVar60 * 4);
                    } while (uVar55 != uVar58);
                  }
                  fVar79 = auVar253._0_4_;
                  fVar80 = fVar79;
                  switch(iVar51) {
                  case 1:
                    auVar253 = vmaxss_avx(auVar253,ZEXT416(0));
                    fVar80 = auVar253._0_4_;
                    break;
                  case 2:
                    auVar253 = vcmpss_avx(ZEXT816(0) << 0x40,auVar253,1);
                    auVar216._8_4_ = 0x3f800000;
                    auVar216._0_8_ = 0x3f8000003f800000;
                    auVar216._12_4_ = 0x3f800000;
                    auVar253 = vblendvps_avx(ZEXT416((uint)*pfVar76),auVar216,auVar253);
                    fVar80 = auVar253._0_4_ * fVar79;
                    break;
                  case 3:
                    auVar253 = vmaxss_avx(auVar253,ZEXT416((uint)*pfVar76));
                    fVar80 = auVar253._0_4_;
                    if (pfVar76[1] < auVar253._0_4_) {
                      fVar80 = pfVar76[1];
                    }
                    break;
                  case 4:
                    auVar253 = vminss_avx(auVar253,ZEXT416(0x42b0c0a5));
                    auVar156._0_8_ = auVar253._0_8_ ^ 0x8000000080000000;
                    auVar156._8_4_ = auVar253._8_4_ ^ 0x80000000;
                    auVar156._12_4_ = auVar253._12_4_ ^ 0x80000000;
                    auVar253 = vcmpss_avx(auVar253,ZEXT416(0xc2b0c0a5),1);
                    auVar215._8_4_ = 0x42b0c0a5;
                    auVar215._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar215._12_4_ = 0x42b0c0a5;
                    auVar253 = vblendvps_avx(auVar156,auVar215,auVar253);
                    fVar80 = expf(auVar253._0_4_);
                    fVar80 = 1.0 / (fVar80 + 1.0);
                    break;
                  case 5:
                    fVar80 = expf(fVar79);
                    fVar80 = logf(fVar80 + 1.0);
                    fVar80 = tanhf(fVar80);
                    fVar80 = fVar80 * fVar79;
                    break;
                  case 6:
                    fVar3 = *pfVar76;
                    fVar250 = -pfVar76[1] / fVar3;
                    fVar80 = 0.0;
                    if ((fVar250 <= fVar79) && (fVar80 = fVar79, fVar79 <= fVar250 + 1.0 / fVar3)) {
                      auVar253 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar253,
                                                 ZEXT416((uint)pfVar76[1]));
                      fVar80 = auVar253._0_4_ * fVar79;
                    }
                  }
                  *(float *)((long)local_258 + uVar65 * 4) = fVar80;
                  uVar65 = uVar65 + 1;
                  local_230 = (ulong)((int)local_230 + 1);
                } while (uVar65 != uVar59);
              }
              local_258 = (void *)((long)local_258 + lVar70 * 4);
              iVar63 = iVar63 + 1;
            } while (iVar63 != iVar16);
          }
          local_260 = (void *)((long)local_260 + 1);
        } while (local_260 != (void *)lVar71);
      }
    }
  }
LAB_0029a2e9:
  pMVar44 = local_120;
  Deconvolution::cut_padding(&this->super_Deconvolution,&local_198,local_120,local_130);
  if ((pMVar44->data == (void *)0x0) || (iVar46 = 0, (long)pMVar44->c * pMVar44->cstep == 0)) {
    iVar46 = -100;
  }
LAB_0029a32e:
  piVar19 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if (local_198.allocator == (Allocator *)0x0) {
        if (local_198.data != (void *)0x0) {
          free(local_198.data);
        }
      }
      else {
        (*(local_198.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar46;
}

Assistant:

int Deconvolution_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        int ret = gemm->forward(bottom_blob_2, top_col2im, opt_b);
        if (ret != 0)
            return ret;

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_loadu_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_loadu_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_loadu_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}